

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_h<embree::avx::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [28];
  undefined1 (*pauVar8) [32];
  undefined1 (*pauVar9) [28];
  Primitive PVar10;
  uint uVar11;
  __int_type_conflict _Var12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [28];
  undefined1 auVar116 [28];
  undefined1 auVar117 [28];
  ulong uVar118;
  RTCIntersectArguments *pRVar119;
  ulong uVar120;
  uint uVar121;
  ulong uVar122;
  long lVar123;
  long lVar124;
  long lVar125;
  long lVar126;
  Geometry *pGVar127;
  long lVar128;
  undefined4 uVar129;
  undefined8 unaff_R13;
  float fVar130;
  float fVar131;
  float fVar144;
  float fVar147;
  vint4 ai;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar145;
  float fVar148;
  float fVar150;
  float fVar151;
  float fVar153;
  float fVar154;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar161;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar146;
  float fVar149;
  float fVar152;
  float fVar155;
  float fVar160;
  float fVar162;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  float fVar163;
  float fVar176;
  float fVar177;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar179;
  float fVar180;
  undefined1 auVar170 [32];
  undefined1 auVar166 [16];
  float fVar181;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar178;
  undefined1 auVar175 [64];
  float fVar182;
  float fVar197;
  float fVar198;
  vint4 bi_2;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar199;
  float fVar200;
  undefined1 auVar194 [32];
  undefined1 auVar189 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar201;
  float fVar215;
  float fVar216;
  vint4 bi;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar205 [16];
  float fVar217;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar218;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  float fVar222;
  float fVar236;
  float fVar239;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar223;
  float fVar224;
  undefined1 auVar229 [16];
  float fVar237;
  float fVar240;
  float fVar242;
  undefined1 auVar230 [32];
  float fVar238;
  float fVar241;
  float fVar243;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar244;
  float fVar245;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  vint4 ai_1;
  undefined1 auVar248 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  vint4 bi_1;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar260;
  undefined1 auVar259 [32];
  float fVar261;
  float fVar267;
  float fVar268;
  vint4 ai_2;
  undefined1 auVar262 [16];
  float fVar269;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  float fVar270;
  float fVar271;
  float fVar277;
  float fVar278;
  float fVar280;
  undefined1 auVar272 [16];
  float fVar281;
  float fVar283;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar289;
  undefined1 auVar273 [32];
  float fVar282;
  float fVar290;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar279;
  float fVar284;
  float fVar288;
  undefined1 auVar276 [32];
  float fVar291;
  float fVar302;
  float fVar306;
  undefined1 auVar294 [16];
  float fVar309;
  undefined1 auVar295 [16];
  float fVar292;
  float fVar293;
  float fVar303;
  float fVar304;
  undefined1 auVar305 [12];
  float fVar307;
  float fVar308;
  float fVar310;
  float fVar311;
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [64];
  float fVar312;
  float fVar317;
  float fVar318;
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  float fVar319;
  undefined1 auVar316 [64];
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  float fVar342;
  float fVar346;
  float fVar347;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float fVar348;
  undefined1 auVar345 [32];
  float fVar349;
  float fVar350;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  float fVar360;
  float fVar363;
  float fVar364;
  float fVar365;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [16];
  Precalculations *local_7f0;
  ulong local_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined1 (*local_6b8) [16];
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [16];
  undefined1 local_630 [8];
  undefined8 uStack_628;
  undefined1 local_620 [8];
  undefined8 uStack_618;
  undefined1 local_610 [8];
  undefined8 uStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  LinearSpace3fa *local_510;
  Primitive *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  RTCHitN local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar169 [24];
  
  PVar10 = prim[1];
  uVar118 = (ulong)(byte)PVar10;
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 4 + 6)));
  lVar125 = uVar118 * 0x25;
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 5 + 6)));
  auVar264 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 6 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0xf + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x11 + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1a + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1b + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1c + 6)));
  auVar229 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar229 = vinsertps_avx(auVar229,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar248 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar248 = vinsertps_avx(auVar248,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar229 = vsubps_avx(auVar229,*(undefined1 (*) [16])(prim + lVar125 + 6));
  fVar320 = *(float *)(prim + lVar125 + 0x12);
  auVar225._0_4_ = fVar320 * auVar229._0_4_;
  auVar225._4_4_ = fVar320 * auVar229._4_4_;
  auVar225._8_4_ = fVar320 * auVar229._8_4_;
  auVar225._12_4_ = fVar320 * auVar229._12_4_;
  auVar323._0_4_ = fVar320 * auVar248._0_4_;
  auVar323._4_4_ = fVar320 * auVar248._4_4_;
  auVar323._8_4_ = fVar320 * auVar248._8_4_;
  auVar323._12_4_ = fVar320 * auVar248._12_4_;
  auVar206 = vcvtdq2ps_avx(auVar191);
  auVar264 = vcvtdq2ps_avx(auVar264);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar229 = vshufps_avx(auVar323,auVar323,0x55);
  auVar248 = vshufps_avx(auVar323,auVar323,0xaa);
  fVar261 = auVar248._0_4_;
  fVar267 = auVar248._4_4_;
  fVar268 = auVar248._8_4_;
  fVar269 = auVar248._12_4_;
  fVar163 = auVar229._0_4_;
  fVar176 = auVar229._4_4_;
  fVar177 = auVar229._8_4_;
  fVar322 = auVar229._12_4_;
  auVar16 = vcvtdq2ps_avx(auVar207);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar229 = vshufps_avx(auVar323,auVar323,0);
  fVar320 = auVar229._0_4_;
  fVar326 = auVar229._4_4_;
  fVar328 = auVar229._8_4_;
  fVar330 = auVar229._12_4_;
  auVar294._0_4_ = fVar320 * auVar16._0_4_ + fVar163 * auVar206._0_4_ + fVar261 * auVar264._0_4_;
  auVar294._4_4_ = fVar326 * auVar16._4_4_ + fVar176 * auVar206._4_4_ + fVar267 * auVar264._4_4_;
  auVar294._8_4_ = fVar328 * auVar16._8_4_ + fVar177 * auVar206._8_4_ + fVar268 * auVar264._8_4_;
  auVar294._12_4_ = fVar330 * auVar16._12_4_ + fVar322 * auVar206._12_4_ + fVar269 * auVar264._12_4_
  ;
  auVar183._0_4_ = fVar320 * auVar17._0_4_ + fVar261 * auVar19._0_4_ + fVar163 * auVar18._0_4_;
  auVar183._4_4_ = fVar326 * auVar17._4_4_ + fVar267 * auVar19._4_4_ + fVar176 * auVar18._4_4_;
  auVar183._8_4_ = fVar328 * auVar17._8_4_ + fVar268 * auVar19._8_4_ + fVar177 * auVar18._8_4_;
  auVar183._12_4_ = fVar330 * auVar17._12_4_ + fVar269 * auVar19._12_4_ + fVar322 * auVar18._12_4_;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = *(ulong *)(prim + uVar118 * 7 + 6);
  auVar133 = vpmovsxwd_avx(auVar229);
  auVar229 = vcvtdq2ps_avx(auVar132);
  auVar324._0_4_ = fVar163 * auVar20._0_4_ + fVar261 * auVar21._0_4_ + fVar320 * auVar229._0_4_;
  auVar324._4_4_ = fVar176 * auVar20._4_4_ + fVar267 * auVar21._4_4_ + fVar326 * auVar229._4_4_;
  auVar324._8_4_ = fVar177 * auVar20._8_4_ + fVar268 * auVar21._8_4_ + fVar328 * auVar229._8_4_;
  auVar324._12_4_ = fVar322 * auVar20._12_4_ + fVar269 * auVar21._12_4_ + fVar330 * auVar229._12_4_;
  auVar248 = vshufps_avx(auVar225,auVar225,0xaa);
  fVar261 = auVar248._0_4_;
  fVar267 = auVar248._4_4_;
  fVar268 = auVar248._8_4_;
  fVar269 = auVar248._12_4_;
  auVar248 = vshufps_avx(auVar225,auVar225,0x55);
  fVar320 = auVar248._0_4_;
  fVar328 = auVar248._4_4_;
  fVar163 = auVar248._8_4_;
  fVar177 = auVar248._12_4_;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = *(ulong *)(prim + uVar118 * 0xb + 6);
  auVar132 = vpmovsxwd_avx(auVar248);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + uVar118 * 9 + 6);
  auVar134 = vpmovsxwd_avx(auVar207);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + uVar118 * 0xd + 6);
  auVar191 = vpmovsxwd_avx(auVar191);
  auVar248 = vshufps_avx(auVar225,auVar225,0);
  fVar326 = auVar248._0_4_;
  fVar330 = auVar248._4_4_;
  fVar176 = auVar248._8_4_;
  fVar322 = auVar248._12_4_;
  auVar313._0_4_ = auVar206._0_4_ * fVar320 + fVar261 * auVar264._0_4_ + auVar16._0_4_ * fVar326;
  auVar313._4_4_ = auVar206._4_4_ * fVar328 + fVar267 * auVar264._4_4_ + auVar16._4_4_ * fVar330;
  auVar313._8_4_ = auVar206._8_4_ * fVar163 + fVar268 * auVar264._8_4_ + auVar16._8_4_ * fVar176;
  auVar313._12_4_ = auVar206._12_4_ * fVar177 + fVar269 * auVar264._12_4_ + auVar16._12_4_ * fVar322
  ;
  auVar272._0_4_ = auVar19._0_4_ * fVar261 + fVar320 * auVar18._0_4_ + auVar17._0_4_ * fVar326;
  auVar272._4_4_ = auVar19._4_4_ * fVar267 + fVar328 * auVar18._4_4_ + auVar17._4_4_ * fVar330;
  auVar272._8_4_ = auVar19._8_4_ * fVar268 + fVar163 * auVar18._8_4_ + auVar17._8_4_ * fVar176;
  auVar272._12_4_ = auVar19._12_4_ * fVar269 + fVar177 * auVar18._12_4_ + auVar17._12_4_ * fVar322;
  auVar226._0_4_ = fVar320 * auVar20._0_4_ + fVar261 * auVar21._0_4_ + auVar229._0_4_ * fVar326;
  auVar226._4_4_ = fVar328 * auVar20._4_4_ + fVar267 * auVar21._4_4_ + auVar229._4_4_ * fVar330;
  auVar226._8_4_ = fVar163 * auVar20._8_4_ + fVar268 * auVar21._8_4_ + auVar229._8_4_ * fVar176;
  auVar226._12_4_ = fVar177 * auVar20._12_4_ + fVar269 * auVar21._12_4_ + auVar229._12_4_ * fVar322;
  auVar343._8_4_ = 0x7fffffff;
  auVar343._0_8_ = 0x7fffffff7fffffff;
  auVar343._12_4_ = 0x7fffffff;
  auVar229 = vandps_avx(auVar294,auVar343);
  auVar334._8_4_ = 0x219392ef;
  auVar334._0_8_ = 0x219392ef219392ef;
  auVar334._12_4_ = 0x219392ef;
  auVar229 = vcmpps_avx(auVar229,auVar334,1);
  auVar248 = vblendvps_avx(auVar294,auVar334,auVar229);
  auVar229 = vandps_avx(auVar343,auVar183);
  auVar229 = vcmpps_avx(auVar229,auVar334,1);
  auVar207 = vblendvps_avx(auVar183,auVar334,auVar229);
  auVar229 = vandps_avx(auVar324,auVar343);
  auVar229 = vcmpps_avx(auVar229,auVar334,1);
  auVar229 = vblendvps_avx(auVar324,auVar334,auVar229);
  auVar206 = vrcpps_avx(auVar248);
  fVar261 = auVar206._0_4_;
  auVar262._0_4_ = fVar261 * auVar248._0_4_;
  fVar267 = auVar206._4_4_;
  auVar262._4_4_ = fVar267 * auVar248._4_4_;
  fVar268 = auVar206._8_4_;
  auVar262._8_4_ = fVar268 * auVar248._8_4_;
  fVar269 = auVar206._12_4_;
  auVar262._12_4_ = fVar269 * auVar248._12_4_;
  auVar335._8_4_ = 0x3f800000;
  auVar335._0_8_ = 0x3f8000003f800000;
  auVar335._12_4_ = 0x3f800000;
  auVar248 = vsubps_avx(auVar335,auVar262);
  fVar261 = fVar261 + fVar261 * auVar248._0_4_;
  fVar267 = fVar267 + fVar267 * auVar248._4_4_;
  fVar268 = fVar268 + fVar268 * auVar248._8_4_;
  fVar269 = fVar269 + fVar269 * auVar248._12_4_;
  auVar248 = vrcpps_avx(auVar207);
  fVar291 = auVar248._0_4_;
  auVar184._0_4_ = fVar291 * auVar207._0_4_;
  fVar302 = auVar248._4_4_;
  auVar184._4_4_ = fVar302 * auVar207._4_4_;
  fVar306 = auVar248._8_4_;
  auVar184._8_4_ = fVar306 * auVar207._8_4_;
  fVar309 = auVar248._12_4_;
  auVar184._12_4_ = fVar309 * auVar207._12_4_;
  auVar248 = vsubps_avx(auVar335,auVar184);
  fVar291 = fVar291 + fVar291 * auVar248._0_4_;
  fVar302 = fVar302 + fVar302 * auVar248._4_4_;
  fVar306 = fVar306 + fVar306 * auVar248._8_4_;
  fVar309 = fVar309 + fVar309 * auVar248._12_4_;
  auVar248 = vrcpps_avx(auVar229);
  fVar320 = auVar248._0_4_;
  auVar325._0_4_ = auVar229._0_4_ * fVar320;
  fVar326 = auVar248._4_4_;
  auVar325._4_4_ = auVar229._4_4_ * fVar326;
  fVar328 = auVar248._8_4_;
  auVar325._8_4_ = auVar229._8_4_ * fVar328;
  fVar330 = auVar248._12_4_;
  auVar325._12_4_ = auVar229._12_4_ * fVar330;
  auVar229 = vsubps_avx(auVar335,auVar325);
  fVar320 = auVar229._0_4_ * fVar320 + fVar320;
  fVar326 = auVar229._4_4_ * fVar326 + fVar326;
  fVar328 = auVar229._8_4_ * fVar328 + fVar328;
  fVar330 = auVar229._12_4_ * fVar330 + fVar330;
  auVar207 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                          *(float *)(prim + lVar125 + 0x16)) *
                                         *(float *)(prim + lVar125 + 0x1a))),0);
  auVar229 = vcvtdq2ps_avx(auVar133);
  auVar248 = vcvtdq2ps_avx(auVar132);
  auVar248 = vsubps_avx(auVar248,auVar229);
  fVar163 = auVar207._0_4_;
  fVar176 = auVar207._4_4_;
  fVar177 = auVar207._8_4_;
  fVar322 = auVar207._12_4_;
  auVar132._0_4_ = fVar163 * auVar248._0_4_ + auVar229._0_4_;
  auVar132._4_4_ = fVar176 * auVar248._4_4_ + auVar229._4_4_;
  auVar132._8_4_ = fVar177 * auVar248._8_4_ + auVar229._8_4_;
  auVar132._12_4_ = fVar322 * auVar248._12_4_ + auVar229._12_4_;
  auVar229 = vcvtdq2ps_avx(auVar134);
  auVar248 = vcvtdq2ps_avx(auVar191);
  auVar248 = vsubps_avx(auVar248,auVar229);
  auVar202._0_4_ = fVar163 * auVar248._0_4_ + auVar229._0_4_;
  auVar202._4_4_ = fVar176 * auVar248._4_4_ + auVar229._4_4_;
  auVar202._8_4_ = fVar177 * auVar248._8_4_ + auVar229._8_4_;
  auVar202._12_4_ = fVar322 * auVar248._12_4_ + auVar229._12_4_;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + uVar118 * 0x12 + 6);
  auVar229 = vpmovsxwd_avx(auVar206);
  auVar229 = vcvtdq2ps_avx(auVar229);
  auVar264._8_8_ = 0;
  auVar264._0_8_ = *(ulong *)(prim + uVar118 * 0x16 + 6);
  auVar248 = vpmovsxwd_avx(auVar264);
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar248 = vsubps_avx(auVar248,auVar229);
  auVar246._0_4_ = fVar163 * auVar248._0_4_ + auVar229._0_4_;
  auVar246._4_4_ = fVar176 * auVar248._4_4_ + auVar229._4_4_;
  auVar246._8_4_ = fVar177 * auVar248._8_4_ + auVar229._8_4_;
  auVar246._12_4_ = fVar322 * auVar248._12_4_ + auVar229._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar118 * 0x14 + 6);
  auVar229 = vpmovsxwd_avx(auVar18);
  auVar229 = vcvtdq2ps_avx(auVar229);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar118 * 0x18 + 6);
  auVar248 = vpmovsxwd_avx(auVar19);
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar207 = vsubps_avx(auVar248,auVar229);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar118 * 0x1d + 6);
  auVar248 = vpmovsxwd_avx(auVar16);
  auVar253._0_4_ = auVar207._0_4_ * fVar163 + auVar229._0_4_;
  auVar253._4_4_ = auVar207._4_4_ * fVar176 + auVar229._4_4_;
  auVar253._8_4_ = auVar207._8_4_ * fVar177 + auVar229._8_4_;
  auVar253._12_4_ = auVar207._12_4_ * fVar322 + auVar229._12_4_;
  auVar229 = vcvtdq2ps_avx(auVar248);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar118 * 0x21 + 6);
  auVar248 = vpmovsxwd_avx(auVar17);
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar248 = vsubps_avx(auVar248,auVar229);
  auVar336._0_4_ = auVar248._0_4_ * fVar163 + auVar229._0_4_;
  auVar336._4_4_ = auVar248._4_4_ * fVar176 + auVar229._4_4_;
  auVar336._8_4_ = auVar248._8_4_ * fVar177 + auVar229._8_4_;
  auVar336._12_4_ = auVar248._12_4_ * fVar322 + auVar229._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar118 * 0x1f + 6);
  auVar229 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar118 * 0x23 + 6);
  auVar248 = vpmovsxwd_avx(auVar21);
  auVar229 = vcvtdq2ps_avx(auVar229);
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar248 = vsubps_avx(auVar248,auVar229);
  auVar185._0_4_ = auVar229._0_4_ + auVar248._0_4_ * fVar163;
  auVar185._4_4_ = auVar229._4_4_ + auVar248._4_4_ * fVar176;
  auVar185._8_4_ = auVar229._8_4_ + auVar248._8_4_ * fVar177;
  auVar185._12_4_ = auVar229._12_4_ + auVar248._12_4_ * fVar322;
  auVar229 = vsubps_avx(auVar132,auVar313);
  auVar133._0_4_ = fVar261 * auVar229._0_4_;
  auVar133._4_4_ = fVar267 * auVar229._4_4_;
  auVar133._8_4_ = fVar268 * auVar229._8_4_;
  auVar133._12_4_ = fVar269 * auVar229._12_4_;
  auVar229 = vsubps_avx(auVar202,auVar313);
  auVar203._0_4_ = fVar261 * auVar229._0_4_;
  auVar203._4_4_ = fVar267 * auVar229._4_4_;
  auVar203._8_4_ = fVar268 * auVar229._8_4_;
  auVar203._12_4_ = fVar269 * auVar229._12_4_;
  auVar229 = vsubps_avx(auVar246,auVar272);
  auVar247._0_4_ = fVar291 * auVar229._0_4_;
  auVar247._4_4_ = fVar302 * auVar229._4_4_;
  auVar247._8_4_ = fVar306 * auVar229._8_4_;
  auVar247._12_4_ = fVar309 * auVar229._12_4_;
  auVar229 = vsubps_avx(auVar253,auVar272);
  auVar254._0_4_ = fVar291 * auVar229._0_4_;
  auVar254._4_4_ = fVar302 * auVar229._4_4_;
  auVar254._8_4_ = fVar306 * auVar229._8_4_;
  auVar254._12_4_ = fVar309 * auVar229._12_4_;
  auVar229 = vsubps_avx(auVar336,auVar226);
  auVar263._0_4_ = fVar320 * auVar229._0_4_;
  auVar263._4_4_ = fVar326 * auVar229._4_4_;
  auVar263._8_4_ = fVar328 * auVar229._8_4_;
  auVar263._12_4_ = fVar330 * auVar229._12_4_;
  auVar229 = vsubps_avx(auVar185,auVar226);
  auVar186._0_4_ = fVar320 * auVar229._0_4_;
  auVar186._4_4_ = fVar326 * auVar229._4_4_;
  auVar186._8_4_ = fVar328 * auVar229._8_4_;
  auVar186._12_4_ = fVar330 * auVar229._12_4_;
  auVar229 = vpminsd_avx(auVar133,auVar203);
  auVar248 = vpminsd_avx(auVar247,auVar254);
  auVar229 = vmaxps_avx(auVar229,auVar248);
  auVar248 = vpminsd_avx(auVar263,auVar186);
  uVar129 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar295._4_4_ = uVar129;
  auVar295._0_4_ = uVar129;
  auVar295._8_4_ = uVar129;
  auVar295._12_4_ = uVar129;
  auVar248 = vmaxps_avx(auVar248,auVar295);
  auVar229 = vmaxps_avx(auVar229,auVar248);
  local_2d0._0_4_ = auVar229._0_4_ * 0.99999964;
  local_2d0._4_4_ = auVar229._4_4_ * 0.99999964;
  local_2d0._8_4_ = auVar229._8_4_ * 0.99999964;
  local_2d0._12_4_ = auVar229._12_4_ * 0.99999964;
  auVar229 = vpmaxsd_avx(auVar133,auVar203);
  auVar248 = vpmaxsd_avx(auVar247,auVar254);
  auVar229 = vminps_avx(auVar229,auVar248);
  auVar248 = vpmaxsd_avx(auVar263,auVar186);
  uVar129 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar204._4_4_ = uVar129;
  auVar204._0_4_ = uVar129;
  auVar204._8_4_ = uVar129;
  auVar204._12_4_ = uVar129;
  auVar248 = vminps_avx(auVar248,auVar204);
  auVar229 = vminps_avx(auVar229,auVar248);
  auVar134._0_4_ = auVar229._0_4_ * 1.0000004;
  auVar134._4_4_ = auVar229._4_4_ * 1.0000004;
  auVar134._8_4_ = auVar229._8_4_ * 1.0000004;
  auVar134._12_4_ = auVar229._12_4_ * 1.0000004;
  auVar229 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar248 = vpcmpgtd_avx(auVar229,_DAT_01f4ad30);
  auVar229 = vcmpps_avx(local_2d0,auVar134,2);
  auVar229 = vandps_avx(auVar229,auVar248);
  uVar129 = vmovmskps_avx(auVar229);
  local_510 = pre->ray_space + k;
  local_500 = mm_lookupmask_ps._16_8_;
  uStack_4f8 = mm_lookupmask_ps._24_8_;
  uStack_4f0 = mm_lookupmask_ps._16_8_;
  uStack_4e8 = mm_lookupmask_ps._24_8_;
  local_6b8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_7f0 = pre;
  local_508 = prim;
  for (uVar118 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar129); uVar118 != 0;
      uVar118 = (ulong)((uint)uVar118 & (uint)uVar118 + 0xf & uVar121)) {
    lVar125 = 0;
    if (uVar118 != 0) {
      for (; (uVar118 >> lVar125 & 1) == 0; lVar125 = lVar125 + 1) {
      }
    }
    uVar121 = *(uint *)(local_508 + 2);
    local_7e8 = (ulong)uVar121;
    pGVar127 = (context->scene->geometries).items[local_7e8].ptr;
    uVar122 = (ulong)*(uint *)(*(long *)&pGVar127->field_0x58 +
                              (ulong)*(uint *)(local_508 + lVar125 * 4 + 6) *
                              pGVar127[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar320 = (pGVar127->time_range).lower;
    fVar320 = pGVar127->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar320) / ((pGVar127->time_range).upper - fVar320)
              );
    auVar229 = vroundss_avx(ZEXT416((uint)fVar320),ZEXT416((uint)fVar320),9);
    auVar229 = vminss_avx(auVar229,ZEXT416((uint)(pGVar127->fnumTimeSegments + -1.0)));
    auVar229 = vmaxss_avx(ZEXT816(0) << 0x20,auVar229);
    fVar320 = fVar320 - auVar229._0_4_;
    _Var12 = pGVar127[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar123 = (long)(int)auVar229._0_4_ * 0x38;
    lVar124 = *(long *)(_Var12 + 0x10 + lVar123);
    lVar126 = *(long *)(_Var12 + 0x38 + lVar123);
    lVar13 = *(long *)(_Var12 + 0x48 + lVar123);
    auVar229 = vshufps_avx(ZEXT416((uint)fVar320),ZEXT416((uint)fVar320),0);
    pfVar1 = (float *)(lVar126 + lVar13 * uVar122);
    fVar163 = auVar229._0_4_;
    fVar176 = auVar229._4_4_;
    fVar177 = auVar229._8_4_;
    fVar322 = auVar229._12_4_;
    lVar128 = uVar122 + 1;
    pfVar2 = (float *)(lVar126 + lVar13 * lVar128);
    p_Var14 = pGVar127[4].occlusionFilterN;
    auVar229 = vshufps_avx(ZEXT416((uint)(1.0 - fVar320)),ZEXT416((uint)(1.0 - fVar320)),0);
    pfVar3 = (float *)(*(long *)(_Var12 + lVar123) + lVar124 * uVar122);
    fVar320 = auVar229._0_4_;
    fVar326 = auVar229._4_4_;
    fVar328 = auVar229._8_4_;
    fVar330 = auVar229._12_4_;
    pfVar4 = (float *)(*(long *)(_Var12 + lVar123) + lVar124 * lVar128);
    pfVar5 = (float *)(*(long *)(p_Var14 + lVar123 + 0x38) +
                      uVar122 * *(long *)(p_Var14 + lVar123 + 0x48));
    lVar126 = *(long *)(p_Var14 + lVar123 + 0x48) * lVar128;
    pfVar6 = (float *)(*(long *)(p_Var14 + lVar123 + 0x38) + lVar126);
    lVar128 = *(long *)(p_Var14 + lVar123 + 0x10) * lVar128;
    fVar261 = fVar320 * *pfVar3 + fVar163 * *pfVar1;
    fVar267 = fVar326 * pfVar3[1] + fVar176 * pfVar1[1];
    local_6d0 = (undefined1  [8])CONCAT44(fVar267,fVar261);
    uStack_6c8._0_4_ = fVar328 * pfVar3[2] + fVar177 * pfVar1[2];
    uStack_6c8._4_4_ = fVar330 * pfVar3[3] + fVar322 * pfVar1[3];
    pfVar1 = (float *)(*(long *)(p_Var14 + lVar123) + *(long *)(p_Var14 + lVar123 + 0x10) * uVar122)
    ;
    local_610 = (undefined1  [8])
                CONCAT44(fVar326 * pfVar4[1] + fVar176 * pfVar2[1],
                         fVar320 * *pfVar4 + fVar163 * *pfVar2);
    uStack_608._0_4_ = fVar328 * pfVar4[2] + fVar177 * pfVar2[2];
    uStack_608._4_4_ = fVar330 * pfVar4[3] + fVar322 * pfVar2[3];
    pfVar2 = (float *)(*(long *)(p_Var14 + lVar123) + lVar128);
    auVar229 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    uVar11 = (uint)pGVar127[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar191 = vinsertps_avx(auVar229,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    local_620 = (undefined1  [8])
                CONCAT44(fVar267 + (fVar326 * pfVar1[1] + fVar176 * pfVar5[1]) * 0.33333334,
                         fVar261 + (fVar320 * *pfVar1 + fVar163 * *pfVar5) * 0.33333334);
    uStack_618._0_4_ = (float)uStack_6c8 + (fVar328 * pfVar1[2] + fVar177 * pfVar5[2]) * 0.33333334;
    uStack_618._4_4_ = uStack_6c8._4_4_ + (fVar330 * pfVar1[3] + fVar322 * pfVar5[3]) * 0.33333334;
    auVar164._0_4_ = (fVar320 * *pfVar2 + fVar163 * *pfVar6) * 0.33333334;
    auVar164._4_4_ = (fVar326 * pfVar2[1] + fVar176 * pfVar6[1]) * 0.33333334;
    auVar164._8_4_ = (fVar328 * pfVar2[2] + fVar177 * pfVar6[2]) * 0.33333334;
    auVar164._12_4_ = (fVar330 * pfVar2[3] + fVar322 * pfVar6[3]) * 0.33333334;
    _local_630 = vsubps_avx(_local_610,auVar164);
    auVar207 = vsubps_avx(_local_6d0,auVar191);
    auVar229 = vshufps_avx(auVar207,auVar207,0);
    auVar248 = vshufps_avx(auVar207,auVar207,0x55);
    auVar207 = vshufps_avx(auVar207,auVar207,0xaa);
    fVar320 = (local_510->vx).field_0.m128[0];
    fVar326 = (local_510->vx).field_0.m128[1];
    fVar328 = (local_510->vx).field_0.m128[2];
    fVar330 = (local_510->vx).field_0.m128[3];
    fVar163 = (local_510->vy).field_0.m128[0];
    fVar176 = (local_510->vy).field_0.m128[1];
    fVar177 = (local_510->vy).field_0.m128[2];
    fVar322 = (local_510->vy).field_0.m128[3];
    fVar261 = (local_510->vz).field_0.m128[0];
    fVar267 = (local_510->vz).field_0.m128[1];
    fVar268 = (local_510->vz).field_0.m128[2];
    fVar269 = (local_510->vz).field_0.m128[3];
    auVar227._0_4_ = auVar229._0_4_ * fVar320 + auVar248._0_4_ * fVar163 + fVar261 * auVar207._0_4_;
    auVar227._4_4_ = auVar229._4_4_ * fVar326 + auVar248._4_4_ * fVar176 + fVar267 * auVar207._4_4_;
    auVar227._8_4_ = auVar229._8_4_ * fVar328 + auVar248._8_4_ * fVar177 + fVar268 * auVar207._8_4_;
    auVar227._12_4_ =
         auVar229._12_4_ * fVar330 + auVar248._12_4_ * fVar322 + fVar269 * auVar207._12_4_;
    auVar229 = vblendps_avx(auVar227,_local_6d0,8);
    auVar206 = vsubps_avx(_local_620,auVar191);
    auVar248 = vshufps_avx(auVar206,auVar206,0);
    auVar207 = vshufps_avx(auVar206,auVar206,0x55);
    auVar206 = vshufps_avx(auVar206,auVar206,0xaa);
    auVar344._0_4_ = auVar248._0_4_ * fVar320 + auVar207._0_4_ * fVar163 + fVar261 * auVar206._0_4_;
    auVar344._4_4_ = auVar248._4_4_ * fVar326 + auVar207._4_4_ * fVar176 + fVar267 * auVar206._4_4_;
    auVar344._8_4_ = auVar248._8_4_ * fVar328 + auVar207._8_4_ * fVar177 + fVar268 * auVar206._8_4_;
    auVar344._12_4_ =
         auVar248._12_4_ * fVar330 + auVar207._12_4_ * fVar322 + fVar269 * auVar206._12_4_;
    auVar248 = vblendps_avx(auVar344,_local_620,8);
    auVar264 = vsubps_avx(_local_630,auVar191);
    auVar207 = vshufps_avx(auVar264,auVar264,0);
    auVar206 = vshufps_avx(auVar264,auVar264,0x55);
    auVar264 = vshufps_avx(auVar264,auVar264,0xaa);
    auVar228._0_4_ = auVar207._0_4_ * fVar320 + auVar206._0_4_ * fVar163 + fVar261 * auVar264._0_4_;
    auVar228._4_4_ = auVar207._4_4_ * fVar326 + auVar206._4_4_ * fVar176 + fVar267 * auVar264._4_4_;
    auVar228._8_4_ = auVar207._8_4_ * fVar328 + auVar206._8_4_ * fVar177 + fVar268 * auVar264._8_4_;
    auVar228._12_4_ =
         auVar207._12_4_ * fVar330 + auVar206._12_4_ * fVar322 + fVar269 * auVar264._12_4_;
    auVar207 = vblendps_avx(auVar228,_local_630,8);
    auVar264 = vsubps_avx(_local_610,auVar191);
    auVar191 = vshufps_avx(auVar264,auVar264,0);
    auVar206 = vshufps_avx(auVar264,auVar264,0x55);
    auVar264 = vshufps_avx(auVar264,auVar264,0xaa);
    auVar165._0_4_ = auVar191._0_4_ * fVar320 + auVar206._0_4_ * fVar163 + fVar261 * auVar264._0_4_;
    auVar165._4_4_ = auVar191._4_4_ * fVar326 + auVar206._4_4_ * fVar176 + fVar267 * auVar264._4_4_;
    auVar165._8_4_ = auVar191._8_4_ * fVar328 + auVar206._8_4_ * fVar177 + fVar268 * auVar264._8_4_;
    auVar165._12_4_ =
         auVar191._12_4_ * fVar330 + auVar206._12_4_ * fVar322 + fVar269 * auVar264._12_4_;
    auVar191 = vblendps_avx(auVar165,_local_610,8);
    auVar205._8_4_ = 0x7fffffff;
    auVar205._0_8_ = 0x7fffffff7fffffff;
    auVar205._12_4_ = 0x7fffffff;
    auVar229 = vandps_avx(auVar229,auVar205);
    auVar248 = vandps_avx(auVar248,auVar205);
    auVar206 = vmaxps_avx(auVar229,auVar248);
    auVar229 = vandps_avx(auVar207,auVar205);
    auVar248 = vandps_avx(auVar191,auVar205);
    auVar229 = vmaxps_avx(auVar229,auVar248);
    auVar229 = vmaxps_avx(auVar206,auVar229);
    auVar248 = vmovshdup_avx(auVar229);
    auVar248 = vmaxss_avx(auVar248,auVar229);
    auVar229 = vshufpd_avx(auVar229,auVar229,1);
    auVar229 = vmaxss_avx(auVar229,auVar248);
    lVar124 = (long)(int)uVar11 * 0x44;
    fVar320 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar124 + 0x908);
    fVar326 = *(float *)(bezier_basis0 + lVar124 + 0x90c);
    fVar328 = *(float *)(bezier_basis0 + lVar124 + 0x910);
    fVar330 = *(float *)(bezier_basis0 + lVar124 + 0x914);
    fVar163 = *(float *)(bezier_basis0 + lVar124 + 0x918);
    fVar176 = *(float *)(bezier_basis0 + lVar124 + 0x91c);
    fVar177 = *(float *)(bezier_basis0 + lVar124 + 0x920);
    auVar116 = *(undefined1 (*) [28])(bezier_basis0 + lVar124 + 0x908);
    auVar248 = vshufps_avx(auVar228,auVar228,0);
    register0x00001310 = auVar248;
    _local_7e0 = auVar248;
    auVar207 = vshufps_avx(auVar228,auVar228,0x55);
    register0x00001290 = auVar207;
    _local_760 = auVar207;
    fVar322 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar124 + 0xd8c);
    fVar261 = *(float *)(bezier_basis0 + lVar124 + 0xd90);
    fVar267 = *(float *)(bezier_basis0 + lVar124 + 0xd94);
    fVar268 = *(float *)(bezier_basis0 + lVar124 + 0xd98);
    fVar269 = *(float *)(bezier_basis0 + lVar124 + 0xd9c);
    fVar291 = *(float *)(bezier_basis0 + lVar124 + 0xda0);
    fVar302 = *(float *)(bezier_basis0 + lVar124 + 0xda4);
    auVar115 = *(undefined1 (*) [28])(bezier_basis0 + lVar124 + 0xd8c);
    fVar306 = *(float *)(bezier_basis0 + lVar124 + 0xda8);
    auVar191 = vshufps_avx(auVar165,auVar165,0);
    register0x00001210 = auVar191;
    _local_480 = auVar191;
    fVar155 = auVar191._0_4_;
    fVar160 = auVar191._4_4_;
    fVar244 = auVar191._8_4_;
    fVar290 = auVar191._12_4_;
    fVar222 = auVar248._0_4_;
    fVar236 = auVar248._4_4_;
    fVar239 = auVar248._8_4_;
    fVar242 = auVar248._12_4_;
    auVar191 = vshufps_avx(auVar165,auVar165,0x55);
    register0x00001490 = auVar191;
    _local_7c0 = auVar191;
    fVar312 = auVar191._0_4_;
    fVar317 = auVar191._4_4_;
    fVar318 = auVar191._8_4_;
    fVar319 = auVar191._12_4_;
    fVar182 = auVar207._0_4_;
    fVar197 = auVar207._4_4_;
    fVar198 = auVar207._8_4_;
    fVar199 = auVar207._12_4_;
    auVar207 = vshufps_avx(_local_630,_local_630,0xff);
    register0x00001410 = auVar207;
    _local_80 = auVar207;
    auVar191 = vshufps_avx(_local_610,_local_610,0xff);
    register0x00001590 = auVar191;
    _local_a0 = auVar191;
    fVar349 = auVar191._0_4_;
    fVar354 = auVar191._4_4_;
    fVar356 = auVar191._8_4_;
    fVar358 = auVar191._12_4_;
    fVar179 = auVar207._0_4_;
    fVar277 = auVar207._4_4_;
    fVar278 = auVar207._8_4_;
    fVar281 = auVar207._12_4_;
    auVar207 = vshufps_avx(auVar344,auVar344,0);
    register0x000012d0 = auVar207;
    _local_300 = auVar207;
    fVar309 = *(float *)(bezier_basis0 + lVar124 + 0x484);
    fVar245 = *(float *)(bezier_basis0 + lVar124 + 0x488);
    fVar332 = *(float *)(bezier_basis0 + lVar124 + 0x48c);
    fVar178 = *(float *)(bezier_basis0 + lVar124 + 0x490);
    fVar333 = *(float *)(bezier_basis0 + lVar124 + 0x494);
    fVar282 = *(float *)(bezier_basis0 + lVar124 + 0x498);
    fVar270 = *(float *)(bezier_basis0 + lVar124 + 0x49c);
    fVar201 = auVar207._0_4_;
    fVar215 = auVar207._4_4_;
    fVar216 = auVar207._8_4_;
    fVar217 = auVar207._12_4_;
    auVar207 = vshufps_avx(auVar344,auVar344,0x55);
    local_680._16_16_ = auVar207;
    local_680._0_16_ = auVar207;
    fVar360 = auVar207._0_4_;
    fVar363 = auVar207._4_4_;
    fVar364 = auVar207._8_4_;
    fVar365 = auVar207._12_4_;
    auVar207 = vshufps_avx(_local_620,_local_620,0xff);
    register0x00001310 = auVar207;
    _local_c0 = auVar207;
    fVar223 = auVar207._0_4_;
    fVar237 = auVar207._4_4_;
    fVar240 = auVar207._8_4_;
    auVar191 = vshufps_avx(auVar227,auVar227,0);
    register0x000014d0 = auVar191;
    _local_e0 = auVar191;
    fVar271 = *(float *)(bezier_basis0 + lVar124);
    fVar218 = *(float *)(bezier_basis0 + lVar124 + 4);
    fVar283 = *(float *)(bezier_basis0 + lVar124 + 8);
    fVar279 = *(float *)(bezier_basis0 + lVar124 + 0xc);
    fStack_4b0 = *(float *)(bezier_basis0 + lVar124 + 0x10);
    fStack_4ac = *(float *)(bezier_basis0 + lVar124 + 0x14);
    fStack_4a8 = *(float *)(bezier_basis0 + lVar124 + 0x18);
    fStack_4a4 = *(float *)(bezier_basis0 + lVar124 + 0x1c);
    fVar321 = auVar191._0_4_;
    fVar327 = auVar191._4_4_;
    fVar329 = auVar191._8_4_;
    fVar331 = auVar191._12_4_;
    auVar265._0_4_ = fVar321 * fVar271 + fVar201 * fVar309 + fVar222 * fVar320 + fVar155 * fVar322;
    auVar265._4_4_ = fVar327 * fVar218 + fVar215 * fVar245 + fVar236 * fVar326 + fVar160 * fVar261;
    auVar265._8_4_ = fVar329 * fVar283 + fVar216 * fVar332 + fVar239 * fVar328 + fVar244 * fVar267;
    auVar265._12_4_ = fVar331 * fVar279 + fVar217 * fVar178 + fVar242 * fVar330 + fVar290 * fVar268;
    auVar265._16_4_ =
         fVar321 * fStack_4b0 + fVar201 * fVar333 + fVar222 * fVar163 + fVar155 * fVar269;
    auVar265._20_4_ =
         fVar327 * fStack_4ac + fVar215 * fVar282 + fVar236 * fVar176 + fVar160 * fVar291;
    auVar265._24_4_ =
         fVar329 * fStack_4a8 + fVar216 * fVar270 + fVar239 * fVar177 + fVar244 * fVar302;
    auVar265._28_4_ = fVar306 + fVar217 + fVar290 + 0.0;
    auVar191 = vshufps_avx(auVar227,auVar227,0x55);
    register0x00001290 = auVar191;
    _local_460 = auVar191;
    fVar162 = auVar191._0_4_;
    fVar181 = auVar191._4_4_;
    fVar260 = auVar191._8_4_;
    fVar200 = auVar191._12_4_;
    auVar337._0_4_ = fVar162 * fVar271 + fVar360 * fVar309 + fVar182 * fVar320 + fVar312 * fVar322;
    auVar337._4_4_ = fVar181 * fVar218 + fVar363 * fVar245 + fVar197 * fVar326 + fVar317 * fVar261;
    auVar337._8_4_ = fVar260 * fVar283 + fVar364 * fVar332 + fVar198 * fVar328 + fVar318 * fVar267;
    auVar337._12_4_ = fVar200 * fVar279 + fVar365 * fVar178 + fVar199 * fVar330 + fVar319 * fVar268;
    auVar337._16_4_ =
         fVar162 * fStack_4b0 + fVar360 * fVar333 + fVar182 * fVar163 + fVar312 * fVar269;
    auVar337._20_4_ =
         fVar181 * fStack_4ac + fVar363 * fVar282 + fVar197 * fVar176 + fVar317 * fVar291;
    auVar337._24_4_ =
         fVar260 * fStack_4a8 + fVar364 * fVar270 + fVar198 * fVar177 + fVar318 * fVar302;
    auVar337._28_4_ = fVar199 + 0.0 + 0.0 + 0.0;
    auVar191 = vpermilps_avx(_local_6d0,0xff);
    register0x00001450 = auVar191;
    _local_100 = auVar191;
    fVar292 = auVar191._0_4_;
    fVar303 = auVar191._4_4_;
    fVar307 = auVar191._8_4_;
    fVar130 = fVar223 * fVar309 + fVar179 * fVar320 + fVar349 * fVar322 + fVar292 * fVar271;
    fVar144 = fVar237 * fVar245 + fVar277 * fVar326 + fVar354 * fVar261 + fVar303 * fVar218;
    fVar147 = fVar240 * fVar332 + fVar278 * fVar328 + fVar356 * fVar267 + fVar307 * fVar283;
    fVar150 = auVar207._12_4_ * fVar178 + fVar281 * fVar330 + fVar358 * fVar268 +
              auVar191._12_4_ * fVar279;
    fVar153 = fVar223 * fVar333 + fVar179 * fVar163 + fVar349 * fVar269 + fVar292 * fStack_4b0;
    fVar156 = fVar237 * fVar282 + fVar277 * fVar176 + fVar354 * fVar291 + fVar303 * fStack_4ac;
    fVar158 = fVar240 * fVar270 + fVar278 * fVar177 + fVar356 * fVar302 + fVar307 * fStack_4a8;
    fVar161 = *(float *)(bezier_basis0 + lVar124 + 0x924) + 0.0 + 0.0 + 0.0;
    fVar322 = *(float *)(bezier_basis1 + lVar124 + 0x908);
    fVar261 = *(float *)(bezier_basis1 + lVar124 + 0x90c);
    fVar267 = *(float *)(bezier_basis1 + lVar124 + 0x910);
    fVar268 = *(float *)(bezier_basis1 + lVar124 + 0x914);
    fVar269 = *(float *)(bezier_basis1 + lVar124 + 0x918);
    fVar291 = *(float *)(bezier_basis1 + lVar124 + 0x91c);
    fVar302 = *(float *)(bezier_basis1 + lVar124 + 0x920);
    fVar280 = *(float *)(bezier_basis1 + lVar124 + 0xd8c);
    fVar219 = *(float *)(bezier_basis1 + lVar124 + 0xd90);
    fVar286 = *(float *)(bezier_basis1 + lVar124 + 0xd94);
    fVar284 = *(float *)(bezier_basis1 + lVar124 + 0xd98);
    fVar285 = *(float *)(bezier_basis1 + lVar124 + 0xd9c);
    fVar220 = *(float *)(bezier_basis1 + lVar124 + 0xda0);
    fVar287 = *(float *)(bezier_basis1 + lVar124 + 0xda4);
    fVar320 = *(float *)(bezier_basis1 + lVar124 + 0xda8);
    fVar288 = *(float *)(bezier_basis1 + lVar124 + 0x484);
    fVar289 = *(float *)(bezier_basis1 + lVar124 + 0x488);
    fVar221 = *(float *)(bezier_basis1 + lVar124 + 0x48c);
    fVar180 = *(float *)(bezier_basis1 + lVar124 + 0x490);
    fVar145 = *(float *)(bezier_basis1 + lVar124 + 0x494);
    fVar148 = *(float *)(bezier_basis1 + lVar124 + 0x498);
    fVar151 = *(float *)(bezier_basis1 + lVar124 + 0x49c);
    fVar154 = *(float *)(bezier_basis1 + lVar124);
    fVar157 = *(float *)(bezier_basis1 + lVar124 + 4);
    fVar159 = *(float *)(bezier_basis1 + lVar124 + 8);
    fVar131 = *(float *)(bezier_basis1 + lVar124 + 0xc);
    fVar146 = *(float *)(bezier_basis1 + lVar124 + 0x10);
    fVar149 = *(float *)(bezier_basis1 + lVar124 + 0x14);
    fVar152 = *(float *)(bezier_basis1 + lVar124 + 0x18);
    local_4a0._0_4_ = fVar321 * fVar154 + fVar201 * fVar288 + fVar222 * fVar322 + fVar280 * fVar155;
    local_4a0._4_4_ = fVar327 * fVar157 + fVar215 * fVar289 + fVar236 * fVar261 + fVar219 * fVar160;
    fStack_498 = fVar329 * fVar159 + fVar216 * fVar221 + fVar239 * fVar267 + fVar286 * fVar244;
    fStack_494 = fVar331 * fVar131 + fVar217 * fVar180 + fVar242 * fVar268 + fVar284 * fVar290;
    fStack_490 = fVar321 * fVar146 + fVar201 * fVar145 + fVar222 * fVar269 + fVar285 * fVar155;
    fStack_48c = fVar327 * fVar149 + fVar215 * fVar148 + fVar236 * fVar291 + fVar220 * fVar160;
    fStack_488 = fVar329 * fVar152 + fVar216 * fVar151 + fVar239 * fVar302 + fVar287 * fVar244;
    fStack_484 = fVar358 + fVar320 + fVar161 + 0.0;
    auVar208._0_4_ = fVar154 * fVar162 + fVar360 * fVar288 + fVar322 * fVar182 + fVar312 * fVar280;
    auVar208._4_4_ = fVar157 * fVar181 + fVar363 * fVar289 + fVar261 * fVar197 + fVar317 * fVar219;
    auVar208._8_4_ = fVar159 * fVar260 + fVar364 * fVar221 + fVar267 * fVar198 + fVar318 * fVar286;
    auVar208._12_4_ = fVar131 * fVar200 + fVar365 * fVar180 + fVar268 * fVar199 + fVar319 * fVar284;
    auVar208._16_4_ = fVar146 * fVar162 + fVar360 * fVar145 + fVar269 * fVar182 + fVar312 * fVar285;
    auVar208._20_4_ = fVar149 * fVar181 + fVar363 * fVar148 + fVar291 * fVar197 + fVar317 * fVar220;
    auVar208._24_4_ = fVar152 * fVar260 + fVar364 * fVar151 + fVar302 * fVar198 + fVar318 * fVar287;
    auVar208._28_4_ = fVar200 + fVar320 + fVar306 + 0.0;
    local_740._0_4_ = fVar223 * fVar288 + fVar179 * fVar322 + fVar349 * fVar280 + fVar292 * fVar154;
    local_740._4_4_ = fVar237 * fVar289 + fVar277 * fVar261 + fVar354 * fVar219 + fVar303 * fVar157;
    local_740._8_4_ = fVar240 * fVar221 + fVar278 * fVar267 + fVar356 * fVar286 + fVar307 * fVar159;
    local_740._12_4_ =
         auVar207._12_4_ * fVar180 + fVar281 * fVar268 + fVar358 * fVar284 +
         auVar191._12_4_ * fVar131;
    local_740._16_4_ = fVar223 * fVar145 + fVar179 * fVar269 + fVar349 * fVar285 + fVar292 * fVar146
    ;
    local_740._20_4_ = fVar237 * fVar148 + fVar277 * fVar291 + fVar354 * fVar220 + fVar303 * fVar149
    ;
    local_740._24_4_ = fVar240 * fVar151 + fVar278 * fVar302 + fVar356 * fVar287 + fVar307 * fVar152
    ;
    local_740._28_4_ = fVar320 + fVar281 + fVar306 + fVar200;
    auVar22 = vsubps_avx(_local_4a0,auVar265);
    auVar298 = vsubps_avx(auVar208,auVar337);
    fVar320 = auVar22._0_4_;
    fVar326 = auVar22._4_4_;
    auVar174._4_4_ = auVar337._4_4_ * fVar326;
    auVar174._0_4_ = auVar337._0_4_ * fVar320;
    fVar328 = auVar22._8_4_;
    auVar174._8_4_ = auVar337._8_4_ * fVar328;
    fVar330 = auVar22._12_4_;
    auVar174._12_4_ = auVar337._12_4_ * fVar330;
    fVar163 = auVar22._16_4_;
    auVar174._16_4_ = auVar337._16_4_ * fVar163;
    fVar176 = auVar22._20_4_;
    auVar174._20_4_ = auVar337._20_4_ * fVar176;
    fVar177 = auVar22._24_4_;
    auVar174._24_4_ = auVar337._24_4_ * fVar177;
    auVar174._28_4_ = fVar200;
    fVar306 = auVar298._0_4_;
    fVar223 = auVar298._4_4_;
    auVar23._4_4_ = fVar223 * auVar265._4_4_;
    auVar23._0_4_ = fVar306 * auVar265._0_4_;
    fVar237 = auVar298._8_4_;
    auVar23._8_4_ = fVar237 * auVar265._8_4_;
    fVar240 = auVar298._12_4_;
    auVar23._12_4_ = fVar240 * auVar265._12_4_;
    fVar179 = auVar298._16_4_;
    auVar23._16_4_ = fVar179 * auVar265._16_4_;
    fVar277 = auVar298._20_4_;
    auVar23._20_4_ = fVar277 * auVar265._20_4_;
    fVar278 = auVar298._24_4_;
    auVar23._24_4_ = fVar278 * auVar265._24_4_;
    auVar23._28_4_ = auVar208._28_4_;
    auVar23 = vsubps_avx(auVar174,auVar23);
    auVar15._4_4_ = fVar144;
    auVar15._0_4_ = fVar130;
    auVar15._8_4_ = fVar147;
    auVar15._12_4_ = fVar150;
    auVar15._16_4_ = fVar153;
    auVar15._20_4_ = fVar156;
    auVar15._24_4_ = fVar158;
    auVar15._28_4_ = fVar161;
    auVar174 = vmaxps_avx(auVar15,local_740);
    auVar274._4_4_ = auVar174._4_4_ * auVar174._4_4_ * (fVar326 * fVar326 + fVar223 * fVar223);
    auVar274._0_4_ = auVar174._0_4_ * auVar174._0_4_ * (fVar320 * fVar320 + fVar306 * fVar306);
    auVar274._8_4_ = auVar174._8_4_ * auVar174._8_4_ * (fVar328 * fVar328 + fVar237 * fVar237);
    auVar274._12_4_ = auVar174._12_4_ * auVar174._12_4_ * (fVar330 * fVar330 + fVar240 * fVar240);
    auVar274._16_4_ = auVar174._16_4_ * auVar174._16_4_ * (fVar163 * fVar163 + fVar179 * fVar179);
    auVar274._20_4_ = auVar174._20_4_ * auVar174._20_4_ * (fVar176 * fVar176 + fVar277 * fVar277);
    auVar274._24_4_ = auVar174._24_4_ * auVar174._24_4_ * (fVar177 * fVar177 + fVar278 * fVar278);
    auVar274._28_4_ = fStack_484 + auVar208._28_4_;
    auVar251._4_4_ = auVar23._4_4_ * auVar23._4_4_;
    auVar251._0_4_ = auVar23._0_4_ * auVar23._0_4_;
    auVar251._8_4_ = auVar23._8_4_ * auVar23._8_4_;
    auVar251._12_4_ = auVar23._12_4_ * auVar23._12_4_;
    auVar251._16_4_ = auVar23._16_4_ * auVar23._16_4_;
    auVar251._20_4_ = auVar23._20_4_ * auVar23._20_4_;
    auVar251._24_4_ = auVar23._24_4_ * auVar23._24_4_;
    auVar251._28_4_ = auVar23._28_4_;
    local_640._0_4_ = (undefined4)(int)uVar11;
    local_640._4_12_ = auVar248._4_12_;
    auVar174 = vcmpps_avx(auVar251,auVar274,2);
    auVar206 = ZEXT416((uint)(auVar229._0_4_ * 4.7683716e-07));
    auVar229 = vshufps_avx(local_640,local_640,0);
    auVar209._16_16_ = auVar229;
    auVar209._0_16_ = auVar229;
    auVar23 = vcmpps_avx(_DAT_01f7b060,auVar209,1);
    auVar214 = ZEXT3264(auVar23);
    auVar229 = vpermilps_avx(auVar227,0xaa);
    register0x00001450 = auVar229;
    _local_5e0 = auVar229;
    auVar248 = vpermilps_avx(auVar344,0xaa);
    register0x00001550 = auVar248;
    _local_320 = auVar248;
    auVar207 = vpermilps_avx(auVar228,0xaa);
    register0x00001590 = auVar207;
    _local_120 = auVar207;
    auVar191 = vpermilps_avx(auVar165,0xaa);
    auVar230._16_16_ = auVar191;
    auVar230._0_16_ = auVar191;
    auVar274 = auVar23 & auVar174;
    _local_720 = ZEXT416(*(uint *)(ray + k * 4 + 0x30));
    auVar264 = ZEXT416(*(uint *)(local_508 + lVar125 * 4 + 6));
    fVar320 = fVar312;
    fVar326 = fVar317;
    fVar328 = fVar318;
    fVar330 = fVar319;
    fVar163 = fVar222;
    fVar176 = fVar236;
    fVar177 = fVar239;
    fVar306 = fVar182;
    fVar223 = fVar197;
    fVar237 = fVar198;
    fVar240 = fVar199;
    if ((((((((auVar274 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar274 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar274 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar274 >> 0x7f,0) == '\0') &&
          (auVar274 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar274 >> 0xbf,0) == '\0') &&
        (auVar274 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar274[0x1f])
    {
      uVar122 = 0;
      auVar316 = ZEXT3264(local_680);
      auVar298 = local_560;
      auVar274 = local_540;
    }
    else {
      local_600._0_16_ = auVar264;
      local_340 = vandps_avx(auVar174,auVar23);
      fVar293 = auVar229._0_4_;
      fVar304 = auVar229._4_4_;
      fVar308 = auVar229._8_4_;
      fVar310 = auVar229._12_4_;
      fVar342 = auVar248._0_4_;
      fVar346 = auVar248._4_4_;
      fVar347 = auVar248._8_4_;
      fVar348 = auVar248._12_4_;
      fVar350 = auVar207._0_4_;
      fVar355 = auVar207._4_4_;
      fVar357 = auVar207._8_4_;
      fVar359 = auVar207._12_4_;
      fVar224 = auVar191._0_4_;
      fVar238 = auVar191._4_4_;
      fVar241 = auVar191._8_4_;
      fVar243 = auVar191._12_4_;
      fVar179 = auVar23._28_4_ + *(float *)(bezier_basis1 + lVar124 + 0x924) + 0.0;
      local_4e0 = fVar293 * fVar154 + fVar342 * fVar288 + fVar350 * fVar322 + fVar224 * fVar280;
      fStack_4dc = fVar304 * fVar157 + fVar346 * fVar289 + fVar355 * fVar261 + fVar238 * fVar219;
      fStack_4d8 = fVar308 * fVar159 + fVar347 * fVar221 + fVar357 * fVar267 + fVar241 * fVar286;
      fStack_4d4 = fVar310 * fVar131 + fVar348 * fVar180 + fVar359 * fVar268 + fVar243 * fVar284;
      fStack_4d0 = fVar293 * fVar146 + fVar342 * fVar145 + fVar350 * fVar269 + fVar224 * fVar285;
      fStack_4cc = fVar304 * fVar149 + fVar346 * fVar148 + fVar355 * fVar291 + fVar238 * fVar220;
      fStack_4c8 = fVar308 * fVar152 + fVar347 * fVar151 + fVar357 * fVar302 + fVar241 * fVar287;
      fStack_4c4 = local_340._28_4_ + fVar179;
      local_5c0._0_4_ = auVar116._0_4_;
      local_5c0._4_4_ = auVar116._4_4_;
      fStack_5b8 = auVar116._8_4_;
      fStack_5b4 = auVar116._12_4_;
      fStack_5b0 = auVar116._16_4_;
      fStack_5ac = auVar116._20_4_;
      fStack_5a8 = auVar116._24_4_;
      local_700._0_4_ = auVar115._0_4_;
      local_700._4_4_ = auVar115._4_4_;
      fStack_6f8 = auVar115._8_4_;
      fStack_6f4 = auVar115._12_4_;
      fStack_6f0 = auVar115._16_4_;
      fStack_6ec = auVar115._20_4_;
      fStack_6e8 = auVar115._24_4_;
      local_5c0._0_4_ =
           fVar293 * fVar271 +
           fVar342 * fVar309 + fVar350 * (float)local_5c0._0_4_ + fVar224 * (float)local_700._0_4_;
      local_5c0._4_4_ =
           fVar304 * fVar218 +
           fVar346 * fVar245 + fVar355 * (float)local_5c0._4_4_ + fVar238 * (float)local_700._4_4_;
      fStack_5b8 = fVar308 * fVar283 +
                   fVar347 * fVar332 + fVar357 * fStack_5b8 + fVar241 * fStack_6f8;
      fStack_5b4 = fVar310 * fVar279 +
                   fVar348 * fVar178 + fVar359 * fStack_5b4 + fVar243 * fStack_6f4;
      fStack_5b0 = fVar293 * fStack_4b0 +
                   fVar342 * fVar333 + fVar350 * fStack_5b0 + fVar224 * fStack_6f0;
      fStack_5ac = fVar304 * fStack_4ac +
                   fVar346 * fVar282 + fVar355 * fStack_5ac + fVar238 * fStack_6ec;
      fStack_5a8 = fVar308 * fStack_4a8 +
                   fVar347 * fVar270 + fVar357 * fStack_5a8 + fVar241 * fStack_6e8;
      fStack_5a4 = fStack_4c4 + fVar179 + local_340._28_4_ + auVar23._28_4_;
      fVar322 = *(float *)(bezier_basis0 + lVar124 + 0x1210);
      fVar261 = *(float *)(bezier_basis0 + lVar124 + 0x1214);
      fVar267 = *(float *)(bezier_basis0 + lVar124 + 0x1218);
      fVar268 = *(float *)(bezier_basis0 + lVar124 + 0x121c);
      fVar269 = *(float *)(bezier_basis0 + lVar124 + 0x1220);
      fVar291 = *(float *)(bezier_basis0 + lVar124 + 0x1224);
      fVar302 = *(float *)(bezier_basis0 + lVar124 + 0x1228);
      fVar309 = *(float *)(bezier_basis0 + lVar124 + 0x1694);
      fVar245 = *(float *)(bezier_basis0 + lVar124 + 0x1698);
      fVar332 = *(float *)(bezier_basis0 + lVar124 + 0x169c);
      fVar178 = *(float *)(bezier_basis0 + lVar124 + 0x16a0);
      fVar333 = *(float *)(bezier_basis0 + lVar124 + 0x16a4);
      fVar282 = *(float *)(bezier_basis0 + lVar124 + 0x16a8);
      fVar270 = *(float *)(bezier_basis0 + lVar124 + 0x16ac);
      fVar271 = *(float *)(bezier_basis0 + lVar124 + 0x1b18);
      fVar218 = *(float *)(bezier_basis0 + lVar124 + 0x1b1c);
      fVar283 = *(float *)(bezier_basis0 + lVar124 + 0x1b20);
      fVar279 = *(float *)(bezier_basis0 + lVar124 + 0x1b24);
      fVar280 = *(float *)(bezier_basis0 + lVar124 + 0x1b28);
      fVar219 = *(float *)(bezier_basis0 + lVar124 + 0x1b2c);
      fVar286 = *(float *)(bezier_basis0 + lVar124 + 0x1b30);
      fVar284 = *(float *)(bezier_basis0 + lVar124 + 0x1f9c);
      fVar285 = *(float *)(bezier_basis0 + lVar124 + 0x1fa0);
      fVar220 = *(float *)(bezier_basis0 + lVar124 + 0x1fa4);
      fVar287 = *(float *)(bezier_basis0 + lVar124 + 0x1fa8);
      fVar288 = *(float *)(bezier_basis0 + lVar124 + 0x1fac);
      fVar289 = *(float *)(bezier_basis0 + lVar124 + 0x1fb0);
      fVar221 = *(float *)(bezier_basis0 + lVar124 + 0x1fb4);
      fVar180 = *(float *)(bezier_basis0 + lVar124 + 0x1b34) +
                *(float *)(bezier_basis0 + lVar124 + 0x1fb8);
      fVar311 = *(float *)(bezier_basis0 + lVar124 + 0x16b0) + fVar180;
      auVar255._0_4_ = fVar162 * fVar322 + fVar182 * fVar271 + fVar312 * fVar284 + fVar360 * fVar309
      ;
      auVar255._4_4_ = fVar181 * fVar261 + fVar197 * fVar218 + fVar317 * fVar285 + fVar363 * fVar245
      ;
      auVar255._8_4_ = fVar260 * fVar267 + fVar198 * fVar283 + fVar318 * fVar220 + fVar364 * fVar332
      ;
      auVar255._12_4_ =
           fVar200 * fVar268 + fVar199 * fVar279 + fVar319 * fVar287 + fVar365 * fVar178;
      auVar255._16_4_ =
           fVar162 * fVar269 + fVar182 * fVar280 + fVar312 * fVar288 + fVar360 * fVar333;
      auVar255._20_4_ =
           fVar181 * fVar291 + fVar197 * fVar219 + fVar317 * fVar289 + fVar363 * fVar282;
      auVar255._24_4_ =
           fVar260 * fVar302 + fVar198 * fVar286 + fVar318 * fVar221 + fVar364 * fVar270;
      auVar255._28_4_ =
           fVar180 + fVar310 + auVar337._28_4_ +
                     fVar310 + *(float *)(bezier_basis1 + lVar124 + 0x4a0);
      local_4c0 = fVar342 * fVar309 + fVar350 * fVar271 + fVar224 * fVar284 + fVar293 * fVar322;
      fStack_4bc = fVar346 * fVar245 + fVar355 * fVar218 + fVar238 * fVar285 + fVar304 * fVar261;
      fStack_4b8 = fVar347 * fVar332 + fVar357 * fVar283 + fVar241 * fVar220 + fVar308 * fVar267;
      fStack_4b4 = fVar348 * fVar178 + fVar359 * fVar279 + fVar243 * fVar287 + fVar310 * fVar268;
      fStack_4b0 = fVar342 * fVar333 + fVar350 * fVar280 + fVar224 * fVar288 + fVar293 * fVar269;
      fStack_4ac = fVar346 * fVar282 + fVar355 * fVar219 + fVar238 * fVar289 + fVar304 * fVar291;
      fStack_4a8 = fVar347 * fVar270 + fVar357 * fVar286 + fVar241 * fVar221 + fVar308 * fVar302;
      fStack_4a4 = fVar311 + *(float *)(bezier_basis0 + lVar124 + 0x122c);
      fVar180 = *(float *)(bezier_basis1 + lVar124 + 0x1b18);
      fVar145 = *(float *)(bezier_basis1 + lVar124 + 0x1b1c);
      fVar148 = *(float *)(bezier_basis1 + lVar124 + 0x1b20);
      fVar151 = *(float *)(bezier_basis1 + lVar124 + 0x1b24);
      fVar154 = *(float *)(bezier_basis1 + lVar124 + 0x1b28);
      fVar157 = *(float *)(bezier_basis1 + lVar124 + 0x1b2c);
      fVar159 = *(float *)(bezier_basis1 + lVar124 + 0x1b30);
      fVar131 = *(float *)(bezier_basis1 + lVar124 + 0x1f9c);
      fVar146 = *(float *)(bezier_basis1 + lVar124 + 0x1fa0);
      fVar149 = *(float *)(bezier_basis1 + lVar124 + 0x1fa4);
      fVar152 = *(float *)(bezier_basis1 + lVar124 + 0x1fa8);
      fVar179 = *(float *)(bezier_basis1 + lVar124 + 0x1fac);
      fVar277 = *(float *)(bezier_basis1 + lVar124 + 0x1fb0);
      fVar278 = *(float *)(bezier_basis1 + lVar124 + 0x1fb4);
      fVar281 = *(float *)(bezier_basis1 + lVar124 + 0x1694);
      fVar292 = *(float *)(bezier_basis1 + lVar124 + 0x1698);
      fVar303 = *(float *)(bezier_basis1 + lVar124 + 0x169c);
      fVar307 = *(float *)(bezier_basis1 + lVar124 + 0x16a0);
      fVar349 = *(float *)(bezier_basis1 + lVar124 + 0x16a4);
      fVar354 = *(float *)(bezier_basis1 + lVar124 + 0x16a8);
      fVar356 = *(float *)(bezier_basis1 + lVar124 + 0x16ac);
      fVar358 = *(float *)(bezier_basis1 + lVar124 + 0x1210);
      fVar101 = *(float *)(bezier_basis1 + lVar124 + 0x1214);
      fVar102 = *(float *)(bezier_basis1 + lVar124 + 0x1218);
      fVar103 = *(float *)(bezier_basis1 + lVar124 + 0x121c);
      fVar104 = *(float *)(bezier_basis1 + lVar124 + 0x1220);
      fVar105 = *(float *)(bezier_basis1 + lVar124 + 0x1224);
      fVar106 = *(float *)(bezier_basis1 + lVar124 + 0x1228);
      auVar273._0_4_ = fVar321 * fVar358 + fVar201 * fVar281 + fVar222 * fVar180 + fVar155 * fVar131
      ;
      auVar273._4_4_ = fVar327 * fVar101 + fVar215 * fVar292 + fVar236 * fVar145 + fVar160 * fVar146
      ;
      auVar273._8_4_ = fVar329 * fVar102 + fVar216 * fVar303 + fVar239 * fVar148 + fVar244 * fVar149
      ;
      auVar273._12_4_ =
           fVar331 * fVar103 + fVar217 * fVar307 + fVar242 * fVar151 + fVar290 * fVar152;
      auVar273._16_4_ =
           fVar321 * fVar104 + fVar201 * fVar349 + fVar222 * fVar154 + fVar155 * fVar179;
      auVar273._20_4_ =
           fVar327 * fVar105 + fVar215 * fVar354 + fVar236 * fVar157 + fVar160 * fVar277;
      auVar273._24_4_ =
           fVar329 * fVar106 + fVar216 * fVar356 + fVar239 * fVar159 + fVar244 * fVar278;
      auVar273._28_4_ = fVar199 + fVar199 + fVar311 + fVar290;
      auVar296._0_4_ = fVar162 * fVar358 + fVar360 * fVar281 + fVar182 * fVar180 + fVar312 * fVar131
      ;
      auVar296._4_4_ = fVar181 * fVar101 + fVar363 * fVar292 + fVar197 * fVar145 + fVar317 * fVar146
      ;
      auVar296._8_4_ = fVar260 * fVar102 + fVar364 * fVar303 + fVar198 * fVar148 + fVar318 * fVar149
      ;
      auVar296._12_4_ =
           fVar200 * fVar103 + fVar365 * fVar307 + fVar199 * fVar151 + fVar319 * fVar152;
      auVar296._16_4_ =
           fVar162 * fVar104 + fVar360 * fVar349 + fVar182 * fVar154 + fVar312 * fVar179;
      auVar296._20_4_ =
           fVar181 * fVar105 + fVar363 * fVar354 + fVar197 * fVar157 + fVar317 * fVar277;
      auVar296._24_4_ =
           fVar260 * fVar106 + fVar364 * fVar356 + fVar198 * fVar159 + fVar318 * fVar278;
      auVar296._28_4_ = fVar199 + fVar199 + fVar199 + fVar311;
      auVar194._0_4_ = fVar293 * fVar358 + fVar342 * fVar281 + fVar350 * fVar180 + fVar224 * fVar131
      ;
      auVar194._4_4_ = fVar304 * fVar101 + fVar346 * fVar292 + fVar355 * fVar145 + fVar238 * fVar146
      ;
      auVar194._8_4_ = fVar308 * fVar102 + fVar347 * fVar303 + fVar357 * fVar148 + fVar241 * fVar149
      ;
      auVar194._12_4_ =
           fVar310 * fVar103 + fVar348 * fVar307 + fVar359 * fVar151 + fVar243 * fVar152;
      auVar194._16_4_ =
           fVar293 * fVar104 + fVar342 * fVar349 + fVar350 * fVar154 + fVar224 * fVar179;
      auVar194._20_4_ =
           fVar304 * fVar105 + fVar346 * fVar354 + fVar355 * fVar157 + fVar238 * fVar277;
      auVar194._24_4_ =
           fVar308 * fVar106 + fVar347 * fVar356 + fVar357 * fVar159 + fVar241 * fVar278;
      auVar194._28_4_ =
           *(float *)(bezier_basis1 + lVar124 + 0x122c) +
           *(float *)(bezier_basis1 + lVar124 + 0x16b0) +
           *(float *)(bezier_basis1 + lVar124 + 0x1b34) +
           *(float *)(bezier_basis1 + lVar124 + 0x1fb8);
      auVar231._8_4_ = 0x7fffffff;
      auVar231._0_8_ = 0x7fffffff7fffffff;
      auVar231._12_4_ = 0x7fffffff;
      auVar231._16_4_ = 0x7fffffff;
      auVar231._20_4_ = 0x7fffffff;
      auVar231._24_4_ = 0x7fffffff;
      auVar231._28_4_ = 0x7fffffff;
      auVar108._4_4_ = fVar327 * fVar261 + fVar215 * fVar245 + fVar236 * fVar218 + fVar160 * fVar285
      ;
      auVar108._0_4_ = fVar321 * fVar322 + fVar201 * fVar309 + fVar222 * fVar271 + fVar155 * fVar284
      ;
      auVar108._8_4_ = fVar329 * fVar267 + fVar216 * fVar332 + fVar239 * fVar283 + fVar244 * fVar220
      ;
      auVar108._12_4_ =
           fVar331 * fVar268 + fVar217 * fVar178 + fVar242 * fVar279 + fVar290 * fVar287;
      auVar108._16_4_ =
           fVar321 * fVar269 + fVar201 * fVar333 + fVar222 * fVar280 + fVar155 * fVar288;
      auVar108._20_4_ =
           fVar327 * fVar291 + fVar215 * fVar282 + fVar236 * fVar219 + fVar160 * fVar289;
      auVar108._24_4_ =
           fVar329 * fVar302 + fVar216 * fVar270 + fVar239 * fVar286 + fVar244 * fVar221;
      auVar108._28_4_ =
           *(float *)(bezier_basis0 + lVar124 + 0x16b0) +
           *(float *)(bezier_basis0 + lVar124 + 0x1fb8) +
           fVar310 + *(float *)(bezier_basis1 + lVar124 + 0x4a0);
      auVar174 = vandps_avx(auVar108,auVar231);
      auVar23 = vandps_avx(auVar255,auVar231);
      auVar23 = vmaxps_avx(auVar174,auVar23);
      auVar114._4_4_ = fStack_4bc;
      auVar114._0_4_ = local_4c0;
      auVar114._8_4_ = fStack_4b8;
      auVar114._12_4_ = fStack_4b4;
      auVar114._16_4_ = fStack_4b0;
      auVar114._20_4_ = fStack_4ac;
      auVar114._24_4_ = fStack_4a8;
      auVar114._28_4_ = fStack_4a4;
      auVar174 = vandps_avx(auVar231,auVar114);
      auVar174 = vmaxps_avx(auVar23,auVar174);
      auVar229 = vpermilps_avx(auVar206,0);
      auVar256._16_16_ = auVar229;
      auVar256._0_16_ = auVar229;
      auVar174 = vcmpps_avx(auVar174,auVar256,1);
      auVar274 = vblendvps_avx(auVar108,auVar22,auVar174);
      auVar251 = vblendvps_avx(auVar255,auVar298,auVar174);
      auVar174 = vandps_avx(auVar273,auVar231);
      auVar23 = vandps_avx(auVar296,auVar231);
      auVar15 = vmaxps_avx(auVar174,auVar23);
      auVar174 = vandps_avx(auVar194,auVar231);
      auVar174 = vmaxps_avx(auVar15,auVar174);
      auVar15 = vcmpps_avx(auVar174,auVar256,1);
      auVar174 = vblendvps_avx(auVar273,auVar22,auVar15);
      auVar298 = vblendvps_avx(auVar296,auVar298,auVar15);
      fVar180 = auVar274._0_4_;
      fVar145 = auVar274._4_4_;
      fVar148 = auVar274._8_4_;
      fVar151 = auVar274._12_4_;
      fVar154 = auVar274._16_4_;
      fVar157 = auVar274._20_4_;
      fVar159 = auVar274._24_4_;
      fVar131 = auVar174._0_4_;
      fVar146 = auVar174._4_4_;
      fVar149 = auVar174._8_4_;
      fVar152 = auVar174._12_4_;
      fVar155 = auVar174._16_4_;
      fVar160 = auVar174._20_4_;
      fVar244 = auVar174._24_4_;
      fVar290 = -auVar174._28_4_;
      fVar322 = auVar251._0_4_;
      fVar269 = auVar251._4_4_;
      fVar245 = auVar251._8_4_;
      fVar282 = auVar251._12_4_;
      fVar283 = auVar251._16_4_;
      fVar286 = auVar251._20_4_;
      fVar287 = auVar251._24_4_;
      auVar137._0_4_ = fVar322 * fVar322 + fVar180 * fVar180;
      auVar137._4_4_ = fVar269 * fVar269 + fVar145 * fVar145;
      auVar137._8_4_ = fVar245 * fVar245 + fVar148 * fVar148;
      auVar137._12_4_ = fVar282 * fVar282 + fVar151 * fVar151;
      auVar137._16_4_ = fVar283 * fVar283 + fVar154 * fVar154;
      auVar137._20_4_ = fVar286 * fVar286 + fVar157 * fVar157;
      auVar137._24_4_ = fVar287 * fVar287 + fVar159 * fVar159;
      auVar137._28_4_ = auVar296._28_4_ + auVar274._28_4_;
      auVar274 = vrsqrtps_avx(auVar137);
      fVar261 = auVar274._0_4_;
      fVar267 = auVar274._4_4_;
      auVar24._4_4_ = fVar267 * 1.5;
      auVar24._0_4_ = fVar261 * 1.5;
      fVar268 = auVar274._8_4_;
      auVar24._8_4_ = fVar268 * 1.5;
      fVar291 = auVar274._12_4_;
      auVar24._12_4_ = fVar291 * 1.5;
      fVar302 = auVar274._16_4_;
      auVar24._16_4_ = fVar302 * 1.5;
      fVar309 = auVar274._20_4_;
      auVar24._20_4_ = fVar309 * 1.5;
      fVar332 = auVar274._24_4_;
      fStack_644 = auVar23._28_4_;
      auVar24._24_4_ = fVar332 * 1.5;
      auVar24._28_4_ = fStack_644;
      auVar25._4_4_ = fVar267 * fVar267 * fVar267 * auVar137._4_4_ * 0.5;
      auVar25._0_4_ = fVar261 * fVar261 * fVar261 * auVar137._0_4_ * 0.5;
      auVar25._8_4_ = fVar268 * fVar268 * fVar268 * auVar137._8_4_ * 0.5;
      auVar25._12_4_ = fVar291 * fVar291 * fVar291 * auVar137._12_4_ * 0.5;
      auVar25._16_4_ = fVar302 * fVar302 * fVar302 * auVar137._16_4_ * 0.5;
      auVar25._20_4_ = fVar309 * fVar309 * fVar309 * auVar137._20_4_ * 0.5;
      auVar25._24_4_ = fVar332 * fVar332 * fVar332 * auVar137._24_4_ * 0.5;
      auVar25._28_4_ = auVar137._28_4_;
      auVar23 = vsubps_avx(auVar24,auVar25);
      fVar261 = auVar23._0_4_;
      fVar291 = auVar23._4_4_;
      fVar332 = auVar23._8_4_;
      fVar270 = auVar23._12_4_;
      fVar279 = auVar23._16_4_;
      fVar284 = auVar23._20_4_;
      fVar288 = auVar23._24_4_;
      fVar267 = auVar298._0_4_;
      fVar302 = auVar298._4_4_;
      fVar178 = auVar298._8_4_;
      fVar271 = auVar298._12_4_;
      fVar280 = auVar298._16_4_;
      fVar285 = auVar298._20_4_;
      fVar289 = auVar298._24_4_;
      auVar138._0_4_ = fVar267 * fVar267 + fVar131 * fVar131;
      auVar138._4_4_ = fVar302 * fVar302 + fVar146 * fVar146;
      auVar138._8_4_ = fVar178 * fVar178 + fVar149 * fVar149;
      auVar138._12_4_ = fVar271 * fVar271 + fVar152 * fVar152;
      auVar138._16_4_ = fVar280 * fVar280 + fVar155 * fVar155;
      auVar138._20_4_ = fVar285 * fVar285 + fVar160 * fVar160;
      auVar138._24_4_ = fVar289 * fVar289 + fVar244 * fVar244;
      auVar138._28_4_ = auVar174._28_4_ + auVar23._28_4_;
      auVar174 = vrsqrtps_avx(auVar138);
      fVar268 = auVar174._0_4_;
      fVar309 = auVar174._4_4_;
      auVar26._4_4_ = fVar309 * 1.5;
      auVar26._0_4_ = fVar268 * 1.5;
      fVar333 = auVar174._8_4_;
      auVar26._8_4_ = fVar333 * 1.5;
      fVar218 = auVar174._12_4_;
      auVar26._12_4_ = fVar218 * 1.5;
      fVar219 = auVar174._16_4_;
      auVar26._16_4_ = fVar219 * 1.5;
      fVar220 = auVar174._20_4_;
      auVar26._20_4_ = fVar220 * 1.5;
      fVar221 = auVar174._24_4_;
      auVar26._24_4_ = fVar221 * 1.5;
      auVar26._28_4_ = fStack_644;
      auVar28._4_4_ = fVar309 * fVar309 * fVar309 * auVar138._4_4_ * 0.5;
      auVar28._0_4_ = fVar268 * fVar268 * fVar268 * auVar138._0_4_ * 0.5;
      auVar28._8_4_ = fVar333 * fVar333 * fVar333 * auVar138._8_4_ * 0.5;
      auVar28._12_4_ = fVar218 * fVar218 * fVar218 * auVar138._12_4_ * 0.5;
      auVar28._16_4_ = fVar219 * fVar219 * fVar219 * auVar138._16_4_ * 0.5;
      auVar28._20_4_ = fVar220 * fVar220 * fVar220 * auVar138._20_4_ * 0.5;
      auVar28._24_4_ = fVar221 * fVar221 * fVar221 * auVar138._24_4_ * 0.5;
      auVar28._28_4_ = auVar138._28_4_;
      auVar174 = vsubps_avx(auVar26,auVar28);
      fVar268 = auVar174._0_4_;
      fVar309 = auVar174._4_4_;
      fVar333 = auVar174._8_4_;
      fVar218 = auVar174._12_4_;
      fVar219 = auVar174._16_4_;
      fVar220 = auVar174._20_4_;
      fVar221 = auVar174._24_4_;
      fVar322 = fVar130 * fVar322 * fVar261;
      fVar269 = fVar144 * fVar269 * fVar291;
      auVar27._4_4_ = fVar269;
      auVar27._0_4_ = fVar322;
      fVar245 = fVar147 * fVar245 * fVar332;
      auVar27._8_4_ = fVar245;
      fVar282 = fVar150 * fVar282 * fVar270;
      auVar27._12_4_ = fVar282;
      fVar283 = fVar153 * fVar283 * fVar279;
      auVar27._16_4_ = fVar283;
      fVar286 = fVar156 * fVar286 * fVar284;
      auVar27._20_4_ = fVar286;
      fVar287 = fVar158 * fVar287 * fVar288;
      auVar27._24_4_ = fVar287;
      auVar27._28_4_ = fVar290;
      local_700._4_4_ = fVar269 + auVar265._4_4_;
      local_700._0_4_ = fVar322 + auVar265._0_4_;
      fStack_6f8 = fVar245 + auVar265._8_4_;
      fStack_6f4 = fVar282 + auVar265._12_4_;
      fStack_6f0 = fVar283 + auVar265._16_4_;
      fStack_6ec = fVar286 + auVar265._20_4_;
      fStack_6e8 = fVar287 + auVar265._24_4_;
      fStack_6e4 = fVar290 + auVar265._28_4_;
      local_660 = fVar130 * fVar261 * -fVar180;
      fStack_65c = fVar144 * fVar291 * -fVar145;
      auVar29._4_4_ = fStack_65c;
      auVar29._0_4_ = local_660;
      fStack_658 = fVar147 * fVar332 * -fVar148;
      auVar29._8_4_ = fStack_658;
      fStack_654 = fVar150 * fVar270 * -fVar151;
      auVar29._12_4_ = fStack_654;
      fStack_650 = fVar153 * fVar279 * -fVar154;
      auVar29._16_4_ = fStack_650;
      fStack_64c = fVar156 * fVar284 * -fVar157;
      auVar29._20_4_ = fStack_64c;
      fStack_648 = fVar158 * fVar288 * -fVar159;
      auVar29._24_4_ = fStack_648;
      auVar29._28_4_ = fStack_644;
      local_660 = local_660 + auVar337._0_4_;
      fStack_65c = fStack_65c + auVar337._4_4_;
      fStack_658 = fStack_658 + auVar337._8_4_;
      fStack_654 = fStack_654 + auVar337._12_4_;
      fStack_650 = fStack_650 + auVar337._16_4_;
      fStack_64c = fStack_64c + auVar337._20_4_;
      fStack_648 = fStack_648 + auVar337._24_4_;
      fStack_644 = fStack_644 + auVar337._28_4_;
      fVar322 = fVar261 * 0.0 * fVar130;
      fVar261 = fVar291 * 0.0 * fVar144;
      auVar30._4_4_ = fVar261;
      auVar30._0_4_ = fVar322;
      fVar269 = fVar332 * 0.0 * fVar147;
      auVar30._8_4_ = fVar269;
      fVar291 = fVar270 * 0.0 * fVar150;
      auVar30._12_4_ = fVar291;
      fVar245 = fVar279 * 0.0 * fVar153;
      auVar30._16_4_ = fVar245;
      fVar332 = fVar284 * 0.0 * fVar156;
      auVar30._20_4_ = fVar332;
      fVar282 = fVar288 * 0.0 * fVar158;
      auVar30._24_4_ = fVar282;
      auVar30._28_4_ = fVar365;
      auVar257._0_4_ = fVar322 + (float)local_5c0._0_4_;
      auVar257._4_4_ = fVar261 + (float)local_5c0._4_4_;
      auVar257._8_4_ = fVar269 + fStack_5b8;
      auVar257._12_4_ = fVar291 + fStack_5b4;
      auVar257._16_4_ = fVar245 + fStack_5b0;
      auVar257._20_4_ = fVar332 + fStack_5ac;
      auVar257._24_4_ = fVar282 + fStack_5a8;
      auVar257._28_4_ = fVar365 + fStack_5a4;
      fVar322 = local_740._0_4_ * fVar267 * fVar268;
      fVar261 = local_740._4_4_ * fVar302 * fVar309;
      auVar31._4_4_ = fVar261;
      auVar31._0_4_ = fVar322;
      fVar267 = local_740._8_4_ * fVar178 * fVar333;
      auVar31._8_4_ = fVar267;
      fVar269 = local_740._12_4_ * fVar271 * fVar218;
      auVar31._12_4_ = fVar269;
      fVar291 = local_740._16_4_ * fVar280 * fVar219;
      auVar31._16_4_ = fVar291;
      fVar302 = local_740._20_4_ * fVar285 * fVar220;
      auVar31._20_4_ = fVar302;
      fVar245 = local_740._24_4_ * fVar289 * fVar221;
      auVar31._24_4_ = fVar245;
      auVar31._28_4_ = auVar298._28_4_;
      auVar209 = vsubps_avx(auVar265,auVar27);
      auVar297._0_4_ = (float)local_4a0._0_4_ + fVar322;
      auVar297._4_4_ = (float)local_4a0._4_4_ + fVar261;
      auVar297._8_4_ = fStack_498 + fVar267;
      auVar297._12_4_ = fStack_494 + fVar269;
      auVar297._16_4_ = fStack_490 + fVar291;
      auVar297._20_4_ = fStack_48c + fVar302;
      auVar297._24_4_ = fStack_488 + fVar245;
      auVar297._28_4_ = fStack_484 + auVar298._28_4_;
      fVar322 = local_740._0_4_ * -fVar131 * fVar268;
      fVar261 = local_740._4_4_ * -fVar146 * fVar309;
      auVar298._4_4_ = fVar261;
      auVar298._0_4_ = fVar322;
      fVar267 = local_740._8_4_ * -fVar149 * fVar333;
      auVar298._8_4_ = fVar267;
      fVar269 = local_740._12_4_ * -fVar152 * fVar218;
      auVar298._12_4_ = fVar269;
      fVar291 = local_740._16_4_ * -fVar155 * fVar219;
      auVar298._16_4_ = fVar291;
      fVar302 = local_740._20_4_ * -fVar160 * fVar220;
      auVar298._20_4_ = fVar302;
      fVar245 = local_740._24_4_ * -fVar244 * fVar221;
      auVar298._24_4_ = fVar245;
      auVar298._28_4_ = fVar348;
      auVar24 = vsubps_avx(auVar337,auVar29);
      auVar314._0_4_ = fVar322 + auVar208._0_4_;
      auVar314._4_4_ = fVar261 + auVar208._4_4_;
      auVar314._8_4_ = fVar267 + auVar208._8_4_;
      auVar314._12_4_ = fVar269 + auVar208._12_4_;
      auVar314._16_4_ = fVar291 + auVar208._16_4_;
      auVar314._20_4_ = fVar302 + auVar208._20_4_;
      auVar314._24_4_ = fVar245 + auVar208._24_4_;
      auVar314._28_4_ = fVar348 + auVar208._28_4_;
      fVar322 = fVar268 * 0.0 * local_740._0_4_;
      fVar261 = fVar309 * 0.0 * local_740._4_4_;
      auVar32._4_4_ = fVar261;
      auVar32._0_4_ = fVar322;
      fVar267 = fVar333 * 0.0 * local_740._8_4_;
      auVar32._8_4_ = fVar267;
      fVar268 = fVar218 * 0.0 * local_740._12_4_;
      auVar32._12_4_ = fVar268;
      fVar269 = fVar219 * 0.0 * local_740._16_4_;
      auVar32._16_4_ = fVar269;
      fVar291 = fVar220 * 0.0 * local_740._20_4_;
      auVar32._20_4_ = fVar291;
      fVar302 = fVar221 * 0.0 * local_740._24_4_;
      auVar32._24_4_ = fVar302;
      auVar32._28_4_ = 0x3f000000;
      auVar25 = vsubps_avx(_local_5c0,auVar30);
      auVar111._4_4_ = fStack_4dc;
      auVar111._0_4_ = local_4e0;
      auVar111._8_4_ = fStack_4d8;
      auVar111._12_4_ = fStack_4d4;
      auVar111._16_4_ = fStack_4d0;
      auVar111._20_4_ = fStack_4cc;
      auVar111._24_4_ = fStack_4c8;
      auVar111._28_4_ = fStack_4c4;
      auVar351._0_4_ = fVar322 + local_4e0;
      auVar351._4_4_ = fVar261 + fStack_4dc;
      auVar351._8_4_ = fVar267 + fStack_4d8;
      auVar351._12_4_ = fVar268 + fStack_4d4;
      auVar351._16_4_ = fVar269 + fStack_4d0;
      auVar351._20_4_ = fVar291 + fStack_4cc;
      auVar351._24_4_ = fVar302 + fStack_4c8;
      auVar351._28_4_ = fStack_4c4 + 0.5;
      auVar174 = vsubps_avx(_local_4a0,auVar31);
      auVar23 = vsubps_avx(auVar208,auVar298);
      auVar26 = vsubps_avx(auVar111,auVar32);
      auVar298 = vsubps_avx(auVar314,auVar24);
      auVar274 = vsubps_avx(auVar351,auVar25);
      auVar33._4_4_ = auVar25._4_4_ * auVar298._4_4_;
      auVar33._0_4_ = auVar25._0_4_ * auVar298._0_4_;
      auVar33._8_4_ = auVar25._8_4_ * auVar298._8_4_;
      auVar33._12_4_ = auVar25._12_4_ * auVar298._12_4_;
      auVar33._16_4_ = auVar25._16_4_ * auVar298._16_4_;
      auVar33._20_4_ = auVar25._20_4_ * auVar298._20_4_;
      auVar33._24_4_ = auVar25._24_4_ * auVar298._24_4_;
      auVar33._28_4_ = fStack_484;
      auVar34._4_4_ = auVar24._4_4_ * auVar274._4_4_;
      auVar34._0_4_ = auVar24._0_4_ * auVar274._0_4_;
      auVar34._8_4_ = auVar24._8_4_ * auVar274._8_4_;
      auVar34._12_4_ = auVar24._12_4_ * auVar274._12_4_;
      auVar34._16_4_ = auVar24._16_4_ * auVar274._16_4_;
      auVar34._20_4_ = auVar24._20_4_ * auVar274._20_4_;
      auVar34._24_4_ = auVar24._24_4_ * auVar274._24_4_;
      auVar34._28_4_ = fStack_4c4;
      auVar251 = vsubps_avx(auVar34,auVar33);
      auVar35._4_4_ = auVar209._4_4_ * auVar274._4_4_;
      auVar35._0_4_ = auVar209._0_4_ * auVar274._0_4_;
      auVar35._8_4_ = auVar209._8_4_ * auVar274._8_4_;
      auVar35._12_4_ = auVar209._12_4_ * auVar274._12_4_;
      auVar35._16_4_ = auVar209._16_4_ * auVar274._16_4_;
      auVar35._20_4_ = auVar209._20_4_ * auVar274._20_4_;
      auVar35._24_4_ = auVar209._24_4_ * auVar274._24_4_;
      auVar35._28_4_ = auVar274._28_4_;
      auVar15 = vsubps_avx(auVar297,auVar209);
      auVar36._4_4_ = auVar15._4_4_ * auVar25._4_4_;
      auVar36._0_4_ = auVar15._0_4_ * auVar25._0_4_;
      auVar36._8_4_ = auVar15._8_4_ * auVar25._8_4_;
      auVar36._12_4_ = auVar15._12_4_ * auVar25._12_4_;
      auVar36._16_4_ = auVar15._16_4_ * auVar25._16_4_;
      auVar36._20_4_ = auVar15._20_4_ * auVar25._20_4_;
      auVar36._24_4_ = auVar15._24_4_ * auVar25._24_4_;
      auVar36._28_4_ = auVar208._28_4_;
      auVar208 = vsubps_avx(auVar36,auVar35);
      auVar37._4_4_ = auVar15._4_4_ * auVar24._4_4_;
      auVar37._0_4_ = auVar15._0_4_ * auVar24._0_4_;
      auVar37._8_4_ = auVar15._8_4_ * auVar24._8_4_;
      auVar37._12_4_ = auVar15._12_4_ * auVar24._12_4_;
      auVar37._16_4_ = auVar15._16_4_ * auVar24._16_4_;
      auVar37._20_4_ = auVar15._20_4_ * auVar24._20_4_;
      auVar37._24_4_ = auVar15._24_4_ * auVar24._24_4_;
      auVar37._28_4_ = auVar274._28_4_;
      auVar38._4_4_ = auVar209._4_4_ * auVar298._4_4_;
      auVar38._0_4_ = auVar209._0_4_ * auVar298._0_4_;
      auVar38._8_4_ = auVar209._8_4_ * auVar298._8_4_;
      auVar38._12_4_ = auVar209._12_4_ * auVar298._12_4_;
      auVar38._16_4_ = auVar209._16_4_ * auVar298._16_4_;
      auVar38._20_4_ = auVar209._20_4_ * auVar298._20_4_;
      auVar38._24_4_ = auVar209._24_4_ * auVar298._24_4_;
      auVar38._28_4_ = auVar298._28_4_;
      auVar298 = vsubps_avx(auVar38,auVar37);
      auVar139._0_4_ = auVar251._0_4_ * 0.0 + auVar298._0_4_ + auVar208._0_4_ * 0.0;
      auVar139._4_4_ = auVar251._4_4_ * 0.0 + auVar298._4_4_ + auVar208._4_4_ * 0.0;
      auVar139._8_4_ = auVar251._8_4_ * 0.0 + auVar298._8_4_ + auVar208._8_4_ * 0.0;
      auVar139._12_4_ = auVar251._12_4_ * 0.0 + auVar298._12_4_ + auVar208._12_4_ * 0.0;
      auVar139._16_4_ = auVar251._16_4_ * 0.0 + auVar298._16_4_ + auVar208._16_4_ * 0.0;
      auVar139._20_4_ = auVar251._20_4_ * 0.0 + auVar298._20_4_ + auVar208._20_4_ * 0.0;
      auVar139._24_4_ = auVar251._24_4_ * 0.0 + auVar298._24_4_ + auVar208._24_4_ * 0.0;
      auVar139._28_4_ = auVar298._28_4_ + auVar298._28_4_ + auVar208._28_4_;
      auVar337 = vcmpps_avx(auVar139,ZEXT432(0) << 0x20,2);
      auVar174 = vblendvps_avx(auVar174,_local_700,auVar337);
      auVar109._4_4_ = fStack_65c;
      auVar109._0_4_ = local_660;
      auVar109._8_4_ = fStack_658;
      auVar109._12_4_ = fStack_654;
      auVar109._16_4_ = fStack_650;
      auVar109._20_4_ = fStack_64c;
      auVar109._24_4_ = fStack_648;
      auVar109._28_4_ = fStack_644;
      auVar23 = vblendvps_avx(auVar23,auVar109,auVar337);
      auVar298 = vblendvps_avx(auVar26,auVar257,auVar337);
      auVar274 = vblendvps_avx(auVar209,auVar297,auVar337);
      auVar251 = vblendvps_avx(auVar24,auVar314,auVar337);
      auVar15 = vblendvps_avx(auVar25,auVar351,auVar337);
      auVar208 = vblendvps_avx(auVar297,auVar209,auVar337);
      auVar209 = vblendvps_avx(auVar314,auVar24,auVar337);
      local_7a0 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
      auStack_790 = auVar265._16_16_;
      auVar265 = vblendvps_avx(auVar351,auVar25,auVar337);
      auVar208 = vsubps_avx(auVar208,auVar174);
      auVar24 = vsubps_avx(auVar209,auVar23);
      auVar265 = vsubps_avx(auVar265,auVar298);
      auVar25 = vsubps_avx(auVar23,auVar251);
      fVar322 = auVar24._0_4_;
      fVar131 = auVar298._0_4_;
      fVar291 = auVar24._4_4_;
      fVar146 = auVar298._4_4_;
      auVar39._4_4_ = fVar146 * fVar291;
      auVar39._0_4_ = fVar131 * fVar322;
      fVar178 = auVar24._8_4_;
      fVar149 = auVar298._8_4_;
      auVar39._8_4_ = fVar149 * fVar178;
      fVar218 = auVar24._12_4_;
      fVar152 = auVar298._12_4_;
      auVar39._12_4_ = fVar152 * fVar218;
      fVar286 = auVar24._16_4_;
      fVar155 = auVar298._16_4_;
      auVar39._16_4_ = fVar155 * fVar286;
      fVar288 = auVar24._20_4_;
      fVar160 = auVar298._20_4_;
      auVar39._20_4_ = fVar160 * fVar288;
      fVar148 = auVar24._24_4_;
      fVar244 = auVar298._24_4_;
      auVar39._24_4_ = fVar244 * fVar148;
      auVar39._28_4_ = auVar209._28_4_;
      fVar261 = auVar23._0_4_;
      fVar216 = auVar265._0_4_;
      fVar302 = auVar23._4_4_;
      fVar217 = auVar265._4_4_;
      auVar40._4_4_ = fVar217 * fVar302;
      auVar40._0_4_ = fVar216 * fVar261;
      fVar333 = auVar23._8_4_;
      fVar179 = auVar265._8_4_;
      auVar40._8_4_ = fVar179 * fVar333;
      fVar283 = auVar23._12_4_;
      fVar277 = auVar265._12_4_;
      auVar40._12_4_ = fVar277 * fVar283;
      fVar284 = auVar23._16_4_;
      fVar278 = auVar265._16_4_;
      auVar40._16_4_ = fVar278 * fVar284;
      fVar289 = auVar23._20_4_;
      fVar281 = auVar265._20_4_;
      auVar40._20_4_ = fVar281 * fVar289;
      fVar151 = auVar23._24_4_;
      fVar292 = auVar265._24_4_;
      uVar129 = auVar26._28_4_;
      auVar40._24_4_ = fVar292 * fVar151;
      auVar40._28_4_ = uVar129;
      auVar209 = vsubps_avx(auVar40,auVar39);
      fVar267 = auVar174._0_4_;
      fVar309 = auVar174._4_4_;
      auVar41._4_4_ = fVar217 * fVar309;
      auVar41._0_4_ = fVar216 * fVar267;
      fVar282 = auVar174._8_4_;
      auVar41._8_4_ = fVar179 * fVar282;
      fVar279 = auVar174._12_4_;
      auVar41._12_4_ = fVar277 * fVar279;
      fVar285 = auVar174._16_4_;
      auVar41._16_4_ = fVar278 * fVar285;
      fVar221 = auVar174._20_4_;
      auVar41._20_4_ = fVar281 * fVar221;
      fVar154 = auVar174._24_4_;
      auVar41._24_4_ = fVar292 * fVar154;
      auVar41._28_4_ = uVar129;
      fVar268 = auVar208._0_4_;
      fVar245 = auVar208._4_4_;
      auVar42._4_4_ = fVar146 * fVar245;
      auVar42._0_4_ = fVar131 * fVar268;
      fVar270 = auVar208._8_4_;
      auVar42._8_4_ = fVar149 * fVar270;
      fVar280 = auVar208._12_4_;
      auVar42._12_4_ = fVar152 * fVar280;
      fVar220 = auVar208._16_4_;
      auVar42._16_4_ = fVar155 * fVar220;
      fVar180 = auVar208._20_4_;
      auVar42._20_4_ = fVar160 * fVar180;
      fVar157 = auVar208._24_4_;
      auVar42._24_4_ = fVar244 * fVar157;
      auVar42._28_4_ = auVar351._28_4_;
      auVar26 = vsubps_avx(auVar42,auVar41);
      auVar43._4_4_ = fVar302 * fVar245;
      auVar43._0_4_ = fVar261 * fVar268;
      auVar43._8_4_ = fVar333 * fVar270;
      auVar43._12_4_ = fVar283 * fVar280;
      auVar43._16_4_ = fVar284 * fVar220;
      auVar43._20_4_ = fVar289 * fVar180;
      auVar43._24_4_ = fVar151 * fVar157;
      auVar43._28_4_ = uVar129;
      auVar361._0_4_ = fVar267 * fVar322;
      auVar361._4_4_ = fVar309 * fVar291;
      auVar361._8_4_ = fVar282 * fVar178;
      auVar361._12_4_ = fVar279 * fVar218;
      auVar361._16_4_ = fVar285 * fVar286;
      auVar361._20_4_ = fVar221 * fVar288;
      auVar361._24_4_ = fVar154 * fVar148;
      auVar361._28_4_ = 0;
      auVar28 = vsubps_avx(auVar361,auVar43);
      auVar27 = vsubps_avx(auVar298,auVar15);
      fVar269 = auVar28._28_4_ + auVar26._28_4_;
      auVar170._0_4_ = auVar28._0_4_ + auVar26._0_4_ * 0.0 + auVar209._0_4_ * 0.0;
      auVar170._4_4_ = auVar28._4_4_ + auVar26._4_4_ * 0.0 + auVar209._4_4_ * 0.0;
      auVar170._8_4_ = auVar28._8_4_ + auVar26._8_4_ * 0.0 + auVar209._8_4_ * 0.0;
      auVar170._12_4_ = auVar28._12_4_ + auVar26._12_4_ * 0.0 + auVar209._12_4_ * 0.0;
      auVar170._16_4_ = auVar28._16_4_ + auVar26._16_4_ * 0.0 + auVar209._16_4_ * 0.0;
      auVar170._20_4_ = auVar28._20_4_ + auVar26._20_4_ * 0.0 + auVar209._20_4_ * 0.0;
      auVar170._24_4_ = auVar28._24_4_ + auVar26._24_4_ * 0.0 + auVar209._24_4_ * 0.0;
      auVar170._28_4_ = fVar269 + auVar209._28_4_;
      fVar290 = auVar25._0_4_;
      fVar162 = auVar25._4_4_;
      auVar44._4_4_ = fVar162 * auVar15._4_4_;
      auVar44._0_4_ = fVar290 * auVar15._0_4_;
      fVar181 = auVar25._8_4_;
      auVar44._8_4_ = fVar181 * auVar15._8_4_;
      fVar260 = auVar25._12_4_;
      auVar44._12_4_ = fVar260 * auVar15._12_4_;
      fVar200 = auVar25._16_4_;
      auVar44._16_4_ = fVar200 * auVar15._16_4_;
      fVar201 = auVar25._20_4_;
      auVar44._20_4_ = fVar201 * auVar15._20_4_;
      fVar215 = auVar25._24_4_;
      auVar44._24_4_ = fVar215 * auVar15._24_4_;
      auVar44._28_4_ = fVar269;
      fVar269 = auVar27._0_4_;
      fVar332 = auVar27._4_4_;
      auVar45._4_4_ = auVar251._4_4_ * fVar332;
      auVar45._0_4_ = auVar251._0_4_ * fVar269;
      fVar271 = auVar27._8_4_;
      auVar45._8_4_ = auVar251._8_4_ * fVar271;
      fVar219 = auVar27._12_4_;
      auVar45._12_4_ = auVar251._12_4_ * fVar219;
      fVar287 = auVar27._16_4_;
      auVar45._16_4_ = auVar251._16_4_ * fVar287;
      fVar145 = auVar27._20_4_;
      auVar45._20_4_ = auVar251._20_4_ * fVar145;
      fVar159 = auVar27._24_4_;
      auVar45._24_4_ = auVar251._24_4_ * fVar159;
      auVar45._28_4_ = auVar28._28_4_;
      auVar25 = vsubps_avx(auVar45,auVar44);
      auVar26 = vsubps_avx(auVar174,auVar274);
      fVar303 = auVar26._0_4_;
      fVar307 = auVar26._4_4_;
      auVar46._4_4_ = fVar307 * auVar15._4_4_;
      auVar46._0_4_ = fVar303 * auVar15._0_4_;
      fVar321 = auVar26._8_4_;
      auVar46._8_4_ = fVar321 * auVar15._8_4_;
      fVar327 = auVar26._12_4_;
      auVar46._12_4_ = fVar327 * auVar15._12_4_;
      fVar329 = auVar26._16_4_;
      auVar46._16_4_ = fVar329 * auVar15._16_4_;
      fVar331 = auVar26._20_4_;
      auVar46._20_4_ = fVar331 * auVar15._20_4_;
      fVar349 = auVar26._24_4_;
      auVar46._24_4_ = fVar349 * auVar15._24_4_;
      auVar46._28_4_ = auVar15._28_4_;
      auVar47._4_4_ = auVar274._4_4_ * fVar332;
      auVar47._0_4_ = auVar274._0_4_ * fVar269;
      auVar47._8_4_ = auVar274._8_4_ * fVar271;
      auVar47._12_4_ = auVar274._12_4_ * fVar219;
      auVar47._16_4_ = auVar274._16_4_ * fVar287;
      auVar47._20_4_ = auVar274._20_4_ * fVar145;
      auVar47._24_4_ = auVar274._24_4_ * fVar159;
      auVar47._28_4_ = auVar209._28_4_;
      auVar209 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = auVar251._4_4_ * fVar307;
      auVar48._0_4_ = auVar251._0_4_ * fVar303;
      auVar48._8_4_ = auVar251._8_4_ * fVar321;
      auVar48._12_4_ = auVar251._12_4_ * fVar327;
      auVar48._16_4_ = auVar251._16_4_ * fVar329;
      auVar48._20_4_ = auVar251._20_4_ * fVar331;
      auVar48._24_4_ = auVar251._24_4_ * fVar349;
      auVar48._28_4_ = auVar15._28_4_;
      auVar49._4_4_ = auVar274._4_4_ * fVar162;
      auVar49._0_4_ = auVar274._0_4_ * fVar290;
      auVar49._8_4_ = auVar274._8_4_ * fVar181;
      auVar49._12_4_ = auVar274._12_4_ * fVar260;
      auVar49._16_4_ = auVar274._16_4_ * fVar200;
      auVar49._20_4_ = auVar274._20_4_ * fVar201;
      auVar49._24_4_ = auVar274._24_4_ * fVar215;
      auVar49._28_4_ = auVar274._28_4_;
      auVar274 = vsubps_avx(auVar49,auVar48);
      auVar232._0_4_ = auVar25._0_4_ * 0.0 + auVar274._0_4_ + auVar209._0_4_ * 0.0;
      auVar232._4_4_ = auVar25._4_4_ * 0.0 + auVar274._4_4_ + auVar209._4_4_ * 0.0;
      auVar232._8_4_ = auVar25._8_4_ * 0.0 + auVar274._8_4_ + auVar209._8_4_ * 0.0;
      auVar232._12_4_ = auVar25._12_4_ * 0.0 + auVar274._12_4_ + auVar209._12_4_ * 0.0;
      auVar232._16_4_ = auVar25._16_4_ * 0.0 + auVar274._16_4_ + auVar209._16_4_ * 0.0;
      auVar232._20_4_ = auVar25._20_4_ * 0.0 + auVar274._20_4_ + auVar209._20_4_ * 0.0;
      auVar232._24_4_ = auVar25._24_4_ * 0.0 + auVar274._24_4_ + auVar209._24_4_ * 0.0;
      auVar232._28_4_ = auVar274._28_4_ + auVar274._28_4_ + auVar209._28_4_;
      auVar274 = vmaxps_avx(auVar170,auVar232);
      auVar274 = vcmpps_avx(auVar274,ZEXT832(0) << 0x20,2);
      auVar229 = vpackssdw_avx(auVar274._0_16_,auVar274._16_16_);
      auVar229 = vpand_avx(auVar229,local_7a0);
      auVar248 = vpmovsxwd_avx(auVar229);
      auVar207 = vpunpckhwd_avx(auVar229,auVar229);
      auVar210._16_16_ = auVar207;
      auVar210._0_16_ = auVar248;
      if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar210 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar210 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar210 >> 0x7f,0) == '\0') &&
            (auVar210 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar207 >> 0x3f,0) == '\0') &&
          (auVar210 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar207[0xf]
         ) {
LAB_0090cd73:
        auVar214 = ZEXT3264(auVar210);
        auVar175 = ZEXT3264(CONCAT824(uStack_4e8,
                                      CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
        auVar143 = ZEXT3264(local_540);
        auVar301 = ZEXT3264(local_560);
        auVar352._4_4_ = fVar144;
        auVar352._0_4_ = fVar130;
        auVar352._8_4_ = fVar147;
        auVar352._12_4_ = fVar150;
        auVar352._16_4_ = fVar153;
        auVar352._20_4_ = fVar156;
        auVar352._24_4_ = fVar158;
        auVar352._28_4_ = fVar161;
      }
      else {
        auVar50._4_4_ = fVar332 * fVar291;
        auVar50._0_4_ = fVar269 * fVar322;
        auVar50._8_4_ = fVar271 * fVar178;
        auVar50._12_4_ = fVar219 * fVar218;
        auVar50._16_4_ = fVar287 * fVar286;
        auVar50._20_4_ = fVar145 * fVar288;
        auVar50._24_4_ = fVar159 * fVar148;
        auVar50._28_4_ = auVar207._12_4_;
        auVar338._0_4_ = fVar290 * fVar216;
        auVar338._4_4_ = fVar162 * fVar217;
        auVar338._8_4_ = fVar181 * fVar179;
        auVar338._12_4_ = fVar260 * fVar277;
        auVar338._16_4_ = fVar200 * fVar278;
        auVar338._20_4_ = fVar201 * fVar281;
        auVar338._24_4_ = fVar215 * fVar292;
        auVar338._28_4_ = 0;
        auVar274 = vsubps_avx(auVar338,auVar50);
        auVar51._4_4_ = fVar307 * fVar217;
        auVar51._0_4_ = fVar303 * fVar216;
        auVar51._8_4_ = fVar321 * fVar179;
        auVar51._12_4_ = fVar327 * fVar277;
        auVar51._16_4_ = fVar329 * fVar278;
        auVar51._20_4_ = fVar331 * fVar281;
        auVar51._24_4_ = fVar349 * fVar292;
        auVar51._28_4_ = auVar265._28_4_;
        auVar52._4_4_ = fVar332 * fVar245;
        auVar52._0_4_ = fVar269 * fVar268;
        auVar52._8_4_ = fVar271 * fVar270;
        auVar52._12_4_ = fVar219 * fVar280;
        auVar52._16_4_ = fVar287 * fVar220;
        auVar52._20_4_ = fVar145 * fVar180;
        auVar52._24_4_ = fVar159 * fVar157;
        auVar52._28_4_ = auVar27._28_4_;
        auVar15 = vsubps_avx(auVar52,auVar51);
        auVar53._4_4_ = fVar162 * fVar245;
        auVar53._0_4_ = fVar290 * fVar268;
        auVar53._8_4_ = fVar181 * fVar270;
        auVar53._12_4_ = fVar260 * fVar280;
        auVar53._16_4_ = fVar200 * fVar220;
        auVar53._20_4_ = fVar201 * fVar180;
        auVar53._24_4_ = fVar215 * fVar157;
        auVar53._28_4_ = auVar170._28_4_;
        auVar54._4_4_ = fVar307 * fVar291;
        auVar54._0_4_ = fVar303 * fVar322;
        auVar54._8_4_ = fVar321 * fVar178;
        auVar54._12_4_ = fVar327 * fVar218;
        auVar54._16_4_ = fVar329 * fVar286;
        auVar54._20_4_ = fVar331 * fVar288;
        auVar54._24_4_ = fVar349 * fVar148;
        auVar54._28_4_ = auVar24._28_4_;
        auVar209 = vsubps_avx(auVar54,auVar53);
        auVar266._0_4_ = auVar274._0_4_ * 0.0 + auVar209._0_4_ + auVar15._0_4_ * 0.0;
        auVar266._4_4_ = auVar274._4_4_ * 0.0 + auVar209._4_4_ + auVar15._4_4_ * 0.0;
        auVar266._8_4_ = auVar274._8_4_ * 0.0 + auVar209._8_4_ + auVar15._8_4_ * 0.0;
        auVar266._12_4_ = auVar274._12_4_ * 0.0 + auVar209._12_4_ + auVar15._12_4_ * 0.0;
        auVar266._16_4_ = auVar274._16_4_ * 0.0 + auVar209._16_4_ + auVar15._16_4_ * 0.0;
        auVar266._20_4_ = auVar274._20_4_ * 0.0 + auVar209._20_4_ + auVar15._20_4_ * 0.0;
        auVar266._24_4_ = auVar274._24_4_ * 0.0 + auVar209._24_4_ + auVar15._24_4_ * 0.0;
        auVar266._28_4_ = auVar24._28_4_ + auVar209._28_4_ + auVar170._28_4_;
        auVar251 = vrcpps_avx(auVar266);
        fVar322 = auVar251._0_4_;
        fVar268 = auVar251._4_4_;
        auVar55._4_4_ = auVar266._4_4_ * fVar268;
        auVar55._0_4_ = auVar266._0_4_ * fVar322;
        fVar269 = auVar251._8_4_;
        auVar55._8_4_ = auVar266._8_4_ * fVar269;
        fVar291 = auVar251._12_4_;
        auVar55._12_4_ = auVar266._12_4_ * fVar291;
        fVar245 = auVar251._16_4_;
        auVar55._16_4_ = auVar266._16_4_ * fVar245;
        fVar332 = auVar251._20_4_;
        auVar55._20_4_ = auVar266._20_4_ * fVar332;
        fVar178 = auVar251._24_4_;
        auVar55._24_4_ = auVar266._24_4_ * fVar178;
        auVar55._28_4_ = auVar27._28_4_;
        auVar339._8_4_ = 0x3f800000;
        auVar339._0_8_ = 0x3f8000003f800000;
        auVar339._12_4_ = 0x3f800000;
        auVar339._16_4_ = 0x3f800000;
        auVar339._20_4_ = 0x3f800000;
        auVar339._24_4_ = 0x3f800000;
        auVar339._28_4_ = 0x3f800000;
        auVar265 = vsubps_avx(auVar339,auVar55);
        fVar322 = auVar265._0_4_ * fVar322 + fVar322;
        fVar268 = auVar265._4_4_ * fVar268 + fVar268;
        fVar269 = auVar265._8_4_ * fVar269 + fVar269;
        fVar291 = auVar265._12_4_ * fVar291 + fVar291;
        fVar245 = auVar265._16_4_ * fVar245 + fVar245;
        fVar332 = auVar265._20_4_ * fVar332 + fVar332;
        fVar178 = auVar265._24_4_ * fVar178 + fVar178;
        auVar56._4_4_ =
             (auVar274._4_4_ * fVar309 + auVar15._4_4_ * fVar302 + auVar209._4_4_ * fVar146) *
             fVar268;
        auVar56._0_4_ =
             (auVar274._0_4_ * fVar267 + auVar15._0_4_ * fVar261 + auVar209._0_4_ * fVar131) *
             fVar322;
        auVar56._8_4_ =
             (auVar274._8_4_ * fVar282 + auVar15._8_4_ * fVar333 + auVar209._8_4_ * fVar149) *
             fVar269;
        auVar56._12_4_ =
             (auVar274._12_4_ * fVar279 + auVar15._12_4_ * fVar283 + auVar209._12_4_ * fVar152) *
             fVar291;
        auVar56._16_4_ =
             (auVar274._16_4_ * fVar285 + auVar15._16_4_ * fVar284 + auVar209._16_4_ * fVar155) *
             fVar245;
        auVar56._20_4_ =
             (auVar274._20_4_ * fVar221 + auVar15._20_4_ * fVar289 + auVar209._20_4_ * fVar160) *
             fVar332;
        auVar56._24_4_ =
             (auVar274._24_4_ * fVar154 + auVar15._24_4_ * fVar151 + auVar209._24_4_ * fVar244) *
             fVar178;
        auVar56._28_4_ = auVar174._28_4_ + auVar208._28_4_ + auVar298._28_4_;
        auVar248 = vpermilps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
        auVar211._16_16_ = auVar248;
        auVar211._0_16_ = auVar248;
        auVar298 = vcmpps_avx(auVar211,auVar56,2);
        uVar129 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar249._4_4_ = uVar129;
        auVar249._0_4_ = uVar129;
        auVar249._8_4_ = uVar129;
        auVar249._12_4_ = uVar129;
        auVar249._16_4_ = uVar129;
        auVar249._20_4_ = uVar129;
        auVar249._24_4_ = uVar129;
        auVar249._28_4_ = uVar129;
        auVar274 = vcmpps_avx(auVar56,auVar249,2);
        auVar298 = vandps_avx(auVar274,auVar298);
        auVar248 = vpackssdw_avx(auVar298._0_16_,auVar298._16_16_);
        auVar229 = vpand_avx(auVar229,auVar248);
        auVar248 = vpmovsxwd_avx(auVar229);
        auVar207 = vpshufd_avx(auVar229,0xee);
        auVar207 = vpmovsxwd_avx(auVar207);
        auVar210._16_16_ = auVar207;
        auVar210._0_16_ = auVar248;
        _local_7a0 = auVar170;
        if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar210 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar210 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar210 >> 0x7f,0) == '\0') &&
              (auVar210 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar207 >> 0x3f,0) == '\0') &&
            (auVar210 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar207[0xf]) goto LAB_0090cd73;
        auVar298 = vcmpps_avx(ZEXT832(0) << 0x20,auVar266,4);
        auVar248 = vpackssdw_avx(auVar298._0_16_,auVar298._16_16_);
        auVar229 = vpand_avx(auVar229,auVar248);
        auVar248 = vpmovsxwd_avx(auVar229);
        auVar229 = vpunpckhwd_avx(auVar229,auVar229);
        auVar214 = ZEXT1664(auVar229);
        auVar258._16_16_ = auVar229;
        auVar258._0_16_ = auVar248;
        auVar175 = ZEXT3264(CONCAT824(uStack_4e8,
                                      CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
        auVar143 = ZEXT3264(local_540);
        auVar301 = ZEXT3264(local_560);
        auVar352._4_4_ = fVar144;
        auVar352._0_4_ = fVar130;
        auVar352._8_4_ = fVar147;
        auVar352._12_4_ = fVar150;
        auVar352._16_4_ = fVar153;
        auVar352._20_4_ = fVar156;
        auVar352._24_4_ = fVar158;
        auVar352._28_4_ = fVar161;
        if ((((((((auVar258 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar258 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar258 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar258 >> 0x7f,0) != '\0') ||
              (auVar258 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar229 >> 0x3f,0) != '\0') ||
            (auVar258 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar229[0xf] < '\0') {
          auVar212._0_4_ = fVar322 * auVar170._0_4_;
          auVar212._4_4_ = fVar268 * auVar170._4_4_;
          auVar212._8_4_ = fVar269 * auVar170._8_4_;
          auVar212._12_4_ = fVar291 * auVar170._12_4_;
          auVar212._16_4_ = fVar245 * auVar170._16_4_;
          auVar212._20_4_ = fVar332 * auVar170._20_4_;
          auVar212._24_4_ = fVar178 * auVar170._24_4_;
          auVar212._28_4_ = 0;
          auVar57._4_4_ = auVar232._4_4_ * fVar268;
          auVar57._0_4_ = auVar232._0_4_ * fVar322;
          auVar57._8_4_ = auVar232._8_4_ * fVar269;
          auVar57._12_4_ = auVar232._12_4_ * fVar291;
          auVar57._16_4_ = auVar232._16_4_ * fVar245;
          auVar57._20_4_ = auVar232._20_4_ * fVar332;
          auVar57._24_4_ = auVar232._24_4_ * fVar178;
          auVar57._28_4_ = auVar265._28_4_ + auVar251._28_4_;
          auVar250._8_4_ = 0x3f800000;
          auVar250._0_8_ = 0x3f8000003f800000;
          auVar250._12_4_ = 0x3f800000;
          auVar250._16_4_ = 0x3f800000;
          auVar250._20_4_ = 0x3f800000;
          auVar250._24_4_ = 0x3f800000;
          auVar250._28_4_ = 0x3f800000;
          auVar298 = vsubps_avx(auVar250,auVar212);
          auVar298 = vblendvps_avx(auVar298,auVar212,auVar337);
          auVar143 = ZEXT3264(auVar298);
          auVar298 = vsubps_avx(auVar250,auVar57);
          auVar214 = ZEXT3264(auVar298);
          _local_380 = vblendvps_avx(auVar298,auVar57,auVar337);
          auVar175 = ZEXT3264(auVar258);
          auVar301 = ZEXT3264(auVar56);
        }
      }
      auVar316 = ZEXT3264(local_680);
      auVar274 = auVar143._0_32_;
      auVar298 = auVar301._0_32_;
      auVar251 = auVar175._0_32_;
      local_360 = auVar22;
      if ((((((((auVar251 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar251 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar251 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar251 >> 0x7f,0) == '\0') &&
            (auVar175 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar251 >> 0xbf,0) == '\0') &&
          (auVar175 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar175[0x1f]) {
        uVar122 = 0;
      }
      else {
        auVar22 = vsubps_avx(local_740,auVar352);
        fVar261 = auVar352._0_4_ + auVar143._0_4_ * auVar22._0_4_;
        fVar267 = auVar352._4_4_ + auVar143._4_4_ * auVar22._4_4_;
        fVar268 = auVar352._8_4_ + auVar143._8_4_ * auVar22._8_4_;
        fVar269 = auVar352._12_4_ + auVar143._12_4_ * auVar22._12_4_;
        fVar291 = auVar352._16_4_ + auVar143._16_4_ * auVar22._16_4_;
        fVar302 = auVar352._20_4_ + auVar143._20_4_ * auVar22._20_4_;
        fVar309 = auVar352._24_4_ + auVar143._24_4_ * auVar22._24_4_;
        fVar245 = auVar352._28_4_ + auVar22._28_4_;
        fVar322 = *(float *)((long)local_7f0->ray_space + k * 4 + -0x10);
        auVar22._4_4_ = (fVar267 + fVar267) * fVar322;
        auVar22._0_4_ = (fVar261 + fVar261) * fVar322;
        auVar22._8_4_ = (fVar268 + fVar268) * fVar322;
        auVar22._12_4_ = (fVar269 + fVar269) * fVar322;
        auVar22._16_4_ = (fVar291 + fVar291) * fVar322;
        auVar22._20_4_ = (fVar302 + fVar302) * fVar322;
        auVar22._24_4_ = (fVar309 + fVar309) * fVar322;
        auVar22._28_4_ = fVar245 + fVar245;
        auVar22 = vcmpps_avx(auVar298,auVar22,6);
        auVar15 = auVar251 & auVar22;
        auVar175 = ZEXT1664(auVar264);
        if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0x7f,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0xbf,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar15[0x1f] < '\0') {
          local_200 = vandps_avx(auVar22,auVar251);
          local_2a0._0_4_ = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
          local_2a0._4_4_ = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
          fStack_298 = (float)uStack_378 + (float)uStack_378 + -1.0;
          fStack_294 = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
          fStack_290 = (float)uStack_370 + (float)uStack_370 + -1.0;
          fStack_28c = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
          fStack_288 = (float)uStack_368 + (float)uStack_368 + -1.0;
          fStack_284 = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
          local_260 = 0;
          uStack_248 = uStack_6c8;
          uStack_238 = uStack_618;
          local_230 = local_630;
          uStack_228 = uStack_628;
          uStack_218 = uStack_608;
          local_380._4_4_ = local_2a0._4_4_;
          local_380._0_4_ = local_2a0._0_4_;
          uStack_378._0_4_ = fStack_298;
          uStack_378._4_4_ = fStack_294;
          uStack_370._0_4_ = fStack_290;
          uStack_370._4_4_ = fStack_28c;
          auVar169 = _local_380;
          uStack_368._0_4_ = fStack_288;
          uStack_368._4_4_ = fStack_284;
          auVar22 = _local_380;
          if ((pGVar127->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            auVar235 = ZEXT3264(auVar230);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar122 = CONCAT71((int7)((ulong)lVar128 >> 8),1),
               pGVar127->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar187._0_4_ = 1.0 / (float)local_640._0_4_;
              auVar187._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar229 = vshufps_avx(auVar187,auVar187,0);
              local_1e0[0] = auVar229._0_4_ * (auVar143._0_4_ + 0.0);
              local_1e0[1] = auVar229._4_4_ * (auVar143._4_4_ + 1.0);
              local_1e0[2] = auVar229._8_4_ * (auVar143._8_4_ + 2.0);
              local_1e0[3] = auVar229._12_4_ * (auVar143._12_4_ + 3.0);
              fStack_1d0 = auVar229._0_4_ * (auVar143._16_4_ + 4.0);
              fStack_1cc = auVar229._4_4_ * (auVar143._20_4_ + 5.0);
              fStack_1c8 = auVar229._8_4_ * (auVar143._24_4_ + 6.0);
              fStack_1c4 = auVar143._28_4_ + 7.0;
              uStack_370 = auVar169._16_8_;
              uStack_368 = auVar22._24_8_;
              local_1c0 = local_380;
              uStack_1b8 = uStack_378;
              uStack_1b0 = uStack_370;
              uStack_1a8 = uStack_368;
              local_1a0 = auVar298;
              uVar129 = vmovmskps_avx(local_200);
              uVar120 = CONCAT44((int)((ulong)lVar126 >> 0x20),uVar129);
              uVar122 = 0;
              if (uVar120 != 0) {
                for (; (uVar120 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
                }
              }
              local_580._0_16_ = vshufps_avx(ZEXT416(uVar121),ZEXT416(uVar121),0);
              local_580._16_16_ = auVar174._16_16_;
              local_5a0._0_16_ = vshufps_avx(auVar264,auVar264,0);
              local_5a0._16_16_ = auVar23._16_16_;
              _local_780 = auVar230;
              local_560 = auVar298;
              local_540 = auVar274;
              _local_380 = auVar22;
              local_2c0 = auVar274;
              local_280 = auVar298;
              local_25c = uVar11;
              local_250 = local_6d0;
              local_240 = local_620;
              local_220 = local_610;
              while( true ) {
                auVar230 = auVar235._0_32_;
                auVar264 = auVar175._0_16_;
                auVar274 = auVar143._0_32_;
                auVar298 = auVar301._0_32_;
                if (uVar120 == 0) break;
                uVar129 = *(undefined4 *)(ray + k * 4 + 0x80);
                local_400 = local_1e0[uVar122];
                local_3f0 = *(undefined4 *)((long)&local_1c0 + uVar122 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar122 * 4);
                fVar261 = 1.0 - local_400;
                fVar322 = local_400 * fVar261 + local_400 * fVar261;
                auVar229 = ZEXT416((uint)(local_400 * local_400 * 3.0));
                auVar229 = vshufps_avx(auVar229,auVar229,0);
                auVar248 = ZEXT416((uint)((fVar322 - local_400 * local_400) * 3.0));
                auVar248 = vshufps_avx(auVar248,auVar248,0);
                auVar207 = ZEXT416((uint)((fVar261 * fVar261 - fVar322) * 3.0));
                auVar207 = vshufps_avx(auVar207,auVar207,0);
                local_6b0.context = context->user;
                auVar191 = ZEXT416((uint)(fVar261 * fVar261 * -3.0));
                auVar191 = vshufps_avx(auVar191,auVar191,0);
                auVar188._0_4_ =
                     auVar191._0_4_ * (float)local_6d0._0_4_ +
                     auVar207._0_4_ * (float)local_620._0_4_ +
                     auVar229._0_4_ * (float)local_610._0_4_ +
                     auVar248._0_4_ * (float)local_630._0_4_;
                auVar188._4_4_ =
                     auVar191._4_4_ * (float)local_6d0._4_4_ +
                     auVar207._4_4_ * (float)local_620._4_4_ +
                     auVar229._4_4_ * (float)local_610._4_4_ +
                     auVar248._4_4_ * (float)local_630._4_4_;
                auVar188._8_4_ =
                     auVar191._8_4_ * (float)uStack_6c8 +
                     auVar207._8_4_ * (float)uStack_618 +
                     auVar229._8_4_ * (float)uStack_608 + auVar248._8_4_ * (float)uStack_628;
                auVar188._12_4_ =
                     auVar191._12_4_ * uStack_6c8._4_4_ +
                     auVar207._12_4_ * uStack_618._4_4_ +
                     auVar229._12_4_ * uStack_608._4_4_ + auVar248._12_4_ * uStack_628._4_4_;
                local_430 = (RTCHitN  [16])vshufps_avx(auVar188,auVar188,0);
                local_420 = vshufps_avx(auVar188,auVar188,0x55);
                auVar214 = ZEXT1664(local_420);
                local_410 = vshufps_avx(auVar188,auVar188,0xaa);
                local_3e0 = local_5a0._0_8_;
                uStack_3d8 = local_5a0._8_8_;
                local_3d0 = local_580._0_16_;
                vcmpps_avx(ZEXT1632(local_580._0_16_),ZEXT1632(local_580._0_16_),0xf);
                uStack_3bc = (local_6b0.context)->instID[0];
                local_3c0 = uStack_3bc;
                uStack_3b8 = uStack_3bc;
                uStack_3b4 = uStack_3bc;
                uStack_3b0 = (local_6b0.context)->instPrimID[0];
                uStack_3ac = uStack_3b0;
                uStack_3a8 = uStack_3b0;
                uStack_3a4 = uStack_3b0;
                local_800 = *local_6b8;
                local_6b0.valid = (int *)local_800;
                local_6b0.geometryUserPtr = pGVar127->userPtr;
                local_6b0.hit = local_430;
                local_6b0.N = 4;
                local_740._0_8_ = uVar122;
                local_7a0._0_4_ = uVar129;
                local_6b0.ray = (RTCRayN *)ray;
                fStack_3fc = local_400;
                fStack_3f8 = local_400;
                fStack_3f4 = local_400;
                uStack_3ec = local_3f0;
                uStack_3e8 = local_3f0;
                uStack_3e4 = local_3f0;
                if (pGVar127->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar214 = ZEXT1664(local_420);
                  (*pGVar127->occlusionFilterN)(&local_6b0);
                  auVar316 = ZEXT3264(local_680);
                  auVar301 = ZEXT3264(local_560);
                  auVar143 = ZEXT3264(local_540);
                  uVar122 = local_740._0_8_;
                  uVar129 = local_7a0._0_4_;
                  fVar312 = (float)local_7c0._0_4_;
                  fVar317 = (float)local_7c0._4_4_;
                  fVar318 = fStack_7b8;
                  fVar319 = fStack_7b4;
                  fVar320 = fStack_7b0;
                  fVar326 = fStack_7ac;
                  fVar328 = fStack_7a8;
                  fVar330 = fStack_7a4;
                  fVar222 = (float)local_7e0._0_4_;
                  fVar236 = (float)local_7e0._4_4_;
                  fVar239 = fStack_7d8;
                  fVar242 = fStack_7d4;
                  fVar163 = fStack_7d0;
                  fVar176 = fStack_7cc;
                  fVar177 = fStack_7c8;
                  fVar182 = (float)local_760._0_4_;
                  fVar197 = (float)local_760._4_4_;
                  fVar198 = fStack_758;
                  fVar199 = fStack_754;
                  fVar306 = fStack_750;
                  fVar223 = fStack_74c;
                  fVar237 = fStack_748;
                  fVar240 = fStack_744;
                }
                if (local_800 == (undefined1  [16])0x0) {
                  auVar229 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar229 = auVar229 ^ _DAT_01f46b70;
                  auVar235 = ZEXT3264(_local_780);
                  auVar175 = ZEXT1664(local_600._0_16_);
                }
                else {
                  p_Var14 = context->args->filter;
                  if (p_Var14 == (RTCFilterFunctionN)0x0) {
                    auVar235 = ZEXT3264(_local_780);
                    auVar175 = ZEXT1664(local_600._0_16_);
                  }
                  else {
                    auVar235 = ZEXT3264(_local_780);
                    auVar175 = ZEXT1664(local_600._0_16_);
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar127->field_8).field_0x2 & 0x40) != 0)) {
                      auVar214 = ZEXT1664(auVar214._0_16_);
                      (*p_Var14)(&local_6b0);
                      auVar175 = ZEXT1664(local_600._0_16_);
                      auVar235 = ZEXT3264(_local_780);
                      auVar316 = ZEXT3264(local_680);
                      auVar301 = ZEXT3264(local_560);
                      auVar143 = ZEXT3264(local_540);
                      uVar122 = local_740._0_8_;
                      fVar312 = (float)local_7c0._0_4_;
                      fVar317 = (float)local_7c0._4_4_;
                      fVar318 = fStack_7b8;
                      fVar319 = fStack_7b4;
                      fVar320 = fStack_7b0;
                      fVar326 = fStack_7ac;
                      fVar328 = fStack_7a8;
                      fVar330 = fStack_7a4;
                      fVar222 = (float)local_7e0._0_4_;
                      fVar236 = (float)local_7e0._4_4_;
                      fVar239 = fStack_7d8;
                      fVar242 = fStack_7d4;
                      fVar163 = fStack_7d0;
                      fVar176 = fStack_7cc;
                      fVar177 = fStack_7c8;
                      fVar182 = (float)local_760._0_4_;
                      fVar197 = (float)local_760._4_4_;
                      fVar198 = fStack_758;
                      fVar199 = fStack_754;
                      fVar306 = fStack_750;
                      fVar223 = fStack_74c;
                      fVar237 = fStack_748;
                      fVar240 = fStack_744;
                      uVar129 = local_7a0._0_4_;
                    }
                  }
                  auVar248 = vpcmpeqd_avx(local_800,_DAT_01f45a50);
                  auVar229 = auVar248 ^ _DAT_01f46b70;
                  auVar189._8_4_ = 0xff800000;
                  auVar189._0_8_ = 0xff800000ff800000;
                  auVar189._12_4_ = 0xff800000;
                  auVar248 = vblendvps_avx(auVar189,*(undefined1 (*) [16])(local_6b0.ray + 0x80),
                                           auVar248);
                  *(undefined1 (*) [16])(local_6b0.ray + 0x80) = auVar248;
                }
                auVar230 = auVar235._0_32_;
                auVar264 = auVar175._0_16_;
                auVar274 = auVar143._0_32_;
                auVar298 = auVar301._0_32_;
                auVar166._8_8_ = 0x100000001;
                auVar166._0_8_ = 0x100000001;
                if ((auVar166 & auVar229) != (undefined1  [16])0x0) {
                  uVar122 = CONCAT71((int7)(uVar122 >> 8),1);
                  goto LAB_0090b9e0;
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar129;
                uVar120 = uVar120 ^ 1L << (uVar122 & 0x3f);
                uVar122 = 0;
                if (uVar120 != 0) {
                  for (; (uVar120 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
                  }
                }
              }
              uVar122 = 0;
            }
            goto LAB_0090b9e0;
          }
        }
        uVar122 = 0;
      }
    }
LAB_0090b9e0:
    auVar175 = ZEXT1664(auVar206);
    local_560 = auVar298;
    local_540 = auVar274;
    if (8 < (int)uVar11) {
      auVar229 = vpshufd_avx(ZEXT416(uVar11),0);
      local_4c0 = auVar229._0_4_;
      fStack_4bc = auVar229._4_4_;
      fStack_4b8 = auVar229._8_4_;
      fStack_4b4 = auVar229._12_4_;
      auVar229 = vshufps_avx(auVar206,auVar206,0);
      local_600._16_16_ = auVar229;
      local_600._0_16_ = auVar229;
      auVar229 = vpermilps_avx(_local_720,0);
      local_340._16_16_ = auVar229;
      local_340._0_16_ = auVar229;
      auVar136._0_4_ = 1.0 / (float)local_640._0_4_;
      auVar136._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar229 = vshufps_avx(auVar136,auVar136,0);
      register0x00001210 = auVar229;
      _local_140 = auVar229;
      local_640 = vshufps_avx(ZEXT416((uint)local_7e8),ZEXT416((uint)local_7e8),0);
      auVar229 = vshufps_avx(auVar264,auVar264,0);
      auVar143 = ZEXT1664(auVar229);
      local_360._0_16_ = auVar229;
      _local_780 = auVar230;
      for (lVar125 = 8; lVar125 < (int)uVar11; lVar125 = lVar125 + 8) {
        pauVar7 = (undefined1 (*) [28])(bezier_basis0 + lVar125 * 4 + lVar124);
        fVar322 = *(float *)*pauVar7;
        fVar261 = *(float *)(*pauVar7 + 4);
        fVar267 = *(float *)(*pauVar7 + 8);
        fVar268 = *(float *)(*pauVar7 + 0xc);
        fVar269 = *(float *)(*pauVar7 + 0x10);
        fVar291 = *(float *)(*pauVar7 + 0x14);
        fVar302 = *(float *)(*pauVar7 + 0x18);
        auVar117 = *pauVar7;
        pauVar9 = (undefined1 (*) [28])(lVar124 + 0x21fb768 + lVar125 * 4);
        fVar309 = *(float *)*pauVar9;
        fVar245 = *(float *)(*pauVar9 + 4);
        fVar332 = *(float *)(*pauVar9 + 8);
        fVar178 = *(float *)(*pauVar9 + 0xc);
        fVar333 = *(float *)(*pauVar9 + 0x10);
        fVar282 = *(float *)(*pauVar9 + 0x14);
        fVar270 = *(float *)(*pauVar9 + 0x18);
        auVar116 = *pauVar9;
        pauVar9 = (undefined1 (*) [28])(lVar124 + 0x21fbbec + lVar125 * 4);
        fVar271 = *(float *)*pauVar9;
        fVar218 = *(float *)(*pauVar9 + 4);
        fVar283 = *(float *)(*pauVar9 + 8);
        fVar279 = *(float *)(*pauVar9 + 0xc);
        fVar280 = *(float *)(*pauVar9 + 0x10);
        fVar219 = *(float *)(*pauVar9 + 0x14);
        fVar286 = *(float *)(*pauVar9 + 0x18);
        auVar115 = *pauVar9;
        pfVar1 = (float *)(lVar124 + 0x21fc070 + lVar125 * 4);
        fVar284 = *pfVar1;
        fVar285 = pfVar1[1];
        fVar220 = pfVar1[2];
        fVar287 = pfVar1[3];
        fVar288 = pfVar1[4];
        fVar289 = pfVar1[5];
        fVar221 = pfVar1[6];
        fVar180 = auVar214._28_4_;
        fVar147 = auVar316._0_4_;
        fVar290 = auVar316._4_4_;
        fVar150 = auVar316._8_4_;
        fVar153 = auVar316._12_4_;
        fVar156 = auVar316._16_4_;
        fVar158 = auVar316._20_4_;
        fVar161 = auVar316._24_4_;
        fVar244 = fVar180 + fVar180 + pfVar1[7];
        local_820._0_4_ =
             (float)local_e0._0_4_ * fVar322 +
             fVar309 * (float)local_300._0_4_ + fVar222 * fVar271 + (float)local_480._0_4_ * fVar284
        ;
        local_820._4_4_ =
             (float)local_e0._4_4_ * fVar261 +
             fVar245 * (float)local_300._4_4_ + fVar236 * fVar218 + (float)local_480._4_4_ * fVar285
        ;
        fStack_818 = fStack_d8 * fVar267 +
                     fVar332 * fStack_2f8 + fVar239 * fVar283 + fStack_478 * fVar220;
        fStack_814 = fStack_d4 * fVar268 +
                     fVar178 * fStack_2f4 + fVar242 * fVar279 + fStack_474 * fVar287;
        fStack_810 = fStack_d0 * fVar269 +
                     fVar333 * fStack_2f0 + fVar163 * fVar280 + fStack_470 * fVar288;
        fStack_80c = fStack_cc * fVar291 +
                     fVar282 * fStack_2ec + fVar176 * fVar219 + fStack_46c * fVar289;
        fStack_808 = fStack_c8 * fVar302 +
                     fVar270 * fStack_2e8 + fVar177 * fVar286 + fStack_468 * fVar221;
        fStack_804 = fVar180 + pfVar1[7] + fVar180 + fVar180 + auVar143._28_4_;
        auVar213._0_4_ =
             fVar322 * (float)local_460._0_4_ +
             fVar147 * fVar309 + fVar182 * fVar271 + fVar312 * fVar284;
        auVar213._4_4_ =
             fVar261 * (float)local_460._4_4_ +
             fVar290 * fVar245 + fVar197 * fVar218 + fVar317 * fVar285;
        auVar213._8_4_ =
             fVar267 * fStack_458 + fVar150 * fVar332 + fVar198 * fVar283 + fVar318 * fVar220;
        auVar213._12_4_ =
             fVar268 * fStack_454 + fVar153 * fVar178 + fVar199 * fVar279 + fVar319 * fVar287;
        auVar213._16_4_ =
             fVar269 * fStack_450 + fVar156 * fVar333 + fVar306 * fVar280 + fVar320 * fVar288;
        auVar213._20_4_ =
             fVar291 * fStack_44c + fVar158 * fVar282 + fVar223 * fVar219 + fVar326 * fVar289;
        auVar213._24_4_ =
             fVar302 * fStack_448 + fVar161 * fVar270 + fVar237 * fVar286 + fVar328 * fVar221;
        auVar213._28_4_ = fStack_804 + fVar180 + fVar180 + auVar175._28_4_;
        fVar131 = (float)local_100._0_4_ * fVar322 +
                  (float)local_c0._0_4_ * fVar309 +
                  (float)local_80._0_4_ * fVar271 + (float)local_a0._0_4_ * fVar284;
        fVar146 = (float)local_100._4_4_ * fVar261 +
                  (float)local_c0._4_4_ * fVar245 +
                  (float)local_80._4_4_ * fVar218 + (float)local_a0._4_4_ * fVar285;
        fVar149 = fStack_f8 * fVar267 +
                  fStack_b8 * fVar332 + fStack_78 * fVar283 + fStack_98 * fVar220;
        fVar152 = fStack_f4 * fVar268 +
                  fStack_b4 * fVar178 + fStack_74 * fVar279 + fStack_94 * fVar287;
        fVar155 = fStack_f0 * fVar269 +
                  fStack_b0 * fVar333 + fStack_70 * fVar280 + fStack_90 * fVar288;
        fVar130 = fStack_ec * fVar291 +
                  fStack_ac * fVar282 + fStack_6c * fVar219 + fStack_8c * fVar289;
        fVar160 = fStack_e8 * fVar302 +
                  fStack_a8 * fVar270 + fStack_68 * fVar286 + fStack_88 * fVar221;
        fVar144 = fStack_804 + fVar244;
        pauVar8 = (undefined1 (*) [32])(bezier_basis1 + lVar125 * 4 + lVar124);
        auVar169 = *(undefined1 (*) [24])*pauVar8;
        pfVar1 = (float *)(lVar124 + 0x21fdb88 + lVar125 * 4);
        fVar180 = *pfVar1;
        fVar145 = pfVar1[1];
        fVar148 = pfVar1[2];
        fVar151 = pfVar1[3];
        fVar154 = pfVar1[4];
        fVar157 = pfVar1[5];
        fVar159 = pfVar1[6];
        auVar174 = *(undefined1 (*) [32])(lVar124 + 0x21fe00c + lVar125 * 4);
        auVar143 = ZEXT3264(auVar174);
        auVar23 = *(undefined1 (*) [32])(lVar124 + 0x21fe490 + lVar125 * 4);
        auVar175 = ZEXT3264(auVar23);
        fVar322 = auVar23._0_4_;
        fVar267 = auVar23._4_4_;
        fVar269 = auVar23._8_4_;
        fVar302 = auVar23._12_4_;
        fVar332 = auVar23._16_4_;
        fVar270 = auVar23._20_4_;
        fVar279 = auVar23._24_4_;
        fVar261 = auVar174._0_4_;
        fVar268 = auVar174._4_4_;
        fVar291 = auVar174._8_4_;
        fVar309 = auVar174._12_4_;
        fVar178 = auVar174._16_4_;
        fVar271 = auVar174._20_4_;
        fVar280 = auVar174._24_4_;
        fVar245 = fVar330 + fVar330 + fVar244;
        local_720._0_4_ = auVar169._0_4_;
        local_720._4_4_ = auVar169._4_4_;
        fStack_718 = auVar169._8_4_;
        fStack_714 = auVar169._12_4_;
        fStack_710 = auVar169._16_4_;
        fStack_70c = auVar169._20_4_;
        fStack_708 = (float)*(undefined8 *)(*pauVar8 + 0x18);
        fStack_704 = (float)((ulong)*(undefined8 *)(*pauVar8 + 0x18) >> 0x20);
        local_580._0_4_ =
             (float)local_e0._0_4_ * (float)local_720._0_4_ +
             (float)local_300._0_4_ * fVar180 + fVar222 * fVar261 + (float)local_480._0_4_ * fVar322
        ;
        local_580._4_4_ =
             (float)local_e0._4_4_ * (float)local_720._4_4_ +
             (float)local_300._4_4_ * fVar145 + fVar236 * fVar268 + (float)local_480._4_4_ * fVar267
        ;
        local_580._8_4_ =
             fStack_d8 * fStack_718 +
             fStack_2f8 * fVar148 + fVar239 * fVar291 + fStack_478 * fVar269;
        local_580._12_4_ =
             fStack_d4 * fStack_714 +
             fStack_2f4 * fVar151 + fVar242 * fVar309 + fStack_474 * fVar302;
        local_580._16_4_ =
             fStack_d0 * fStack_710 +
             fStack_2f0 * fVar154 + fVar163 * fVar178 + fStack_470 * fVar332;
        local_580._20_4_ =
             fStack_cc * fStack_70c +
             fStack_2ec * fVar157 + fVar176 * fVar271 + fStack_46c * fVar270;
        local_580._24_4_ =
             fStack_c8 * fStack_708 +
             fStack_2e8 * fVar159 + fVar177 * fVar280 + fStack_468 * fVar279;
        local_580._28_4_ = fVar330 + fStack_84 + fVar245;
        local_5a0._0_4_ =
             (float)local_720._0_4_ * (float)local_460._0_4_ +
             fVar147 * fVar180 + fVar182 * fVar261 + fVar312 * fVar322;
        local_5a0._4_4_ =
             (float)local_720._4_4_ * (float)local_460._4_4_ +
             fVar290 * fVar145 + fVar197 * fVar268 + fVar317 * fVar267;
        local_5a0._8_4_ =
             fStack_718 * fStack_458 + fVar150 * fVar148 + fVar198 * fVar291 + fVar318 * fVar269;
        local_5a0._12_4_ =
             fStack_714 * fStack_454 + fVar153 * fVar151 + fVar199 * fVar309 + fVar319 * fVar302;
        local_5a0._16_4_ =
             fStack_710 * fStack_450 + fVar156 * fVar154 + fVar306 * fVar178 + fVar320 * fVar332;
        local_5a0._20_4_ =
             fStack_70c * fStack_44c + fVar158 * fVar157 + fVar223 * fVar271 + fVar326 * fVar270;
        local_5a0._24_4_ =
             fStack_708 * fStack_448 + fVar161 * fVar159 + fVar237 * fVar280 + fVar328 * fVar279;
        local_5a0._28_4_ = fVar245 + fVar330 + fVar330 + *(float *)pauVar7[1];
        auVar195._0_4_ =
             (float)local_720._0_4_ * (float)local_100._0_4_ +
             (float)local_c0._0_4_ * fVar180 +
             (float)local_80._0_4_ * fVar261 + (float)local_a0._0_4_ * fVar322;
        auVar195._4_4_ =
             (float)local_720._4_4_ * (float)local_100._4_4_ +
             (float)local_c0._4_4_ * fVar145 +
             (float)local_80._4_4_ * fVar268 + (float)local_a0._4_4_ * fVar267;
        auVar195._8_4_ =
             fStack_718 * fStack_f8 +
             fStack_b8 * fVar148 + fStack_78 * fVar291 + fStack_98 * fVar269;
        auVar195._12_4_ =
             fStack_714 * fStack_f4 +
             fStack_b4 * fVar151 + fStack_74 * fVar309 + fStack_94 * fVar302;
        auVar195._16_4_ =
             fStack_710 * fStack_f0 +
             fStack_b0 * fVar154 + fStack_70 * fVar178 + fStack_90 * fVar332;
        auVar195._20_4_ =
             fStack_70c * fStack_ec +
             fStack_ac * fVar157 + fStack_6c * fVar271 + fStack_8c * fVar270;
        auVar195._24_4_ =
             fStack_708 * fStack_e8 +
             fStack_a8 * fVar159 + fStack_68 * fVar280 + fStack_88 * fVar279;
        auVar195._28_4_ = fVar245 + fVar330 + fVar330 + fStack_84;
        auVar298 = vsubps_avx(local_580,_local_820);
        auVar274 = vsubps_avx(local_5a0,auVar213);
        fVar320 = auVar298._0_4_;
        fVar328 = auVar298._4_4_;
        auVar58._4_4_ = auVar213._4_4_ * fVar328;
        auVar58._0_4_ = auVar213._0_4_ * fVar320;
        fVar163 = auVar298._8_4_;
        auVar58._8_4_ = auVar213._8_4_ * fVar163;
        fVar177 = auVar298._12_4_;
        auVar58._12_4_ = auVar213._12_4_ * fVar177;
        fVar333 = auVar298._16_4_;
        auVar58._16_4_ = auVar213._16_4_ * fVar333;
        fVar218 = auVar298._20_4_;
        auVar58._20_4_ = auVar213._20_4_ * fVar218;
        fVar219 = auVar298._24_4_;
        auVar58._24_4_ = auVar213._24_4_ * fVar219;
        auVar58._28_4_ = fVar245;
        fVar326 = auVar274._0_4_;
        fVar330 = auVar274._4_4_;
        auVar59._4_4_ = (float)local_820._4_4_ * fVar330;
        auVar59._0_4_ = (float)local_820._0_4_ * fVar326;
        fVar176 = auVar274._8_4_;
        auVar59._8_4_ = fStack_818 * fVar176;
        fVar245 = auVar274._12_4_;
        auVar59._12_4_ = fStack_814 * fVar245;
        fVar282 = auVar274._16_4_;
        auVar59._16_4_ = fStack_810 * fVar282;
        fVar283 = auVar274._20_4_;
        auVar59._20_4_ = fStack_80c * fVar283;
        fVar286 = auVar274._24_4_;
        auVar59._24_4_ = fStack_808 * fVar286;
        auVar59._28_4_ = local_5a0._28_4_;
        auVar251 = vsubps_avx(auVar58,auVar59);
        auVar107._4_4_ = fVar146;
        auVar107._0_4_ = fVar131;
        auVar107._8_4_ = fVar149;
        auVar107._12_4_ = fVar152;
        auVar107._16_4_ = fVar155;
        auVar107._20_4_ = fVar130;
        auVar107._24_4_ = fVar160;
        auVar107._28_4_ = fVar144;
        auVar214 = ZEXT3264(auVar107);
        auVar22 = vmaxps_avx(auVar107,auVar195);
        auVar60._4_4_ = auVar22._4_4_ * auVar22._4_4_ * (fVar328 * fVar328 + fVar330 * fVar330);
        auVar60._0_4_ = auVar22._0_4_ * auVar22._0_4_ * (fVar320 * fVar320 + fVar326 * fVar326);
        auVar60._8_4_ = auVar22._8_4_ * auVar22._8_4_ * (fVar163 * fVar163 + fVar176 * fVar176);
        auVar60._12_4_ = auVar22._12_4_ * auVar22._12_4_ * (fVar177 * fVar177 + fVar245 * fVar245);
        auVar60._16_4_ = auVar22._16_4_ * auVar22._16_4_ * (fVar333 * fVar333 + fVar282 * fVar282);
        auVar60._20_4_ = auVar22._20_4_ * auVar22._20_4_ * (fVar218 * fVar218 + fVar283 * fVar283);
        auVar60._24_4_ = auVar22._24_4_ * auVar22._24_4_ * (fVar219 * fVar219 + fVar286 * fVar286);
        auVar60._28_4_ = local_580._28_4_ + local_5a0._28_4_;
        auVar61._4_4_ = auVar251._4_4_ * auVar251._4_4_;
        auVar61._0_4_ = auVar251._0_4_ * auVar251._0_4_;
        auVar61._8_4_ = auVar251._8_4_ * auVar251._8_4_;
        auVar61._12_4_ = auVar251._12_4_ * auVar251._12_4_;
        auVar61._16_4_ = auVar251._16_4_ * auVar251._16_4_;
        auVar61._20_4_ = auVar251._20_4_ * auVar251._20_4_;
        auVar61._24_4_ = auVar251._24_4_ * auVar251._24_4_;
        auVar61._28_4_ = auVar251._28_4_;
        auVar22 = vcmpps_avx(auVar61,auVar60,2);
        local_260 = (uint)lVar125;
        auVar248 = vpshufd_avx(ZEXT416(local_260),0);
        auVar229 = vpor_avx(auVar248,_DAT_01f4ad30);
        auVar248 = vpor_avx(auVar248,_DAT_01f7afa0);
        auVar113._4_4_ = fStack_4bc;
        auVar113._0_4_ = local_4c0;
        auVar113._8_4_ = fStack_4b8;
        auVar113._12_4_ = fStack_4b4;
        auVar229 = vpcmpgtd_avx(auVar113,auVar229);
        auVar248 = vpcmpgtd_avx(auVar113,auVar248);
        auVar196._16_16_ = auVar248;
        auVar196._0_16_ = auVar229;
        auVar251 = auVar196 & auVar22;
        fVar312 = (float)local_7c0._0_4_;
        fVar317 = (float)local_7c0._4_4_;
        fVar318 = fStack_7b8;
        fVar319 = fStack_7b4;
        fVar320 = fStack_7b0;
        fVar326 = fStack_7ac;
        fVar328 = fStack_7a8;
        fVar330 = fStack_7a4;
        fVar222 = (float)local_7e0._0_4_;
        fVar236 = (float)local_7e0._4_4_;
        fVar239 = fStack_7d8;
        fVar242 = fStack_7d4;
        fVar163 = fStack_7d0;
        fVar176 = fStack_7cc;
        fVar177 = fStack_7c8;
        if ((((((((auVar251 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar251 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar251 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar251 >> 0x7f,0) == '\0') &&
              (auVar251 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar251 >> 0xbf,0) == '\0') &&
            (auVar251 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar251[0x1f]) {
          auVar316 = ZEXT3264(auVar316._0_32_);
          _local_720 = *pauVar8;
        }
        else {
          local_4e0 = (float)local_720._0_4_ * (float)local_5e0._0_4_ +
                      fVar180 * (float)local_320._0_4_ +
                      (float)local_120._0_4_ * fVar261 + (float)local_780._0_4_ * fVar322;
          fStack_4dc = (float)local_720._4_4_ * (float)local_5e0._4_4_ +
                       fVar145 * (float)local_320._4_4_ +
                       (float)local_120._4_4_ * fVar268 + (float)local_780._4_4_ * fVar267;
          fStack_4d8 = fStack_718 * fStack_5d8 +
                       fVar148 * fStack_318 + fStack_118 * fVar291 + fStack_778 * fVar269;
          fStack_4d4 = fStack_714 * fStack_5d4 +
                       fVar151 * fStack_314 + fStack_114 * fVar309 + fStack_774 * fVar302;
          fStack_4d0 = fStack_710 * fStack_5d0 +
                       fVar154 * fStack_310 + fStack_110 * fVar178 + fStack_770 * fVar332;
          fStack_4cc = fStack_70c * fStack_5cc +
                       fVar157 * fStack_30c + fStack_10c * fVar271 + fStack_76c * fVar270;
          fStack_4c8 = fStack_708 * fStack_5c8 +
                       fVar159 * fStack_308 + fStack_108 * fVar280 + fStack_768 * fVar279;
          fStack_4c4 = fStack_704 + auVar174._28_4_ + auVar23._28_4_ + 0.0;
          local_5c0._0_4_ = auVar116._0_4_;
          local_5c0._4_4_ = auVar116._4_4_;
          fStack_5b8 = auVar116._8_4_;
          fStack_5b4 = auVar116._12_4_;
          fStack_5b0 = auVar116._16_4_;
          fStack_5ac = auVar116._20_4_;
          fStack_5a8 = auVar116._24_4_;
          local_700._0_4_ = auVar115._0_4_;
          local_700._4_4_ = auVar115._4_4_;
          fStack_6f8 = auVar115._8_4_;
          fStack_6f4 = auVar115._12_4_;
          fStack_6f0 = auVar115._16_4_;
          fStack_6ec = auVar115._20_4_;
          fStack_6e8 = auVar115._24_4_;
          pfVar1 = (float *)(lVar124 + 0x21fcdfc + lVar125 * 4);
          fVar322 = *pfVar1;
          fVar267 = pfVar1[1];
          fVar268 = pfVar1[2];
          fVar269 = pfVar1[3];
          fVar291 = pfVar1[4];
          fVar302 = pfVar1[5];
          fVar309 = pfVar1[6];
          pfVar2 = (float *)(lVar124 + 0x21fd280 + lVar125 * 4);
          fVar245 = *pfVar2;
          fVar332 = pfVar2[1];
          fVar178 = pfVar2[2];
          fVar333 = pfVar2[3];
          fVar282 = pfVar2[4];
          fVar270 = pfVar2[5];
          fVar271 = pfVar2[6];
          fVar261 = auVar316._28_4_;
          pfVar3 = (float *)(lVar124 + 0x21fc978 + lVar125 * 4);
          fVar218 = *pfVar3;
          fVar283 = pfVar3[1];
          fVar279 = pfVar3[2];
          fVar280 = pfVar3[3];
          fVar219 = pfVar3[4];
          fVar286 = pfVar3[5];
          fVar180 = pfVar3[6];
          fVar162 = pfVar1[7] + pfVar2[7];
          fVar181 = pfVar2[7] + fVar261 + 0.0;
          fVar260 = fVar261 + 0.0 + fVar261 + auVar22._28_4_;
          pfVar1 = (float *)(lVar124 + 0x21fc4f4 + lVar125 * 4);
          fVar145 = *pfVar1;
          fVar148 = pfVar1[1];
          fVar151 = pfVar1[2];
          fVar154 = pfVar1[3];
          fVar157 = pfVar1[4];
          fVar159 = pfVar1[5];
          fVar244 = pfVar1[6];
          local_660 = (float)local_e0._0_4_ * fVar145 +
                      (float)local_300._0_4_ * fVar218 +
                      (float)local_7e0._0_4_ * fVar322 + (float)local_480._0_4_ * fVar245;
          fStack_65c = (float)local_e0._4_4_ * fVar148 +
                       (float)local_300._4_4_ * fVar283 +
                       (float)local_7e0._4_4_ * fVar267 + (float)local_480._4_4_ * fVar332;
          fStack_658 = fStack_d8 * fVar151 +
                       fStack_2f8 * fVar279 + fStack_7d8 * fVar268 + fStack_478 * fVar178;
          fStack_654 = fStack_d4 * fVar154 +
                       fStack_2f4 * fVar280 + fStack_7d4 * fVar269 + fStack_474 * fVar333;
          fStack_650 = fStack_d0 * fVar157 +
                       fStack_2f0 * fVar219 + fStack_7d0 * fVar291 + fStack_470 * fVar282;
          fStack_64c = fStack_cc * fVar159 +
                       fStack_2ec * fVar286 + fStack_7cc * fVar302 + fStack_46c * fVar270;
          fStack_648 = fStack_c8 * fVar244 +
                       fStack_2e8 * fVar180 + fStack_7c8 * fVar309 + fStack_468 * fVar271;
          fStack_644 = fVar162 + fVar181;
          auVar171._0_4_ =
               (float)local_460._0_4_ * fVar145 +
               fVar147 * fVar218 + fVar182 * fVar322 + fVar245 * (float)local_7c0._0_4_;
          auVar171._4_4_ =
               (float)local_460._4_4_ * fVar148 +
               fVar290 * fVar283 + fVar197 * fVar267 + fVar332 * (float)local_7c0._4_4_;
          auVar171._8_4_ =
               fStack_458 * fVar151 + fVar150 * fVar279 + fVar198 * fVar268 + fVar178 * fStack_7b8;
          auVar171._12_4_ =
               fStack_454 * fVar154 + fVar153 * fVar280 + fVar199 * fVar269 + fVar333 * fStack_7b4;
          auVar171._16_4_ =
               fStack_450 * fVar157 + fVar156 * fVar219 + fVar306 * fVar291 + fVar282 * fStack_7b0;
          auVar171._20_4_ =
               fStack_44c * fVar159 + fVar158 * fVar286 + fVar223 * fVar302 + fVar270 * fStack_7ac;
          auVar171._24_4_ =
               fStack_448 * fVar244 + fVar161 * fVar180 + fVar237 * fVar309 + fVar271 * fStack_7a8;
          auVar171._28_4_ = fVar181 + fVar260;
          auVar275._0_4_ =
               fVar218 * (float)local_320._0_4_ +
               (float)local_120._0_4_ * fVar322 + (float)local_780._0_4_ * fVar245 +
               (float)local_5e0._0_4_ * fVar145;
          auVar275._4_4_ =
               fVar283 * (float)local_320._4_4_ +
               (float)local_120._4_4_ * fVar267 + (float)local_780._4_4_ * fVar332 +
               (float)local_5e0._4_4_ * fVar148;
          auVar275._8_4_ =
               fVar279 * fStack_318 + fStack_118 * fVar268 + fStack_778 * fVar178 +
               fStack_5d8 * fVar151;
          auVar275._12_4_ =
               fVar280 * fStack_314 + fStack_114 * fVar269 + fStack_774 * fVar333 +
               fStack_5d4 * fVar154;
          auVar275._16_4_ =
               fVar219 * fStack_310 + fStack_110 * fVar291 + fStack_770 * fVar282 +
               fStack_5d0 * fVar157;
          auVar275._20_4_ =
               fVar286 * fStack_30c + fStack_10c * fVar302 + fStack_76c * fVar270 +
               fStack_5cc * fVar159;
          auVar275._24_4_ =
               fVar180 * fStack_308 + fStack_108 * fVar309 + fStack_768 * fVar271 +
               fStack_5c8 * fVar244;
          auVar275._28_4_ = pfVar3[7] + fVar162 + fVar260;
          pfVar1 = (float *)(lVar124 + 0x21ff21c + lVar125 * 4);
          fVar322 = *pfVar1;
          fVar267 = pfVar1[1];
          fVar268 = pfVar1[2];
          fVar269 = pfVar1[3];
          fVar291 = pfVar1[4];
          fVar302 = pfVar1[5];
          fVar309 = pfVar1[6];
          pfVar2 = (float *)(lVar124 + 0x21ff6a0 + lVar125 * 4);
          fVar245 = *pfVar2;
          fVar332 = pfVar2[1];
          fVar178 = pfVar2[2];
          fVar333 = pfVar2[3];
          fVar282 = pfVar2[4];
          fVar270 = pfVar2[5];
          fVar271 = pfVar2[6];
          pfVar3 = (float *)(lVar124 + 0x21fed98 + lVar125 * 4);
          fVar218 = *pfVar3;
          fVar283 = pfVar3[1];
          fVar279 = pfVar3[2];
          fVar280 = pfVar3[3];
          fVar219 = pfVar3[4];
          fVar286 = pfVar3[5];
          fVar180 = pfVar3[6];
          pfVar4 = (float *)(lVar124 + 0x21fe914 + lVar125 * 4);
          fVar145 = *pfVar4;
          fVar148 = pfVar4[1];
          fVar151 = pfVar4[2];
          fVar154 = pfVar4[3];
          fVar157 = pfVar4[4];
          fVar159 = pfVar4[5];
          fVar244 = pfVar4[6];
          auVar299._0_4_ =
               fVar145 * (float)local_e0._0_4_ +
               (float)local_300._0_4_ * fVar218 +
               (float)local_7e0._0_4_ * fVar322 + (float)local_480._0_4_ * fVar245;
          auVar299._4_4_ =
               fVar148 * (float)local_e0._4_4_ +
               (float)local_300._4_4_ * fVar283 +
               (float)local_7e0._4_4_ * fVar267 + (float)local_480._4_4_ * fVar332;
          auVar299._8_4_ =
               fVar151 * fStack_d8 +
               fStack_2f8 * fVar279 + fStack_7d8 * fVar268 + fStack_478 * fVar178;
          auVar299._12_4_ =
               fVar154 * fStack_d4 +
               fStack_2f4 * fVar280 + fStack_7d4 * fVar269 + fStack_474 * fVar333;
          auVar299._16_4_ =
               fVar157 * fStack_d0 +
               fStack_2f0 * fVar219 + fStack_7d0 * fVar291 + fStack_470 * fVar282;
          auVar299._20_4_ =
               fVar159 * fStack_cc +
               fStack_2ec * fVar286 + fStack_7cc * fVar302 + fStack_46c * fVar270;
          auVar299._24_4_ =
               fVar244 * fStack_c8 +
               fStack_2e8 * fVar180 + fStack_7c8 * fVar309 + fStack_468 * fVar271;
          auVar299._28_4_ = fStack_464 + fStack_464 + fStack_7c4 + fStack_464;
          auVar340._0_4_ =
               fVar145 * (float)local_460._0_4_ +
               fVar147 * fVar218 + fVar182 * fVar322 + fVar245 * (float)local_7c0._0_4_;
          auVar340._4_4_ =
               fVar148 * (float)local_460._4_4_ +
               fVar290 * fVar283 + fVar197 * fVar267 + fVar332 * (float)local_7c0._4_4_;
          auVar340._8_4_ =
               fVar151 * fStack_458 + fVar150 * fVar279 + fVar198 * fVar268 + fVar178 * fStack_7b8;
          auVar340._12_4_ =
               fVar154 * fStack_454 + fVar153 * fVar280 + fVar199 * fVar269 + fVar333 * fStack_7b4;
          auVar340._16_4_ =
               fVar157 * fStack_450 + fVar156 * fVar219 + fVar306 * fVar291 + fVar282 * fStack_7b0;
          auVar340._20_4_ =
               fVar159 * fStack_44c + fVar158 * fVar286 + fVar223 * fVar302 + fVar270 * fStack_7ac;
          auVar340._24_4_ =
               fVar244 * fStack_448 + fVar161 * fVar180 + fVar237 * fVar309 + fVar271 * fStack_7a8;
          auVar340._28_4_ = fStack_464 + fStack_464 + fVar240 + fStack_464;
          auVar252._8_4_ = 0x7fffffff;
          auVar252._0_8_ = 0x7fffffff7fffffff;
          auVar252._12_4_ = 0x7fffffff;
          auVar252._16_4_ = 0x7fffffff;
          auVar252._20_4_ = 0x7fffffff;
          auVar252._24_4_ = 0x7fffffff;
          auVar252._28_4_ = 0x7fffffff;
          auVar110._4_4_ = fStack_65c;
          auVar110._0_4_ = local_660;
          auVar110._8_4_ = fStack_658;
          auVar110._12_4_ = fStack_654;
          auVar110._16_4_ = fStack_650;
          auVar110._20_4_ = fStack_64c;
          auVar110._24_4_ = fStack_648;
          auVar110._28_4_ = fStack_644;
          auVar174 = vandps_avx(auVar110,auVar252);
          auVar251 = vandps_avx(auVar171,auVar252);
          auVar251 = vmaxps_avx(auVar174,auVar251);
          auVar174 = vandps_avx(auVar275,auVar252);
          auVar251 = vmaxps_avx(auVar251,auVar174);
          auVar251 = vcmpps_avx(auVar251,local_600,1);
          auVar15 = vblendvps_avx(auVar110,auVar298,auVar251);
          auVar140._0_4_ =
               fVar145 * (float)local_5e0._0_4_ +
               fVar218 * (float)local_320._0_4_ +
               fVar245 * (float)local_780._0_4_ + (float)local_120._0_4_ * fVar322;
          auVar140._4_4_ =
               fVar148 * (float)local_5e0._4_4_ +
               fVar283 * (float)local_320._4_4_ +
               fVar332 * (float)local_780._4_4_ + (float)local_120._4_4_ * fVar267;
          auVar140._8_4_ =
               fVar151 * fStack_5d8 +
               fVar279 * fStack_318 + fVar178 * fStack_778 + fStack_118 * fVar268;
          auVar140._12_4_ =
               fVar154 * fStack_5d4 +
               fVar280 * fStack_314 + fVar333 * fStack_774 + fStack_114 * fVar269;
          auVar140._16_4_ =
               fVar157 * fStack_5d0 +
               fVar219 * fStack_310 + fVar282 * fStack_770 + fStack_110 * fVar291;
          auVar140._20_4_ =
               fVar159 * fStack_5cc +
               fVar286 * fStack_30c + fVar270 * fStack_76c + fStack_10c * fVar302;
          auVar140._24_4_ =
               fVar244 * fStack_5c8 +
               fVar180 * fStack_308 + fVar271 * fStack_768 + fStack_108 * fVar309;
          auVar140._28_4_ = auVar174._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar208 = vblendvps_avx(auVar171,auVar274,auVar251);
          auVar174 = vandps_avx(auVar299,auVar252);
          auVar251 = vandps_avx(auVar340,auVar252);
          auVar209 = vmaxps_avx(auVar174,auVar251);
          auVar174 = vandps_avx(auVar140,auVar252);
          auVar174 = vmaxps_avx(auVar209,auVar174);
          local_4a0._0_4_ = auVar117._0_4_;
          local_4a0._4_4_ = auVar117._4_4_;
          fStack_498 = auVar117._8_4_;
          fStack_494 = auVar117._12_4_;
          fStack_490 = auVar117._16_4_;
          fStack_48c = auVar117._20_4_;
          fStack_488 = auVar117._24_4_;
          auVar251 = vcmpps_avx(auVar174,local_600,1);
          auVar174 = vblendvps_avx(auVar299,auVar298,auVar251);
          auVar141._0_4_ =
               (float)local_5e0._0_4_ * (float)local_4a0._0_4_ +
               (float)local_320._0_4_ * (float)local_5c0._0_4_ +
               (float)local_120._0_4_ * (float)local_700._0_4_ + (float)local_780._0_4_ * fVar284;
          auVar141._4_4_ =
               (float)local_5e0._4_4_ * (float)local_4a0._4_4_ +
               (float)local_320._4_4_ * (float)local_5c0._4_4_ +
               (float)local_120._4_4_ * (float)local_700._4_4_ + (float)local_780._4_4_ * fVar285;
          auVar141._8_4_ =
               fStack_5d8 * fStack_498 +
               fStack_318 * fStack_5b8 + fStack_118 * fStack_6f8 + fStack_778 * fVar220;
          auVar141._12_4_ =
               fStack_5d4 * fStack_494 +
               fStack_314 * fStack_5b4 + fStack_114 * fStack_6f4 + fStack_774 * fVar287;
          auVar141._16_4_ =
               fStack_5d0 * fStack_490 +
               fStack_310 * fStack_5b0 + fStack_110 * fStack_6f0 + fStack_770 * fVar288;
          auVar141._20_4_ =
               fStack_5cc * fStack_48c +
               fStack_30c * fStack_5ac + fStack_10c * fStack_6ec + fStack_76c * fVar289;
          auVar141._24_4_ =
               fStack_5c8 * fStack_488 +
               fStack_308 * fStack_5a8 + fStack_108 * fStack_6e8 + fStack_768 * fVar221;
          auVar141._28_4_ = auVar209._28_4_ + fStack_4c4 + auVar23._28_4_ + 0.0;
          auVar23 = vblendvps_avx(auVar340,auVar274,auVar251);
          fVar159 = auVar15._0_4_;
          fVar182 = auVar15._4_4_;
          fVar197 = auVar15._8_4_;
          fVar198 = auVar15._12_4_;
          fVar199 = auVar15._16_4_;
          fVar223 = auVar15._20_4_;
          fVar237 = auVar15._24_4_;
          fVar240 = auVar15._28_4_;
          fVar270 = auVar174._0_4_;
          fVar218 = auVar174._4_4_;
          fVar279 = auVar174._8_4_;
          fVar219 = auVar174._12_4_;
          fVar284 = auVar174._16_4_;
          fVar220 = auVar174._20_4_;
          fVar288 = auVar174._24_4_;
          fVar322 = auVar208._0_4_;
          fVar267 = auVar208._4_4_;
          fVar269 = auVar208._8_4_;
          fVar302 = auVar208._12_4_;
          fVar309 = auVar208._16_4_;
          fVar332 = auVar208._20_4_;
          fVar333 = auVar208._24_4_;
          auVar315._0_4_ = fVar322 * fVar322 + fVar159 * fVar159;
          auVar315._4_4_ = fVar267 * fVar267 + fVar182 * fVar182;
          auVar315._8_4_ = fVar269 * fVar269 + fVar197 * fVar197;
          auVar315._12_4_ = fVar302 * fVar302 + fVar198 * fVar198;
          auVar315._16_4_ = fVar309 * fVar309 + fVar199 * fVar199;
          auVar315._20_4_ = fVar332 * fVar332 + fVar223 * fVar223;
          auVar315._24_4_ = fVar333 * fVar333 + fVar237 * fVar237;
          auVar315._28_4_ = fVar261 + auVar274._28_4_;
          auVar298 = vrsqrtps_avx(auVar315);
          fVar261 = auVar298._0_4_;
          fVar268 = auVar298._4_4_;
          auVar62._4_4_ = fVar268 * 1.5;
          auVar62._0_4_ = fVar261 * 1.5;
          fVar291 = auVar298._8_4_;
          auVar62._8_4_ = fVar291 * 1.5;
          fVar306 = auVar298._12_4_;
          auVar62._12_4_ = fVar306 * 1.5;
          fVar245 = auVar298._16_4_;
          auVar62._16_4_ = fVar245 * 1.5;
          fVar178 = auVar298._20_4_;
          auVar62._20_4_ = fVar178 * 1.5;
          fVar282 = auVar298._24_4_;
          auVar62._24_4_ = fVar282 * 1.5;
          auVar62._28_4_ = auVar340._28_4_;
          auVar63._4_4_ = fVar268 * fVar268 * fVar268 * auVar315._4_4_ * 0.5;
          auVar63._0_4_ = fVar261 * fVar261 * fVar261 * auVar315._0_4_ * 0.5;
          auVar63._8_4_ = fVar291 * fVar291 * fVar291 * auVar315._8_4_ * 0.5;
          auVar63._12_4_ = fVar306 * fVar306 * fVar306 * auVar315._12_4_ * 0.5;
          auVar63._16_4_ = fVar245 * fVar245 * fVar245 * auVar315._16_4_ * 0.5;
          auVar63._20_4_ = fVar178 * fVar178 * fVar178 * auVar315._20_4_ * 0.5;
          auVar63._24_4_ = fVar282 * fVar282 * fVar282 * auVar315._24_4_ * 0.5;
          auVar63._28_4_ = auVar315._28_4_;
          auVar274 = vsubps_avx(auVar62,auVar63);
          fVar221 = auVar274._0_4_;
          fVar180 = auVar274._4_4_;
          fVar145 = auVar274._8_4_;
          fVar148 = auVar274._12_4_;
          fVar151 = auVar274._16_4_;
          fVar154 = auVar274._20_4_;
          fVar157 = auVar274._24_4_;
          fVar261 = auVar23._0_4_;
          fVar268 = auVar23._4_4_;
          fVar291 = auVar23._8_4_;
          fVar306 = auVar23._12_4_;
          fVar245 = auVar23._16_4_;
          fVar178 = auVar23._20_4_;
          fVar282 = auVar23._24_4_;
          auVar276._0_4_ = fVar261 * fVar261 + fVar270 * fVar270;
          auVar276._4_4_ = fVar268 * fVar268 + fVar218 * fVar218;
          auVar276._8_4_ = fVar291 * fVar291 + fVar279 * fVar279;
          auVar276._12_4_ = fVar306 * fVar306 + fVar219 * fVar219;
          auVar276._16_4_ = fVar245 * fVar245 + fVar284 * fVar284;
          auVar276._20_4_ = fVar178 * fVar178 + fVar220 * fVar220;
          auVar276._24_4_ = fVar282 * fVar282 + fVar288 * fVar288;
          auVar276._28_4_ = auVar298._28_4_ + auVar174._28_4_;
          auVar174 = vrsqrtps_avx(auVar276);
          fVar271 = auVar174._0_4_;
          fVar283 = auVar174._4_4_;
          auVar64._4_4_ = fVar283 * 1.5;
          auVar64._0_4_ = fVar271 * 1.5;
          fVar280 = auVar174._8_4_;
          auVar64._8_4_ = fVar280 * 1.5;
          fVar286 = auVar174._12_4_;
          auVar64._12_4_ = fVar286 * 1.5;
          fVar285 = auVar174._16_4_;
          auVar64._16_4_ = fVar285 * 1.5;
          fVar287 = auVar174._20_4_;
          auVar64._20_4_ = fVar287 * 1.5;
          fVar289 = auVar174._24_4_;
          auVar64._24_4_ = fVar289 * 1.5;
          auVar64._28_4_ = auVar340._28_4_;
          auVar65._4_4_ = fVar283 * fVar283 * fVar283 * auVar276._4_4_ * 0.5;
          auVar65._0_4_ = fVar271 * fVar271 * fVar271 * auVar276._0_4_ * 0.5;
          auVar65._8_4_ = fVar280 * fVar280 * fVar280 * auVar276._8_4_ * 0.5;
          auVar65._12_4_ = fVar286 * fVar286 * fVar286 * auVar276._12_4_ * 0.5;
          auVar65._16_4_ = fVar285 * fVar285 * fVar285 * auVar276._16_4_ * 0.5;
          auVar65._20_4_ = fVar287 * fVar287 * fVar287 * auVar276._20_4_ * 0.5;
          auVar65._24_4_ = fVar289 * fVar289 * fVar289 * auVar276._24_4_ * 0.5;
          auVar65._28_4_ = auVar276._28_4_;
          auVar23 = vsubps_avx(auVar64,auVar65);
          fVar271 = auVar23._0_4_;
          fVar283 = auVar23._4_4_;
          fVar280 = auVar23._8_4_;
          fVar286 = auVar23._12_4_;
          fVar285 = auVar23._16_4_;
          fVar287 = auVar23._20_4_;
          fVar289 = auVar23._24_4_;
          fVar322 = fVar131 * fVar221 * fVar322;
          fVar267 = fVar146 * fVar180 * fVar267;
          auVar66._4_4_ = fVar267;
          auVar66._0_4_ = fVar322;
          fVar269 = fVar149 * fVar145 * fVar269;
          auVar66._8_4_ = fVar269;
          fVar302 = fVar152 * fVar148 * fVar302;
          auVar66._12_4_ = fVar302;
          fVar309 = fVar155 * fVar151 * fVar309;
          auVar66._16_4_ = fVar309;
          fVar332 = fVar130 * fVar154 * fVar332;
          auVar66._20_4_ = fVar332;
          fVar333 = fVar160 * fVar157 * fVar333;
          auVar66._24_4_ = fVar333;
          auVar66._28_4_ = auVar174._28_4_;
          local_4a0._4_4_ = fVar267 + (float)local_820._4_4_;
          local_4a0._0_4_ = fVar322 + (float)local_820._0_4_;
          fStack_498 = fVar269 + fStack_818;
          fStack_494 = fVar302 + fStack_814;
          fStack_490 = fVar309 + fStack_810;
          fStack_48c = fVar332 + fStack_80c;
          fStack_488 = fVar333 + fStack_808;
          fStack_484 = auVar174._28_4_ + fStack_804;
          fVar322 = fVar131 * fVar221 * -fVar159;
          fVar267 = fVar146 * fVar180 * -fVar182;
          auVar67._4_4_ = fVar267;
          auVar67._0_4_ = fVar322;
          fVar269 = fVar149 * fVar145 * -fVar197;
          auVar67._8_4_ = fVar269;
          fVar302 = fVar152 * fVar148 * -fVar198;
          auVar67._12_4_ = fVar302;
          fVar309 = fVar155 * fVar151 * -fVar199;
          auVar67._16_4_ = fVar309;
          fVar332 = fVar130 * fVar154 * -fVar223;
          auVar67._20_4_ = fVar332;
          fVar333 = fVar160 * fVar157 * -fVar237;
          auVar67._24_4_ = fVar333;
          auVar67._28_4_ = -fVar240;
          local_700._4_4_ = auVar213._4_4_ + fVar267;
          local_700._0_4_ = auVar213._0_4_ + fVar322;
          fStack_6f8 = auVar213._8_4_ + fVar269;
          fStack_6f4 = auVar213._12_4_ + fVar302;
          fStack_6f0 = auVar213._16_4_ + fVar309;
          fStack_6ec = auVar213._20_4_ + fVar332;
          fStack_6e8 = auVar213._24_4_ + fVar333;
          fStack_6e4 = auVar213._28_4_ + -fVar240;
          fVar322 = fVar221 * 0.0 * fVar131;
          fVar267 = fVar180 * 0.0 * fVar146;
          auVar68._4_4_ = fVar267;
          auVar68._0_4_ = fVar322;
          fVar269 = fVar145 * 0.0 * fVar149;
          auVar68._8_4_ = fVar269;
          fVar302 = fVar148 * 0.0 * fVar152;
          auVar68._12_4_ = fVar302;
          fVar309 = fVar151 * 0.0 * fVar155;
          auVar68._16_4_ = fVar309;
          fVar332 = fVar154 * 0.0 * fVar130;
          auVar68._20_4_ = fVar332;
          fVar333 = fVar157 * 0.0 * fVar160;
          auVar68._24_4_ = fVar333;
          auVar68._28_4_ = fVar240;
          auVar174 = vsubps_avx(_local_820,auVar66);
          auVar362._0_4_ = fVar322 + auVar141._0_4_;
          auVar362._4_4_ = fVar267 + auVar141._4_4_;
          auVar362._8_4_ = fVar269 + auVar141._8_4_;
          auVar362._12_4_ = fVar302 + auVar141._12_4_;
          auVar362._16_4_ = fVar309 + auVar141._16_4_;
          auVar362._20_4_ = fVar332 + auVar141._20_4_;
          auVar362._24_4_ = fVar333 + auVar141._24_4_;
          auVar362._28_4_ = fVar240 + auVar141._28_4_;
          fVar322 = auVar195._0_4_ * fVar271 * fVar261;
          fVar261 = auVar195._4_4_ * fVar283 * fVar268;
          auVar69._4_4_ = fVar261;
          auVar69._0_4_ = fVar322;
          fVar267 = auVar195._8_4_ * fVar280 * fVar291;
          auVar69._8_4_ = fVar267;
          fVar268 = auVar195._12_4_ * fVar286 * fVar306;
          auVar69._12_4_ = fVar268;
          fVar269 = auVar195._16_4_ * fVar285 * fVar245;
          auVar69._16_4_ = fVar269;
          fVar291 = auVar195._20_4_ * fVar287 * fVar178;
          auVar69._20_4_ = fVar291;
          fVar302 = auVar195._24_4_ * fVar289 * fVar282;
          auVar69._24_4_ = fVar302;
          auVar69._28_4_ = fStack_804;
          auVar24 = vsubps_avx(auVar213,auVar67);
          auVar345._0_4_ = local_580._0_4_ + fVar322;
          auVar345._4_4_ = local_580._4_4_ + fVar261;
          auVar345._8_4_ = local_580._8_4_ + fVar267;
          auVar345._12_4_ = local_580._12_4_ + fVar268;
          auVar345._16_4_ = local_580._16_4_ + fVar269;
          auVar345._20_4_ = local_580._20_4_ + fVar291;
          auVar345._24_4_ = local_580._24_4_ + fVar302;
          auVar345._28_4_ = local_580._28_4_ + fStack_804;
          fVar322 = fVar271 * -fVar270 * auVar195._0_4_;
          fVar261 = fVar283 * -fVar218 * auVar195._4_4_;
          auVar70._4_4_ = fVar261;
          auVar70._0_4_ = fVar322;
          fVar267 = fVar280 * -fVar279 * auVar195._8_4_;
          auVar70._8_4_ = fVar267;
          fVar268 = fVar286 * -fVar219 * auVar195._12_4_;
          auVar70._12_4_ = fVar268;
          fVar269 = fVar285 * -fVar284 * auVar195._16_4_;
          auVar70._16_4_ = fVar269;
          fVar291 = fVar287 * -fVar220 * auVar195._20_4_;
          auVar70._20_4_ = fVar291;
          fVar302 = fVar289 * -fVar288 * auVar195._24_4_;
          auVar70._24_4_ = fVar302;
          auVar70._28_4_ = fVar144;
          auVar25 = vsubps_avx(auVar141,auVar68);
          auVar233._0_4_ = local_5a0._0_4_ + fVar322;
          auVar233._4_4_ = local_5a0._4_4_ + fVar261;
          auVar233._8_4_ = local_5a0._8_4_ + fVar267;
          auVar233._12_4_ = local_5a0._12_4_ + fVar268;
          auVar233._16_4_ = local_5a0._16_4_ + fVar269;
          auVar233._20_4_ = local_5a0._20_4_ + fVar291;
          auVar233._24_4_ = local_5a0._24_4_ + fVar302;
          auVar233._28_4_ = local_5a0._28_4_ + fVar144;
          fVar322 = fVar271 * 0.0 * auVar195._0_4_;
          fVar261 = fVar283 * 0.0 * auVar195._4_4_;
          auVar71._4_4_ = fVar261;
          auVar71._0_4_ = fVar322;
          fVar267 = fVar280 * 0.0 * auVar195._8_4_;
          auVar71._8_4_ = fVar267;
          fVar268 = fVar286 * 0.0 * auVar195._12_4_;
          auVar71._12_4_ = fVar268;
          fVar269 = fVar285 * 0.0 * auVar195._16_4_;
          auVar71._16_4_ = fVar269;
          fVar291 = fVar287 * 0.0 * auVar195._20_4_;
          auVar71._20_4_ = fVar291;
          fVar302 = fVar289 * 0.0 * auVar195._24_4_;
          auVar71._24_4_ = fVar302;
          auVar71._28_4_ = auVar141._28_4_;
          auVar298 = vsubps_avx(local_580,auVar69);
          auVar112._4_4_ = fStack_4dc;
          auVar112._0_4_ = local_4e0;
          auVar112._8_4_ = fStack_4d8;
          auVar112._12_4_ = fStack_4d4;
          auVar112._16_4_ = fStack_4d0;
          auVar112._20_4_ = fStack_4cc;
          auVar112._24_4_ = fStack_4c8;
          auVar112._28_4_ = fStack_4c4;
          auVar300._0_4_ = local_4e0 + fVar322;
          auVar300._4_4_ = fStack_4dc + fVar261;
          auVar300._8_4_ = fStack_4d8 + fVar267;
          auVar300._12_4_ = fStack_4d4 + fVar268;
          auVar300._16_4_ = fStack_4d0 + fVar269;
          auVar300._20_4_ = fStack_4cc + fVar291;
          auVar300._24_4_ = fStack_4c8 + fVar302;
          auVar300._28_4_ = fStack_4c4 + auVar141._28_4_;
          auVar274 = vsubps_avx(local_5a0,auVar70);
          auVar251 = vsubps_avx(auVar112,auVar71);
          auVar15 = vsubps_avx(auVar233,auVar24);
          auVar208 = vsubps_avx(auVar300,auVar25);
          auVar72._4_4_ = auVar25._4_4_ * auVar15._4_4_;
          auVar72._0_4_ = auVar25._0_4_ * auVar15._0_4_;
          auVar72._8_4_ = auVar25._8_4_ * auVar15._8_4_;
          auVar72._12_4_ = auVar25._12_4_ * auVar15._12_4_;
          auVar72._16_4_ = auVar25._16_4_ * auVar15._16_4_;
          auVar72._20_4_ = auVar25._20_4_ * auVar15._20_4_;
          auVar72._24_4_ = auVar25._24_4_ * auVar15._24_4_;
          auVar72._28_4_ = auVar340._28_4_;
          auVar73._4_4_ = auVar24._4_4_ * auVar208._4_4_;
          auVar73._0_4_ = auVar24._0_4_ * auVar208._0_4_;
          auVar73._8_4_ = auVar24._8_4_ * auVar208._8_4_;
          auVar73._12_4_ = auVar24._12_4_ * auVar208._12_4_;
          auVar73._16_4_ = auVar24._16_4_ * auVar208._16_4_;
          auVar73._20_4_ = auVar24._20_4_ * auVar208._20_4_;
          auVar73._24_4_ = auVar24._24_4_ * auVar208._24_4_;
          auVar73._28_4_ = fStack_4c4;
          auVar209 = vsubps_avx(auVar73,auVar72);
          auVar74._4_4_ = auVar174._4_4_ * auVar208._4_4_;
          auVar74._0_4_ = auVar174._0_4_ * auVar208._0_4_;
          auVar74._8_4_ = auVar174._8_4_ * auVar208._8_4_;
          auVar74._12_4_ = auVar174._12_4_ * auVar208._12_4_;
          auVar74._16_4_ = auVar174._16_4_ * auVar208._16_4_;
          auVar74._20_4_ = auVar174._20_4_ * auVar208._20_4_;
          auVar74._24_4_ = auVar174._24_4_ * auVar208._24_4_;
          auVar74._28_4_ = auVar208._28_4_;
          auVar208 = vsubps_avx(auVar345,auVar174);
          auVar75._4_4_ = auVar25._4_4_ * auVar208._4_4_;
          auVar75._0_4_ = auVar25._0_4_ * auVar208._0_4_;
          auVar75._8_4_ = auVar25._8_4_ * auVar208._8_4_;
          auVar75._12_4_ = auVar25._12_4_ * auVar208._12_4_;
          auVar75._16_4_ = auVar25._16_4_ * auVar208._16_4_;
          auVar75._20_4_ = auVar25._20_4_ * auVar208._20_4_;
          auVar75._24_4_ = auVar25._24_4_ * auVar208._24_4_;
          auVar75._28_4_ = auVar23._28_4_;
          auVar230 = vsubps_avx(auVar75,auVar74);
          auVar76._4_4_ = auVar24._4_4_ * auVar208._4_4_;
          auVar76._0_4_ = auVar24._0_4_ * auVar208._0_4_;
          auVar76._8_4_ = auVar24._8_4_ * auVar208._8_4_;
          auVar76._12_4_ = auVar24._12_4_ * auVar208._12_4_;
          auVar76._16_4_ = auVar24._16_4_ * auVar208._16_4_;
          auVar76._20_4_ = auVar24._20_4_ * auVar208._20_4_;
          auVar76._24_4_ = auVar24._24_4_ * auVar208._24_4_;
          auVar76._28_4_ = auVar23._28_4_;
          auVar77._4_4_ = auVar174._4_4_ * auVar15._4_4_;
          auVar77._0_4_ = auVar174._0_4_ * auVar15._0_4_;
          auVar77._8_4_ = auVar174._8_4_ * auVar15._8_4_;
          auVar77._12_4_ = auVar174._12_4_ * auVar15._12_4_;
          auVar77._16_4_ = auVar174._16_4_ * auVar15._16_4_;
          auVar77._20_4_ = auVar174._20_4_ * auVar15._20_4_;
          auVar77._24_4_ = auVar174._24_4_ * auVar15._24_4_;
          auVar77._28_4_ = auVar15._28_4_;
          auVar23 = vsubps_avx(auVar77,auVar76);
          auVar172._0_4_ = auVar209._0_4_ * 0.0 + auVar23._0_4_ + auVar230._0_4_ * 0.0;
          auVar172._4_4_ = auVar209._4_4_ * 0.0 + auVar23._4_4_ + auVar230._4_4_ * 0.0;
          auVar172._8_4_ = auVar209._8_4_ * 0.0 + auVar23._8_4_ + auVar230._8_4_ * 0.0;
          auVar172._12_4_ = auVar209._12_4_ * 0.0 + auVar23._12_4_ + auVar230._12_4_ * 0.0;
          auVar172._16_4_ = auVar209._16_4_ * 0.0 + auVar23._16_4_ + auVar230._16_4_ * 0.0;
          auVar172._20_4_ = auVar209._20_4_ * 0.0 + auVar23._20_4_ + auVar230._20_4_ * 0.0;
          auVar172._24_4_ = auVar209._24_4_ * 0.0 + auVar23._24_4_ + auVar230._24_4_ * 0.0;
          auVar172._28_4_ = auVar209._28_4_ + auVar23._28_4_ + auVar230._28_4_;
          auVar337 = vcmpps_avx(auVar172,ZEXT832(0) << 0x20,2);
          auVar23 = vblendvps_avx(auVar298,_local_4a0,auVar337);
          auVar214 = ZEXT3264(auVar23);
          auVar298 = vblendvps_avx(auVar274,_local_700,auVar337);
          auVar274 = vblendvps_avx(auVar251,auVar362,auVar337);
          auVar251 = vblendvps_avx(auVar174,auVar345,auVar337);
          auVar15 = vblendvps_avx(auVar24,auVar233,auVar337);
          auVar208 = vblendvps_avx(auVar25,auVar300,auVar337);
          auVar209 = vblendvps_avx(auVar345,auVar174,auVar337);
          auVar230 = vblendvps_avx(auVar233,auVar24,auVar337);
          auVar265 = vblendvps_avx(auVar300,auVar25,auVar337);
          auVar174 = vandps_avx(auVar22,auVar196);
          auVar209 = vsubps_avx(auVar209,auVar23);
          auVar26 = vsubps_avx(auVar230,auVar298);
          auVar27 = vsubps_avx(auVar265,auVar274);
          auVar265 = vsubps_avx(auVar298,auVar15);
          fVar322 = auVar26._0_4_;
          fVar158 = auVar274._0_4_;
          fVar306 = auVar26._4_4_;
          fVar161 = auVar274._4_4_;
          auVar78._4_4_ = fVar161 * fVar306;
          auVar78._0_4_ = fVar158 * fVar322;
          fVar270 = auVar26._8_4_;
          fVar162 = auVar274._8_4_;
          auVar78._8_4_ = fVar162 * fVar270;
          fVar286 = auVar26._12_4_;
          fVar181 = auVar274._12_4_;
          auVar78._12_4_ = fVar181 * fVar286;
          fVar221 = auVar26._16_4_;
          fVar260 = auVar274._16_4_;
          auVar78._16_4_ = fVar260 * fVar221;
          fVar159 = auVar26._20_4_;
          fVar200 = auVar274._20_4_;
          auVar78._20_4_ = fVar200 * fVar159;
          fVar240 = auVar26._24_4_;
          fVar201 = auVar274._24_4_;
          auVar78._24_4_ = fVar201 * fVar240;
          auVar78._28_4_ = auVar230._28_4_;
          fVar261 = auVar298._0_4_;
          fVar215 = auVar27._0_4_;
          fVar309 = auVar298._4_4_;
          fVar216 = auVar27._4_4_;
          auVar79._4_4_ = fVar216 * fVar309;
          auVar79._0_4_ = fVar215 * fVar261;
          fVar271 = auVar298._8_4_;
          fVar217 = auVar27._8_4_;
          auVar79._8_4_ = fVar217 * fVar271;
          fVar284 = auVar298._12_4_;
          fVar179 = auVar27._12_4_;
          auVar79._12_4_ = fVar179 * fVar284;
          fVar180 = auVar298._16_4_;
          fVar277 = auVar27._16_4_;
          auVar79._16_4_ = fVar277 * fVar180;
          fVar182 = auVar298._20_4_;
          fVar278 = auVar27._20_4_;
          auVar79._20_4_ = fVar278 * fVar182;
          fVar244 = auVar298._24_4_;
          fVar281 = auVar27._24_4_;
          uVar129 = auVar24._28_4_;
          auVar79._24_4_ = fVar281 * fVar244;
          auVar79._28_4_ = uVar129;
          auVar230 = vsubps_avx(auVar79,auVar78);
          fVar267 = auVar23._0_4_;
          fVar245 = auVar23._4_4_;
          auVar80._4_4_ = fVar216 * fVar245;
          auVar80._0_4_ = fVar215 * fVar267;
          fVar218 = auVar23._8_4_;
          auVar80._8_4_ = fVar217 * fVar218;
          fVar285 = auVar23._12_4_;
          auVar80._12_4_ = fVar179 * fVar285;
          fVar145 = auVar23._16_4_;
          auVar80._16_4_ = fVar277 * fVar145;
          fVar197 = auVar23._20_4_;
          auVar80._20_4_ = fVar278 * fVar197;
          fVar147 = auVar23._24_4_;
          auVar80._24_4_ = fVar281 * fVar147;
          auVar80._28_4_ = uVar129;
          fVar268 = auVar209._0_4_;
          fVar332 = auVar209._4_4_;
          auVar81._4_4_ = fVar161 * fVar332;
          auVar81._0_4_ = fVar158 * fVar268;
          fVar283 = auVar209._8_4_;
          auVar81._8_4_ = fVar162 * fVar283;
          fVar220 = auVar209._12_4_;
          auVar81._12_4_ = fVar181 * fVar220;
          fVar148 = auVar209._16_4_;
          auVar81._16_4_ = fVar260 * fVar148;
          fVar198 = auVar209._20_4_;
          auVar81._20_4_ = fVar200 * fVar198;
          fVar290 = auVar209._24_4_;
          auVar81._24_4_ = fVar201 * fVar290;
          auVar81._28_4_ = auVar345._28_4_;
          auVar24 = vsubps_avx(auVar81,auVar80);
          auVar82._4_4_ = fVar309 * fVar332;
          auVar82._0_4_ = fVar261 * fVar268;
          auVar82._8_4_ = fVar271 * fVar283;
          auVar82._12_4_ = fVar284 * fVar220;
          auVar82._16_4_ = fVar180 * fVar148;
          auVar82._20_4_ = fVar182 * fVar198;
          auVar82._24_4_ = fVar244 * fVar290;
          auVar82._28_4_ = uVar129;
          auVar83._4_4_ = fVar245 * fVar306;
          auVar83._0_4_ = fVar267 * fVar322;
          auVar83._8_4_ = fVar218 * fVar270;
          auVar83._12_4_ = fVar285 * fVar286;
          auVar83._16_4_ = fVar145 * fVar221;
          auVar83._20_4_ = fVar197 * fVar159;
          auVar83._24_4_ = fVar147 * fVar240;
          auVar83._28_4_ = auVar25._28_4_;
          auVar25 = vsubps_avx(auVar83,auVar82);
          auVar28 = vsubps_avx(auVar274,auVar208);
          fVar291 = auVar25._28_4_ + auVar24._28_4_;
          local_720._0_4_ = auVar25._0_4_ + auVar24._0_4_ * 0.0 + auVar230._0_4_ * 0.0;
          local_720._4_4_ = auVar25._4_4_ + auVar24._4_4_ * 0.0 + auVar230._4_4_ * 0.0;
          fStack_718 = auVar25._8_4_ + auVar24._8_4_ * 0.0 + auVar230._8_4_ * 0.0;
          fStack_714 = auVar25._12_4_ + auVar24._12_4_ * 0.0 + auVar230._12_4_ * 0.0;
          fStack_710 = auVar25._16_4_ + auVar24._16_4_ * 0.0 + auVar230._16_4_ * 0.0;
          fStack_70c = auVar25._20_4_ + auVar24._20_4_ * 0.0 + auVar230._20_4_ * 0.0;
          fStack_708 = auVar25._24_4_ + auVar24._24_4_ * 0.0 + auVar230._24_4_ * 0.0;
          fStack_704 = fVar291 + auVar230._28_4_;
          fVar269 = auVar265._0_4_;
          fVar178 = auVar265._4_4_;
          auVar84._4_4_ = auVar208._4_4_ * fVar178;
          auVar84._0_4_ = auVar208._0_4_ * fVar269;
          fVar279 = auVar265._8_4_;
          auVar84._8_4_ = auVar208._8_4_ * fVar279;
          fVar287 = auVar265._12_4_;
          auVar84._12_4_ = auVar208._12_4_ * fVar287;
          fVar151 = auVar265._16_4_;
          auVar84._16_4_ = auVar208._16_4_ * fVar151;
          fVar199 = auVar265._20_4_;
          auVar84._20_4_ = auVar208._20_4_ * fVar199;
          fVar150 = auVar265._24_4_;
          auVar84._24_4_ = auVar208._24_4_ * fVar150;
          auVar84._28_4_ = fVar291;
          fVar291 = auVar28._0_4_;
          fVar333 = auVar28._4_4_;
          auVar85._4_4_ = auVar15._4_4_ * fVar333;
          auVar85._0_4_ = auVar15._0_4_ * fVar291;
          fVar280 = auVar28._8_4_;
          auVar85._8_4_ = auVar15._8_4_ * fVar280;
          fVar288 = auVar28._12_4_;
          auVar85._12_4_ = auVar15._12_4_ * fVar288;
          fVar154 = auVar28._16_4_;
          auVar85._16_4_ = auVar15._16_4_ * fVar154;
          fVar223 = auVar28._20_4_;
          auVar85._20_4_ = auVar15._20_4_ * fVar223;
          fVar153 = auVar28._24_4_;
          auVar85._24_4_ = auVar15._24_4_ * fVar153;
          auVar85._28_4_ = auVar25._28_4_;
          auVar265 = vsubps_avx(auVar85,auVar84);
          auVar24 = vsubps_avx(auVar23,auVar251);
          fVar302 = auVar24._0_4_;
          fVar282 = auVar24._4_4_;
          auVar86._4_4_ = auVar208._4_4_ * fVar282;
          auVar86._0_4_ = auVar208._0_4_ * fVar302;
          fVar219 = auVar24._8_4_;
          auVar86._8_4_ = auVar208._8_4_ * fVar219;
          fVar289 = auVar24._12_4_;
          auVar86._12_4_ = auVar208._12_4_ * fVar289;
          fVar157 = auVar24._16_4_;
          auVar86._16_4_ = auVar208._16_4_ * fVar157;
          fVar237 = auVar24._20_4_;
          auVar86._20_4_ = auVar208._20_4_ * fVar237;
          fVar156 = auVar24._24_4_;
          auVar86._24_4_ = auVar208._24_4_ * fVar156;
          auVar86._28_4_ = auVar208._28_4_;
          auVar87._4_4_ = fVar333 * auVar251._4_4_;
          auVar87._0_4_ = fVar291 * auVar251._0_4_;
          auVar87._8_4_ = fVar280 * auVar251._8_4_;
          auVar87._12_4_ = fVar288 * auVar251._12_4_;
          auVar87._16_4_ = fVar154 * auVar251._16_4_;
          auVar87._20_4_ = fVar223 * auVar251._20_4_;
          auVar87._24_4_ = fVar153 * auVar251._24_4_;
          auVar87._28_4_ = auVar230._28_4_;
          auVar208 = vsubps_avx(auVar86,auVar87);
          auVar88._4_4_ = auVar15._4_4_ * fVar282;
          auVar88._0_4_ = auVar15._0_4_ * fVar302;
          auVar88._8_4_ = auVar15._8_4_ * fVar219;
          auVar88._12_4_ = auVar15._12_4_ * fVar289;
          auVar88._16_4_ = auVar15._16_4_ * fVar157;
          auVar88._20_4_ = auVar15._20_4_ * fVar237;
          auVar88._24_4_ = auVar15._24_4_ * fVar156;
          auVar88._28_4_ = auVar15._28_4_;
          auVar89._4_4_ = fVar178 * auVar251._4_4_;
          auVar89._0_4_ = fVar269 * auVar251._0_4_;
          auVar89._8_4_ = fVar279 * auVar251._8_4_;
          auVar89._12_4_ = fVar287 * auVar251._12_4_;
          auVar89._16_4_ = fVar151 * auVar251._16_4_;
          auVar89._20_4_ = fVar199 * auVar251._20_4_;
          auVar89._24_4_ = fVar150 * auVar251._24_4_;
          auVar89._28_4_ = auVar251._28_4_;
          auVar251 = vsubps_avx(auVar89,auVar88);
          auVar142._0_4_ = auVar265._0_4_ * 0.0 + auVar251._0_4_ + auVar208._0_4_ * 0.0;
          auVar142._4_4_ = auVar265._4_4_ * 0.0 + auVar251._4_4_ + auVar208._4_4_ * 0.0;
          auVar142._8_4_ = auVar265._8_4_ * 0.0 + auVar251._8_4_ + auVar208._8_4_ * 0.0;
          auVar142._12_4_ = auVar265._12_4_ * 0.0 + auVar251._12_4_ + auVar208._12_4_ * 0.0;
          auVar142._16_4_ = auVar265._16_4_ * 0.0 + auVar251._16_4_ + auVar208._16_4_ * 0.0;
          auVar142._20_4_ = auVar265._20_4_ * 0.0 + auVar251._20_4_ + auVar208._20_4_ * 0.0;
          auVar142._24_4_ = auVar265._24_4_ * 0.0 + auVar251._24_4_ + auVar208._24_4_ * 0.0;
          auVar142._28_4_ = auVar208._28_4_ + auVar251._28_4_ + auVar208._28_4_;
          auVar143 = ZEXT3264(auVar142);
          auVar251 = vmaxps_avx(_local_720,auVar142);
          auVar251 = vcmpps_avx(auVar251,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar15 = auVar174 & auVar251;
          if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar15 >> 0x7f,0) == '\0') &&
                (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar15 >> 0xbf,0) == '\0') &&
              (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar15[0x1f]) {
LAB_0090cd00:
            auVar305 = auVar27._4_12_;
            auVar175 = ZEXT3264(CONCAT824(uStack_4e8,
                                          CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
            auVar353._4_4_ = fVar146;
            auVar353._0_4_ = fVar131;
            auVar353._8_4_ = fVar149;
            auVar353._12_4_ = fVar152;
            auVar353._16_4_ = fVar155;
            auVar353._20_4_ = fVar130;
            auVar353._24_4_ = fVar160;
            auVar353._28_4_ = fVar144;
          }
          else {
            auVar15 = vandps_avx(auVar251,auVar174);
            auVar90._4_4_ = fVar333 * fVar306;
            auVar90._0_4_ = fVar291 * fVar322;
            auVar90._8_4_ = fVar280 * fVar270;
            auVar90._12_4_ = fVar288 * fVar286;
            auVar90._16_4_ = fVar154 * fVar221;
            auVar90._20_4_ = fVar223 * fVar159;
            auVar90._24_4_ = fVar153 * fVar240;
            auVar90._28_4_ = auVar174._28_4_;
            auVar91._4_4_ = fVar178 * fVar216;
            auVar91._0_4_ = fVar269 * fVar215;
            auVar91._8_4_ = fVar279 * fVar217;
            auVar91._12_4_ = fVar287 * fVar179;
            auVar91._16_4_ = fVar151 * fVar277;
            auVar91._20_4_ = fVar199 * fVar278;
            auVar91._24_4_ = fVar150 * fVar281;
            auVar91._28_4_ = auVar251._28_4_;
            auVar251 = vsubps_avx(auVar91,auVar90);
            auVar92._4_4_ = fVar282 * fVar216;
            auVar92._0_4_ = fVar302 * fVar215;
            auVar92._8_4_ = fVar219 * fVar217;
            auVar92._12_4_ = fVar289 * fVar179;
            auVar92._16_4_ = fVar157 * fVar277;
            auVar92._20_4_ = fVar237 * fVar278;
            auVar92._24_4_ = fVar156 * fVar281;
            auVar92._28_4_ = auVar27._28_4_;
            auVar93._4_4_ = fVar333 * fVar332;
            auVar93._0_4_ = fVar291 * fVar268;
            auVar93._8_4_ = fVar280 * fVar283;
            auVar93._12_4_ = fVar288 * fVar220;
            auVar93._16_4_ = fVar154 * fVar148;
            auVar93._20_4_ = fVar223 * fVar198;
            auVar93._24_4_ = fVar153 * fVar290;
            auVar93._28_4_ = auVar28._28_4_;
            auVar27 = vsubps_avx(auVar93,auVar92);
            auVar305 = auVar27._4_12_;
            auVar94._4_4_ = fVar178 * fVar332;
            auVar94._0_4_ = fVar269 * fVar268;
            auVar94._8_4_ = fVar279 * fVar283;
            auVar94._12_4_ = fVar287 * fVar220;
            auVar94._16_4_ = fVar151 * fVar148;
            auVar94._20_4_ = fVar199 * fVar198;
            auVar94._24_4_ = fVar150 * fVar290;
            auVar94._28_4_ = auVar209._28_4_;
            auVar95._4_4_ = fVar282 * fVar306;
            auVar95._0_4_ = fVar302 * fVar322;
            auVar95._8_4_ = fVar219 * fVar270;
            auVar95._12_4_ = fVar289 * fVar286;
            auVar95._16_4_ = fVar157 * fVar221;
            auVar95._20_4_ = fVar237 * fVar159;
            auVar95._24_4_ = fVar156 * fVar240;
            auVar95._28_4_ = auVar26._28_4_;
            auVar208 = vsubps_avx(auVar95,auVar94);
            auVar173._0_4_ = auVar251._0_4_ * 0.0 + auVar208._0_4_ + auVar27._0_4_ * 0.0;
            auVar173._4_4_ = auVar251._4_4_ * 0.0 + auVar208._4_4_ + auVar27._4_4_ * 0.0;
            auVar173._8_4_ = auVar251._8_4_ * 0.0 + auVar208._8_4_ + auVar27._8_4_ * 0.0;
            auVar173._12_4_ = auVar251._12_4_ * 0.0 + auVar208._12_4_ + auVar27._12_4_ * 0.0;
            auVar173._16_4_ = auVar251._16_4_ * 0.0 + auVar208._16_4_ + auVar27._16_4_ * 0.0;
            auVar173._20_4_ = auVar251._20_4_ * 0.0 + auVar208._20_4_ + auVar27._20_4_ * 0.0;
            auVar173._24_4_ = auVar251._24_4_ * 0.0 + auVar208._24_4_ + auVar27._24_4_ * 0.0;
            auVar173._28_4_ = auVar26._28_4_ + auVar208._28_4_ + auVar209._28_4_;
            auVar174 = vrcpps_avx(auVar173);
            fVar322 = auVar174._0_4_;
            fVar268 = auVar174._4_4_;
            auVar96._4_4_ = auVar173._4_4_ * fVar268;
            auVar96._0_4_ = auVar173._0_4_ * fVar322;
            fVar269 = auVar174._8_4_;
            auVar96._8_4_ = auVar173._8_4_ * fVar269;
            fVar291 = auVar174._12_4_;
            auVar96._12_4_ = auVar173._12_4_ * fVar291;
            fVar302 = auVar174._16_4_;
            auVar96._16_4_ = auVar173._16_4_ * fVar302;
            fVar306 = auVar174._20_4_;
            auVar96._20_4_ = auVar173._20_4_ * fVar306;
            fVar332 = auVar174._24_4_;
            auVar96._24_4_ = auVar173._24_4_ * fVar332;
            auVar96._28_4_ = auVar28._28_4_;
            auVar341._8_4_ = 0x3f800000;
            auVar341._0_8_ = 0x3f8000003f800000;
            auVar341._12_4_ = 0x3f800000;
            auVar341._16_4_ = 0x3f800000;
            auVar341._20_4_ = 0x3f800000;
            auVar341._24_4_ = 0x3f800000;
            auVar341._28_4_ = 0x3f800000;
            auVar174 = vsubps_avx(auVar341,auVar96);
            fVar322 = auVar174._0_4_ * fVar322 + fVar322;
            fVar268 = auVar174._4_4_ * fVar268 + fVar268;
            fVar269 = auVar174._8_4_ * fVar269 + fVar269;
            fVar291 = auVar174._12_4_ * fVar291 + fVar291;
            fVar302 = auVar174._16_4_ * fVar302 + fVar302;
            fVar306 = auVar174._20_4_ * fVar306 + fVar306;
            fVar332 = auVar174._24_4_ * fVar332 + fVar332;
            auVar97._4_4_ =
                 (fVar245 * auVar251._4_4_ + auVar27._4_4_ * fVar309 + auVar208._4_4_ * fVar161) *
                 fVar268;
            auVar97._0_4_ =
                 (fVar267 * auVar251._0_4_ + auVar27._0_4_ * fVar261 + auVar208._0_4_ * fVar158) *
                 fVar322;
            auVar97._8_4_ =
                 (fVar218 * auVar251._8_4_ + auVar27._8_4_ * fVar271 + auVar208._8_4_ * fVar162) *
                 fVar269;
            auVar97._12_4_ =
                 (fVar285 * auVar251._12_4_ + auVar27._12_4_ * fVar284 + auVar208._12_4_ * fVar181)
                 * fVar291;
            auVar97._16_4_ =
                 (fVar145 * auVar251._16_4_ + auVar27._16_4_ * fVar180 + auVar208._16_4_ * fVar260)
                 * fVar302;
            auVar97._20_4_ =
                 (fVar197 * auVar251._20_4_ + auVar27._20_4_ * fVar182 + auVar208._20_4_ * fVar200)
                 * fVar306;
            auVar97._24_4_ =
                 (fVar147 * auVar251._24_4_ + auVar27._24_4_ * fVar244 + auVar208._24_4_ * fVar201)
                 * fVar332;
            auVar97._28_4_ = auVar23._28_4_ + auVar298._28_4_ + auVar274._28_4_;
            auVar214 = ZEXT3264(auVar97);
            uVar129 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar234._4_4_ = uVar129;
            auVar234._0_4_ = uVar129;
            auVar234._8_4_ = uVar129;
            auVar234._12_4_ = uVar129;
            auVar234._16_4_ = uVar129;
            auVar234._20_4_ = uVar129;
            auVar234._24_4_ = uVar129;
            auVar234._28_4_ = uVar129;
            auVar174 = vcmpps_avx(local_340,auVar97,2);
            auVar23 = vcmpps_avx(auVar97,auVar234,2);
            auVar174 = vandps_avx(auVar174,auVar23);
            auVar298 = auVar15 & auVar174;
            if ((((((((auVar298 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar298 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar298 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar298 >> 0x7f,0) == '\0') &&
                  (auVar298 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar298 >> 0xbf,0) == '\0') &&
                (auVar298 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar298[0x1f]) goto LAB_0090cd00;
            auVar174 = vandps_avx(auVar15,auVar174);
            auVar298 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar173,4);
            auVar274 = auVar174 & auVar298;
            auVar175 = ZEXT3264(CONCAT824(uStack_4e8,
                                          CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
            auVar353._4_4_ = fVar146;
            auVar353._0_4_ = fVar131;
            auVar353._8_4_ = fVar149;
            auVar353._12_4_ = fVar152;
            auVar353._16_4_ = fVar155;
            auVar353._20_4_ = fVar130;
            auVar353._24_4_ = fVar160;
            auVar353._28_4_ = fVar144;
            if ((((((((auVar274 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar274 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar274 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar274 >> 0x7f,0) != '\0') ||
                  (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar274 >> 0xbf,0) != '\0') ||
                (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar274[0x1f] < '\0') {
              auVar174 = vandps_avx(auVar298,auVar174);
              auVar175 = ZEXT3264(auVar174);
              auVar98._4_4_ = fVar268 * (float)local_720._4_4_;
              auVar98._0_4_ = fVar322 * (float)local_720._0_4_;
              auVar98._8_4_ = fVar269 * fStack_718;
              auVar98._12_4_ = fVar291 * fStack_714;
              auVar98._16_4_ = fVar302 * fStack_710;
              auVar98._20_4_ = fVar306 * fStack_70c;
              auVar98._24_4_ = fVar332 * fStack_708;
              auVar98._28_4_ = auVar23._28_4_;
              auVar99._4_4_ = auVar142._4_4_ * fVar268;
              auVar99._0_4_ = auVar142._0_4_ * fVar322;
              auVar99._8_4_ = auVar142._8_4_ * fVar269;
              auVar99._12_4_ = auVar142._12_4_ * fVar291;
              auVar99._16_4_ = auVar142._16_4_ * fVar302;
              auVar99._20_4_ = auVar142._20_4_ * fVar306;
              auVar99._24_4_ = auVar142._24_4_ * fVar332;
              auVar99._28_4_ = auVar142._28_4_;
              auVar259._8_4_ = 0x3f800000;
              auVar259._0_8_ = 0x3f8000003f800000;
              auVar259._12_4_ = 0x3f800000;
              auVar259._16_4_ = 0x3f800000;
              auVar259._20_4_ = 0x3f800000;
              auVar259._24_4_ = 0x3f800000;
              auVar259._28_4_ = 0x3f800000;
              auVar174 = vsubps_avx(auVar259,auVar98);
              local_160 = vblendvps_avx(auVar174,auVar98,auVar337);
              auVar174 = vsubps_avx(auVar259,auVar99);
              _local_3a0 = vblendvps_avx(auVar174,auVar99,auVar337);
              auVar143 = ZEXT3264(_local_3a0);
              local_180 = auVar97;
            }
          }
          auVar174 = auVar175._0_32_;
          auVar316 = ZEXT3264(local_680);
          fVar182 = (float)local_760._0_4_;
          fVar197 = (float)local_760._4_4_;
          fVar198 = fStack_758;
          fVar199 = fStack_754;
          fVar306 = fStack_750;
          fVar223 = fStack_74c;
          fVar237 = fStack_748;
          fVar240 = fStack_744;
          if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar174 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar174 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar174 >> 0x7f,0) != '\0') ||
                (auVar175 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
               SUB321(auVar174 >> 0xbf,0) != '\0') ||
              (auVar175 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
              auVar175[0x1f] < '\0') {
            auVar23 = vsubps_avx(auVar195,auVar353);
            auVar214 = ZEXT3264(local_160);
            fVar261 = auVar353._0_4_ + auVar23._0_4_ * local_160._0_4_;
            fVar267 = auVar353._4_4_ + auVar23._4_4_ * local_160._4_4_;
            fVar268 = auVar353._8_4_ + auVar23._8_4_ * local_160._8_4_;
            fVar269 = auVar353._12_4_ + auVar23._12_4_ * local_160._12_4_;
            fVar291 = auVar353._16_4_ + auVar23._16_4_ * local_160._16_4_;
            fVar302 = auVar353._20_4_ + auVar23._20_4_ * local_160._20_4_;
            fVar309 = auVar353._24_4_ + auVar23._24_4_ * local_160._24_4_;
            fVar245 = auVar353._28_4_ + auVar23._28_4_;
            fVar322 = *(float *)((long)local_7f0->ray_space + k * 4 + -0x10);
            auVar100._4_4_ = (fVar267 + fVar267) * fVar322;
            auVar100._0_4_ = (fVar261 + fVar261) * fVar322;
            auVar100._8_4_ = (fVar268 + fVar268) * fVar322;
            auVar100._12_4_ = (fVar269 + fVar269) * fVar322;
            auVar100._16_4_ = (fVar291 + fVar291) * fVar322;
            auVar100._20_4_ = (fVar302 + fVar302) * fVar322;
            auVar100._24_4_ = (fVar309 + fVar309) * fVar322;
            auVar100._28_4_ = fVar245 + fVar245;
            auVar23 = vcmpps_avx(local_180,auVar100,6);
            auVar143 = ZEXT3264(auVar23);
            auVar298 = auVar174 & auVar23;
            if ((((((((auVar298 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar298 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar298 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar298 >> 0x7f,0) != '\0') ||
                  (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar298 >> 0xbf,0) != '\0') ||
                (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar298[0x1f] < '\0') {
              local_200 = vandps_avx(auVar23,auVar174);
              auVar143 = ZEXT3264(local_200);
              auVar167._0_8_ =
                   CONCAT44((float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0,
                            (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0);
              auVar167._8_4_ = (float)uStack_398 + (float)uStack_398 + -1.0;
              auVar167._12_4_ = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
              auVar169._16_4_ = (float)uStack_390 + (float)uStack_390 + -1.0;
              auVar169._0_16_ = auVar167;
              auVar169._20_4_ = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
              fStack_288 = (float)uStack_388 + (float)uStack_388 + -1.0;
              _local_2a0 = auVar169;
              fStack_284 = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
              auVar175 = ZEXT3264(_local_2a0);
              local_2c0 = local_160;
              local_280 = local_180;
              local_250 = local_6d0;
              uStack_248 = uStack_6c8;
              local_240 = local_620;
              uStack_238 = uStack_618;
              local_230 = local_630;
              uStack_228 = uStack_628;
              local_220 = local_610;
              uStack_218 = uStack_608;
              local_740._0_8_ = (context->scene->geometries).items[local_7e8].ptr;
              _local_3a0 = _local_2a0;
              if ((((Geometry *)local_740._0_8_)->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                pRVar119 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar119 = context->args;
                if ((pRVar119->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar119 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar119 >> 8),1),
                   ((Geometry *)local_740._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  stack0xfffffffffffff864 = auVar213._4_28_;
                  local_7a0._0_4_ = (int)uVar122;
                  auVar190._0_4_ = (float)(int)local_260;
                  auVar190._4_12_ = auVar305;
                  auVar229 = vshufps_avx(auVar190,auVar190,0);
                  local_1e0[0] = (auVar229._0_4_ + local_160._0_4_ + 0.0) * (float)local_140._0_4_;
                  local_1e0[1] = (auVar229._4_4_ + local_160._4_4_ + 1.0) * (float)local_140._4_4_;
                  local_1e0[2] = (auVar229._8_4_ + local_160._8_4_ + 2.0) * fStack_138;
                  local_1e0[3] = (auVar229._12_4_ + local_160._12_4_ + 3.0) * fStack_134;
                  fStack_1d0 = (auVar229._0_4_ + local_160._16_4_ + 4.0) * fStack_130;
                  fStack_1cc = (auVar229._4_4_ + local_160._20_4_ + 5.0) * fStack_12c;
                  fStack_1c8 = (auVar229._8_4_ + local_160._24_4_ + 6.0) * fStack_128;
                  fStack_1c4 = auVar229._12_4_ + (float)local_160._28_4_ + 7.0;
                  uStack_398 = auVar167._8_8_;
                  uStack_390 = auVar169._16_8_;
                  uStack_388 = local_2a0._24_8_;
                  local_1c0 = auVar167._0_8_;
                  uStack_1b8 = uStack_398;
                  uStack_1b0 = uStack_390;
                  uStack_1a8 = uStack_388;
                  auVar175 = ZEXT3264(local_180);
                  local_1a0 = local_180;
                  uVar129 = vmovmskps_avx(local_200);
                  uVar120 = CONCAT44((int)((ulong)pRVar119 >> 0x20),uVar129);
                  uVar122 = 0;
                  if (uVar120 != 0) {
                    for (; (uVar120 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
                    }
                  }
                  local_740._8_24_ = auVar195._8_24_;
                  pGVar127 = (Geometry *)local_740._0_8_;
                  _local_5c0 = auVar22;
                  local_25c = uVar11;
                  while (uVar120 != 0) {
                    local_720._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_400 = local_1e0[uVar122];
                    local_3f0 = *(undefined4 *)((long)&local_1c0 + uVar122 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar122 * 4);
                    fVar326 = 1.0 - local_400;
                    fVar320 = local_400 * fVar326 + local_400 * fVar326;
                    auVar229 = ZEXT416((uint)(local_400 * local_400 * 3.0));
                    auVar229 = vshufps_avx(auVar229,auVar229,0);
                    auVar248 = ZEXT416((uint)((fVar320 - local_400 * local_400) * 3.0));
                    auVar248 = vshufps_avx(auVar248,auVar248,0);
                    auVar207 = ZEXT416((uint)((fVar326 * fVar326 - fVar320) * 3.0));
                    auVar207 = vshufps_avx(auVar207,auVar207,0);
                    local_6b0.context = context->user;
                    auVar191 = ZEXT416((uint)(fVar326 * fVar326 * -3.0));
                    auVar191 = vshufps_avx(auVar191,auVar191,0);
                    auVar192._0_4_ =
                         auVar191._0_4_ * (float)local_6d0._0_4_ +
                         auVar207._0_4_ * (float)local_620._0_4_ +
                         auVar229._0_4_ * (float)local_610._0_4_ +
                         auVar248._0_4_ * (float)local_630._0_4_;
                    auVar192._4_4_ =
                         auVar191._4_4_ * (float)local_6d0._4_4_ +
                         auVar207._4_4_ * (float)local_620._4_4_ +
                         auVar229._4_4_ * (float)local_610._4_4_ +
                         auVar248._4_4_ * (float)local_630._4_4_;
                    auVar192._8_4_ =
                         auVar191._8_4_ * (float)uStack_6c8 +
                         auVar207._8_4_ * (float)uStack_618 +
                         auVar229._8_4_ * (float)uStack_608 + auVar248._8_4_ * (float)uStack_628;
                    auVar192._12_4_ =
                         auVar191._12_4_ * uStack_6c8._4_4_ +
                         auVar207._12_4_ * uStack_618._4_4_ +
                         auVar229._12_4_ * uStack_608._4_4_ + auVar248._12_4_ * uStack_628._4_4_;
                    local_430 = (RTCHitN  [16])vshufps_avx(auVar192,auVar192,0);
                    local_420 = vshufps_avx(auVar192,auVar192,0x55);
                    auVar214 = ZEXT1664(local_420);
                    local_410 = vshufps_avx(auVar192,auVar192,0xaa);
                    local_3e0 = local_360._0_8_;
                    uStack_3d8 = local_360._8_8_;
                    local_3d0 = local_640;
                    vcmpps_avx(ZEXT1632(local_640),ZEXT1632(local_640),0xf);
                    uStack_3bc = (local_6b0.context)->instID[0];
                    local_3c0 = uStack_3bc;
                    uStack_3b8 = uStack_3bc;
                    uStack_3b4 = uStack_3bc;
                    uStack_3b0 = (local_6b0.context)->instPrimID[0];
                    uStack_3ac = uStack_3b0;
                    uStack_3a8 = uStack_3b0;
                    uStack_3a4 = uStack_3b0;
                    local_800 = *local_6b8;
                    local_6b0.valid = (int *)local_800;
                    local_6b0.geometryUserPtr = pGVar127->userPtr;
                    local_6b0.hit = local_430;
                    local_6b0.N = 4;
                    local_6b0.ray = (RTCRayN *)ray;
                    fStack_3fc = local_400;
                    fStack_3f8 = local_400;
                    fStack_3f4 = local_400;
                    uStack_3ec = local_3f0;
                    uStack_3e8 = local_3f0;
                    uStack_3e4 = local_3f0;
                    if (pGVar127->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar214 = ZEXT1664(local_420);
                      (*pGVar127->occlusionFilterN)(&local_6b0);
                    }
                    if (local_800 == (undefined1  [16])0x0) {
                      auVar229 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar229 = auVar229 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_740._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar214 = ZEXT1664(auVar214._0_16_);
                        (*p_Var14)(&local_6b0);
                      }
                      auVar248 = vpcmpeqd_avx(local_800,_DAT_01f45a50);
                      auVar229 = auVar248 ^ _DAT_01f46b70;
                      auVar193._8_4_ = 0xff800000;
                      auVar193._0_8_ = 0xff800000ff800000;
                      auVar193._12_4_ = 0xff800000;
                      auVar248 = vblendvps_avx(auVar193,*(undefined1 (*) [16])(local_6b0.ray + 0x80)
                                               ,auVar248);
                      *(undefined1 (*) [16])(local_6b0.ray + 0x80) = auVar248;
                    }
                    auVar143 = ZEXT1664(auVar229);
                    auVar168._8_8_ = 0x100000001;
                    auVar168._0_8_ = 0x100000001;
                    auVar175 = ZEXT1664(auVar168);
                    if ((auVar168 & auVar229) != (undefined1  [16])0x0) {
                      pRVar119 = (RTCIntersectArguments *)0x1;
                      goto LAB_0090cd23;
                    }
                    auVar143 = ZEXT464((uint)local_720._0_4_);
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_720._0_4_;
                    uVar120 = uVar120 ^ 1L << (uVar122 & 0x3f);
                    uVar122 = 0;
                    pGVar127 = (Geometry *)local_740._0_8_;
                    if (uVar120 != 0) {
                      for (; (uVar120 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
                      }
                    }
                  }
                  pRVar119 = (RTCIntersectArguments *)0x0;
LAB_0090cd23:
                  auVar316 = ZEXT3264(local_680);
                  uVar122 = (ulong)(uint)local_7a0._0_4_;
                }
              }
              uVar122 = CONCAT71((int7)(uVar122 >> 8),(byte)uVar122 | (byte)pRVar119);
              fVar312 = (float)local_7c0._0_4_;
              fVar317 = (float)local_7c0._4_4_;
              fVar318 = fStack_7b8;
              fVar319 = fStack_7b4;
              fVar320 = fStack_7b0;
              fVar326 = fStack_7ac;
              fVar328 = fStack_7a8;
              fVar330 = fStack_7a4;
              fVar222 = (float)local_7e0._0_4_;
              fVar236 = (float)local_7e0._4_4_;
              fVar239 = fStack_7d8;
              fVar242 = fStack_7d4;
              fVar163 = fStack_7d0;
              fVar176 = fStack_7cc;
              fVar177 = fStack_7c8;
              fVar182 = (float)local_760._0_4_;
              fVar197 = (float)local_760._4_4_;
              fVar198 = fStack_758;
              fVar199 = fStack_754;
              fVar306 = fStack_750;
              fVar223 = fStack_74c;
              fVar237 = fStack_748;
              fVar240 = fStack_744;
            }
          }
        }
      }
    }
    if ((uVar122 & 1) != 0) break;
    uVar129 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar135._4_4_ = uVar129;
    auVar135._0_4_ = uVar129;
    auVar135._8_4_ = uVar129;
    auVar135._12_4_ = uVar129;
    auVar229 = vcmpps_avx(local_2d0,auVar135,2);
    uVar121 = vmovmskps_avx(auVar229);
  }
  return uVar118 != 0;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }